

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O3

void embree::avx::CurveNvIntersectorK<8,4>::
     intersect_t<embree::avx::SweepCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined4 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Primitive PVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  long lVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  long lVar73;
  undefined1 auVar74 [16];
  undefined1 auVar75 [32];
  uint uVar76;
  undefined1 (*pauVar77) [32];
  ulong uVar78;
  uint uVar79;
  uint uVar80;
  uint uVar81;
  ulong uVar82;
  int iVar83;
  long lVar84;
  ulong uVar85;
  float fVar86;
  float fVar114;
  float fVar116;
  __m128 a;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float fVar120;
  float fVar121;
  float fVar122;
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  float fVar118;
  undefined1 auVar103 [32];
  float fVar115;
  float fVar117;
  float fVar119;
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar89 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  float fVar123;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  float fVar155;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar158 [16];
  undefined1 auVar160 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  float fVar154;
  float fVar156;
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar157 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar159 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  float fVar174;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [28];
  float fVar197;
  float fVar198;
  float fVar200;
  float fVar201;
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  float fVar199;
  float fVar202;
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  float fVar203;
  float fVar219;
  float fVar220;
  float fVar221;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [28];
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar225;
  float fVar226;
  float fVar227;
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  float fVar228;
  float fVar247;
  float fVar249;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  float fVar229;
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  float fVar253;
  float fVar255;
  float fVar257;
  undefined1 auVar237 [32];
  float fVar251;
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  float fVar248;
  float fVar250;
  float fVar252;
  float fVar254;
  float fVar256;
  float fVar258;
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar262 [16];
  float fVar259;
  float fVar260;
  float fVar261;
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  float fVar276;
  float fVar279;
  float fVar285;
  float fVar288;
  float fVar291;
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  float fVar282;
  undefined1 auVar268 [32];
  float fVar277;
  float fVar280;
  float fVar283;
  float fVar286;
  float fVar289;
  float fVar292;
  undefined1 auVar269 [32];
  float fVar278;
  float fVar281;
  float fVar284;
  float fVar287;
  float fVar290;
  float fVar293;
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar267 [32];
  undefined1 auVar275 [64];
  float fVar360;
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  float fVar294;
  float fVar295;
  float fVar305;
  float fVar307;
  float fVar310;
  float fVar314;
  float fVar317;
  float fVar320;
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  float fVar306;
  float fVar308;
  float fVar311;
  float fVar312;
  float fVar315;
  float fVar318;
  float fVar321;
  float fVar323;
  undefined1 auVar303 [32];
  float fVar309;
  float fVar313;
  float fVar316;
  float fVar319;
  float fVar322;
  undefined1 auVar304 [32];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  float fVar330;
  undefined1 auVar328 [32];
  undefined1 auVar329 [64];
  undefined1 auVar331 [16];
  float fVar336;
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  float fVar337;
  undefined1 auVar338 [16];
  float fVar346;
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  float fVar347;
  float fVar354;
  float fVar355;
  float fVar356;
  float fVar357;
  float fVar358;
  float fVar359;
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar353 [64];
  float fVar361;
  float fVar364;
  float fVar365;
  float fVar366;
  float fVar367;
  float fVar368;
  float fVar369;
  float in_register_0000151c;
  undefined1 auVar362 [32];
  float fVar370;
  undefined1 auVar363 [64];
  float fVar371;
  undefined1 auVar372 [16];
  float fVar380;
  float fVar381;
  float fVar383;
  float fVar384;
  float fVar385;
  undefined1 auVar373 [32];
  float fVar386;
  undefined1 auVar374 [32];
  undefined1 auVar375 [32];
  float fVar382;
  undefined1 auVar376 [32];
  undefined1 auVar377 [32];
  undefined1 auVar378 [32];
  undefined1 auVar379 [32];
  float in_register_0000159c;
  undefined1 auVar387 [32];
  undefined1 auVar388 [32];
  undefined1 auVar389 [32];
  undefined1 auVar390 [32];
  undefined1 auVar391 [32];
  undefined1 auVar392 [32];
  undefined1 auVar393 [16];
  undefined1 auVar394 [32];
  undefined1 auVar395 [32];
  undefined1 auVar396 [32];
  float in_register_000015dc;
  undefined1 auVar397 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  uint local_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  float local_bc0;
  float local_ab0;
  float fStack_aac;
  float fStack_aa8;
  float fStack_aa4;
  float local_aa0;
  float fStack_a9c;
  float fStack_a98;
  float fStack_a94;
  float local_a90;
  float fStack_a8c;
  float fStack_a88;
  float fStack_a84;
  float local_a80;
  float fStack_a7c;
  float fStack_a78;
  float fStack_a74;
  RTCFilterFunctionNArguments local_a70;
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [8];
  float fStack_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 (*local_950) [16];
  Primitive *local_948;
  undefined1 local_940 [8];
  float fStack_938;
  float fStack_934;
  undefined1 auStack_930 [16];
  undefined1 local_920 [16];
  undefined1 local_910 [8];
  float fStack_908;
  float fStack_904;
  undefined1 local_900 [32];
  uint local_8e0;
  float fStack_8dc;
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  undefined4 uStack_8c4;
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  undefined1 local_8a0 [32];
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_7f0 [16];
  undefined1 local_7e0 [16];
  Primitive *local_7c8;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [16];
  undefined1 local_690 [16];
  RTCHitN local_680 [16];
  undefined1 auStack_670 [16];
  undefined1 local_660 [16];
  undefined1 local_650 [16];
  undefined1 local_640 [16];
  undefined8 local_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  uint local_610;
  uint uStack_60c;
  uint uStack_608;
  uint uStack_604;
  undefined1 auStack_600 [16];
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  undefined4 uStack_5c4;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_490 [16];
  float local_480;
  float fStack_47c;
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  
  PVar7 = prim[1];
  uVar85 = (ulong)(byte)PVar7;
  lVar84 = uVar85 * 5;
  lVar73 = uVar85 * 0x19;
  auVar15 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar15 = vinsertps_avx(auVar15,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar126 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar126 = vinsertps_avx(auVar126,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar174 = *(float *)(prim + lVar73 + 0x12);
  auVar15 = vsubps_avx(auVar15,*(undefined1 (*) [16])(prim + lVar73 + 6));
  auVar124._0_4_ = fVar174 * auVar15._0_4_;
  auVar124._4_4_ = fVar174 * auVar15._4_4_;
  auVar124._8_4_ = fVar174 * auVar15._8_4_;
  auVar124._12_4_ = fVar174 * auVar15._12_4_;
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 4 + 6)));
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 4 + 10)));
  auVar230._0_4_ = fVar174 * auVar126._0_4_;
  auVar230._4_4_ = fVar174 * auVar126._4_4_;
  auVar230._8_4_ = fVar174 * auVar126._8_4_;
  auVar230._12_4_ = fVar174 * auVar126._12_4_;
  auVar98._16_16_ = auVar24;
  auVar98._0_16_ = auVar15;
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar84 + 6)));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar126 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar84 + 10)));
  auVar163._16_16_ = auVar126;
  auVar163._0_16_ = auVar15;
  auVar152 = vcvtdq2ps_avx(auVar163);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 6 + 6)));
  auVar126 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 6 + 10)));
  auVar189._16_16_ = auVar126;
  auVar189._0_16_ = auVar15;
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 0xb + 6)));
  auVar126 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 0xb + 10)));
  auVar351 = vcvtdq2ps_avx(auVar189);
  auVar190._16_16_ = auVar126;
  auVar190._0_16_ = auVar15;
  auVar11 = vcvtdq2ps_avx(auVar190);
  uVar82 = (ulong)((uint)(byte)PVar7 * 0xc);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 + 6)));
  auVar126 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 + 10)));
  auVar265._16_16_ = auVar126;
  auVar265._0_16_ = auVar15;
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 + uVar85 + 6)));
  auVar166 = vcvtdq2ps_avx(auVar265);
  auVar126 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 + uVar85 + 10)));
  auVar296._16_16_ = auVar126;
  auVar296._0_16_ = auVar15;
  lVar10 = uVar85 * 9;
  uVar82 = (ulong)(uint)((int)lVar10 * 2);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar296);
  auVar126 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 + 10)));
  auVar297._16_16_ = auVar126;
  auVar297._0_16_ = auVar15;
  auVar379 = vcvtdq2ps_avx(auVar297);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 + uVar85 + 6)));
  auVar126 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 + uVar85 + 10)));
  auVar332._16_16_ = auVar126;
  auVar332._0_16_ = auVar15;
  uVar82 = (ulong)(uint)((int)lVar84 << 2);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 + 6)));
  auVar126 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 + 10)));
  auVar13 = vcvtdq2ps_avx(auVar332);
  auVar339._16_16_ = auVar126;
  auVar339._0_16_ = auVar15;
  auVar14 = vcvtdq2ps_avx(auVar339);
  auVar15 = vshufps_avx(auVar230,auVar230,0);
  auVar126 = vshufps_avx(auVar230,auVar230,0x55);
  auVar24 = vshufps_avx(auVar230,auVar230,0xaa);
  fVar174 = auVar24._0_4_;
  fVar197 = auVar24._4_4_;
  fVar198 = auVar24._8_4_;
  fVar199 = auVar24._12_4_;
  fVar200 = auVar126._0_4_;
  fVar201 = auVar126._4_4_;
  fVar202 = auVar126._8_4_;
  fVar203 = auVar126._12_4_;
  fVar219 = auVar15._0_4_;
  fVar220 = auVar15._4_4_;
  fVar221 = auVar15._8_4_;
  fVar222 = auVar15._12_4_;
  auVar362._0_4_ = fVar219 * auVar98._0_4_ + fVar200 * auVar152._0_4_ + fVar174 * auVar351._0_4_;
  auVar362._4_4_ = fVar220 * auVar98._4_4_ + fVar201 * auVar152._4_4_ + fVar197 * auVar351._4_4_;
  auVar362._8_4_ = fVar221 * auVar98._8_4_ + fVar202 * auVar152._8_4_ + fVar198 * auVar351._8_4_;
  auVar362._12_4_ = fVar222 * auVar98._12_4_ + fVar203 * auVar152._12_4_ + fVar199 * auVar351._12_4_
  ;
  auVar362._16_4_ = fVar219 * auVar98._16_4_ + fVar200 * auVar152._16_4_ + fVar174 * auVar351._16_4_
  ;
  auVar362._20_4_ = fVar220 * auVar98._20_4_ + fVar201 * auVar152._20_4_ + fVar197 * auVar351._20_4_
  ;
  auVar362._24_4_ = fVar221 * auVar98._24_4_ + fVar202 * auVar152._24_4_ + fVar198 * auVar351._24_4_
  ;
  auVar362._28_4_ = fVar203 + in_register_000015dc + in_register_0000151c;
  auVar348._0_4_ = fVar219 * auVar11._0_4_ + fVar200 * auVar166._0_4_ + auVar12._0_4_ * fVar174;
  auVar348._4_4_ = fVar220 * auVar11._4_4_ + fVar201 * auVar166._4_4_ + auVar12._4_4_ * fVar197;
  auVar348._8_4_ = fVar221 * auVar11._8_4_ + fVar202 * auVar166._8_4_ + auVar12._8_4_ * fVar198;
  auVar348._12_4_ = fVar222 * auVar11._12_4_ + fVar203 * auVar166._12_4_ + auVar12._12_4_ * fVar199;
  auVar348._16_4_ = fVar219 * auVar11._16_4_ + fVar200 * auVar166._16_4_ + auVar12._16_4_ * fVar174;
  auVar348._20_4_ = fVar220 * auVar11._20_4_ + fVar201 * auVar166._20_4_ + auVar12._20_4_ * fVar197;
  auVar348._24_4_ = fVar221 * auVar11._24_4_ + fVar202 * auVar166._24_4_ + auVar12._24_4_ * fVar198;
  auVar348._28_4_ = fVar203 + in_register_000015dc + in_register_0000159c;
  auVar237._0_4_ = fVar219 * auVar379._0_4_ + fVar200 * auVar13._0_4_ + auVar14._0_4_ * fVar174;
  auVar237._4_4_ = fVar220 * auVar379._4_4_ + fVar201 * auVar13._4_4_ + auVar14._4_4_ * fVar197;
  auVar237._8_4_ = fVar221 * auVar379._8_4_ + fVar202 * auVar13._8_4_ + auVar14._8_4_ * fVar198;
  auVar237._12_4_ = fVar222 * auVar379._12_4_ + fVar203 * auVar13._12_4_ + auVar14._12_4_ * fVar199;
  auVar237._16_4_ = fVar219 * auVar379._16_4_ + fVar200 * auVar13._16_4_ + auVar14._16_4_ * fVar174;
  auVar237._20_4_ = fVar220 * auVar379._20_4_ + fVar201 * auVar13._20_4_ + auVar14._20_4_ * fVar197;
  auVar237._24_4_ = fVar221 * auVar379._24_4_ + fVar202 * auVar13._24_4_ + auVar14._24_4_ * fVar198;
  auVar237._28_4_ = fVar222 + fVar203 + fVar199;
  auVar15 = vshufps_avx(auVar124,auVar124,0);
  auVar126 = vshufps_avx(auVar124,auVar124,0x55);
  auVar24 = vshufps_avx(auVar124,auVar124,0xaa);
  fVar197 = auVar24._0_4_;
  fVar198 = auVar24._4_4_;
  fVar199 = auVar24._8_4_;
  fVar200 = auVar24._12_4_;
  fVar220 = auVar126._0_4_;
  fVar221 = auVar126._4_4_;
  fVar222 = auVar126._8_4_;
  fVar224 = auVar126._12_4_;
  fVar201 = auVar15._0_4_;
  fVar202 = auVar15._4_4_;
  fVar203 = auVar15._8_4_;
  fVar219 = auVar15._12_4_;
  fVar174 = auVar98._28_4_;
  auVar266._0_4_ = fVar201 * auVar98._0_4_ + fVar220 * auVar152._0_4_ + fVar197 * auVar351._0_4_;
  auVar266._4_4_ = fVar202 * auVar98._4_4_ + fVar221 * auVar152._4_4_ + fVar198 * auVar351._4_4_;
  auVar266._8_4_ = fVar203 * auVar98._8_4_ + fVar222 * auVar152._8_4_ + fVar199 * auVar351._8_4_;
  auVar266._12_4_ = fVar219 * auVar98._12_4_ + fVar224 * auVar152._12_4_ + fVar200 * auVar351._12_4_
  ;
  auVar266._16_4_ = fVar201 * auVar98._16_4_ + fVar220 * auVar152._16_4_ + fVar197 * auVar351._16_4_
  ;
  auVar266._20_4_ = fVar202 * auVar98._20_4_ + fVar221 * auVar152._20_4_ + fVar198 * auVar351._20_4_
  ;
  auVar266._24_4_ = fVar203 * auVar98._24_4_ + fVar222 * auVar152._24_4_ + fVar199 * auVar351._24_4_
  ;
  auVar266._28_4_ = fVar174 + auVar152._28_4_ + auVar351._28_4_;
  auVar140._0_4_ = fVar201 * auVar11._0_4_ + auVar12._0_4_ * fVar197 + fVar220 * auVar166._0_4_;
  auVar140._4_4_ = fVar202 * auVar11._4_4_ + auVar12._4_4_ * fVar198 + fVar221 * auVar166._4_4_;
  auVar140._8_4_ = fVar203 * auVar11._8_4_ + auVar12._8_4_ * fVar199 + fVar222 * auVar166._8_4_;
  auVar140._12_4_ = fVar219 * auVar11._12_4_ + auVar12._12_4_ * fVar200 + fVar224 * auVar166._12_4_;
  auVar140._16_4_ = fVar201 * auVar11._16_4_ + auVar12._16_4_ * fVar197 + fVar220 * auVar166._16_4_;
  auVar140._20_4_ = fVar202 * auVar11._20_4_ + auVar12._20_4_ * fVar198 + fVar221 * auVar166._20_4_;
  auVar140._24_4_ = fVar203 * auVar11._24_4_ + auVar12._24_4_ * fVar199 + fVar222 * auVar166._24_4_;
  auVar140._28_4_ = fVar174 + auVar12._28_4_ + auVar351._28_4_;
  auVar298._8_4_ = 0x7fffffff;
  auVar298._0_8_ = 0x7fffffff7fffffff;
  auVar298._12_4_ = 0x7fffffff;
  auVar298._16_4_ = 0x7fffffff;
  auVar298._20_4_ = 0x7fffffff;
  auVar298._24_4_ = 0x7fffffff;
  auVar298._28_4_ = 0x7fffffff;
  auVar333._8_4_ = 0x219392ef;
  auVar333._0_8_ = 0x219392ef219392ef;
  auVar333._12_4_ = 0x219392ef;
  auVar333._16_4_ = 0x219392ef;
  auVar333._20_4_ = 0x219392ef;
  auVar333._24_4_ = 0x219392ef;
  auVar333._28_4_ = 0x219392ef;
  auVar98 = vandps_avx(auVar362,auVar298);
  auVar98 = vcmpps_avx(auVar98,auVar333,1);
  auVar152 = vblendvps_avx(auVar362,auVar333,auVar98);
  auVar98 = vandps_avx(auVar348,auVar298);
  auVar98 = vcmpps_avx(auVar98,auVar333,1);
  auVar351 = vblendvps_avx(auVar348,auVar333,auVar98);
  auVar98 = vandps_avx(auVar237,auVar298);
  auVar98 = vcmpps_avx(auVar98,auVar333,1);
  auVar98 = vblendvps_avx(auVar237,auVar333,auVar98);
  auVar164._0_4_ = fVar220 * auVar13._0_4_ + auVar14._0_4_ * fVar197 + fVar201 * auVar379._0_4_;
  auVar164._4_4_ = fVar221 * auVar13._4_4_ + auVar14._4_4_ * fVar198 + fVar202 * auVar379._4_4_;
  auVar164._8_4_ = fVar222 * auVar13._8_4_ + auVar14._8_4_ * fVar199 + fVar203 * auVar379._8_4_;
  auVar164._12_4_ = fVar224 * auVar13._12_4_ + auVar14._12_4_ * fVar200 + fVar219 * auVar379._12_4_;
  auVar164._16_4_ = fVar220 * auVar13._16_4_ + auVar14._16_4_ * fVar197 + fVar201 * auVar379._16_4_;
  auVar164._20_4_ = fVar221 * auVar13._20_4_ + auVar14._20_4_ * fVar198 + fVar202 * auVar379._20_4_;
  auVar164._24_4_ = fVar222 * auVar13._24_4_ + auVar14._24_4_ * fVar199 + fVar203 * auVar379._24_4_;
  auVar164._28_4_ = auVar166._28_4_ + fVar200 + fVar174;
  auVar11 = vrcpps_avx(auVar152);
  fVar174 = auVar11._0_4_;
  fVar197 = auVar11._4_4_;
  auVar166._4_4_ = auVar152._4_4_ * fVar197;
  auVar166._0_4_ = auVar152._0_4_ * fVar174;
  fVar198 = auVar11._8_4_;
  auVar166._8_4_ = auVar152._8_4_ * fVar198;
  fVar199 = auVar11._12_4_;
  auVar166._12_4_ = auVar152._12_4_ * fVar199;
  fVar200 = auVar11._16_4_;
  auVar166._16_4_ = auVar152._16_4_ * fVar200;
  fVar201 = auVar11._20_4_;
  auVar166._20_4_ = auVar152._20_4_ * fVar201;
  fVar202 = auVar11._24_4_;
  auVar166._24_4_ = auVar152._24_4_ * fVar202;
  auVar166._28_4_ = auVar152._28_4_;
  auVar326._8_4_ = 0x3f800000;
  auVar326._0_8_ = 0x3f8000003f800000;
  auVar326._12_4_ = 0x3f800000;
  auVar326._16_4_ = 0x3f800000;
  auVar326._20_4_ = 0x3f800000;
  auVar326._24_4_ = 0x3f800000;
  auVar326._28_4_ = 0x3f800000;
  auVar166 = vsubps_avx(auVar326,auVar166);
  auVar152 = vrcpps_avx(auVar351);
  fVar174 = fVar174 + fVar174 * auVar166._0_4_;
  fVar197 = fVar197 + fVar197 * auVar166._4_4_;
  fVar198 = fVar198 + fVar198 * auVar166._8_4_;
  fVar199 = fVar199 + fVar199 * auVar166._12_4_;
  fVar200 = fVar200 + fVar200 * auVar166._16_4_;
  fVar201 = fVar201 + fVar201 * auVar166._20_4_;
  fVar202 = fVar202 + fVar202 * auVar166._24_4_;
  fVar228 = auVar152._0_4_;
  fVar247 = auVar152._4_4_;
  auVar12._4_4_ = fVar247 * auVar351._4_4_;
  auVar12._0_4_ = fVar228 * auVar351._0_4_;
  fVar249 = auVar152._8_4_;
  auVar12._8_4_ = fVar249 * auVar351._8_4_;
  fVar251 = auVar152._12_4_;
  auVar12._12_4_ = fVar251 * auVar351._12_4_;
  fVar253 = auVar152._16_4_;
  auVar12._16_4_ = fVar253 * auVar351._16_4_;
  fVar255 = auVar152._20_4_;
  auVar12._20_4_ = fVar255 * auVar351._20_4_;
  fVar257 = auVar152._24_4_;
  auVar12._24_4_ = fVar257 * auVar351._24_4_;
  auVar12._28_4_ = auVar11._28_4_;
  auVar152 = vsubps_avx(auVar326,auVar12);
  fVar228 = fVar228 + fVar228 * auVar152._0_4_;
  fVar247 = fVar247 + fVar247 * auVar152._4_4_;
  fVar249 = fVar249 + fVar249 * auVar152._8_4_;
  fVar251 = fVar251 + fVar251 * auVar152._12_4_;
  fVar253 = fVar253 + fVar253 * auVar152._16_4_;
  fVar255 = fVar255 + fVar255 * auVar152._20_4_;
  fVar257 = fVar257 + fVar257 * auVar152._24_4_;
  auVar152 = vrcpps_avx(auVar98);
  fVar203 = auVar152._0_4_;
  fVar219 = auVar152._4_4_;
  auVar379._4_4_ = fVar219 * auVar98._4_4_;
  auVar379._0_4_ = fVar203 * auVar98._0_4_;
  fVar220 = auVar152._8_4_;
  auVar379._8_4_ = fVar220 * auVar98._8_4_;
  fVar221 = auVar152._12_4_;
  auVar379._12_4_ = fVar221 * auVar98._12_4_;
  fVar222 = auVar152._16_4_;
  auVar379._16_4_ = fVar222 * auVar98._16_4_;
  fVar224 = auVar152._20_4_;
  auVar379._20_4_ = fVar224 * auVar98._20_4_;
  fVar226 = auVar152._24_4_;
  auVar379._24_4_ = fVar226 * auVar98._24_4_;
  auVar379._28_4_ = auVar351._28_4_;
  auVar98 = vsubps_avx(auVar326,auVar379);
  fVar203 = fVar203 + fVar203 * auVar98._0_4_;
  fVar219 = fVar219 + fVar219 * auVar98._4_4_;
  fVar220 = fVar220 + fVar220 * auVar98._8_4_;
  fVar221 = fVar221 + fVar221 * auVar98._12_4_;
  fVar222 = fVar222 + fVar222 * auVar98._16_4_;
  fVar224 = fVar224 + fVar224 * auVar98._20_4_;
  fVar226 = fVar226 + fVar226 * auVar98._24_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar85 * 7 + 6);
  auVar15 = vpmovsxwd_avx(auVar15);
  auVar126._8_8_ = 0;
  auVar126._0_8_ = *(ulong *)(prim + uVar85 * 7 + 0xe);
  auVar126 = vpmovsxwd_avx(auVar126);
  auVar99._16_16_ = auVar126;
  auVar99._0_16_ = auVar15;
  auVar98 = vcvtdq2ps_avx(auVar99);
  auVar98 = vsubps_avx(auVar98,auVar266);
  auVar87._0_4_ = fVar174 * auVar98._0_4_;
  auVar87._4_4_ = fVar197 * auVar98._4_4_;
  auVar87._8_4_ = fVar198 * auVar98._8_4_;
  auVar87._12_4_ = fVar199 * auVar98._12_4_;
  auVar351._16_4_ = fVar200 * auVar98._16_4_;
  auVar351._0_16_ = auVar87;
  auVar351._20_4_ = fVar201 * auVar98._20_4_;
  auVar351._24_4_ = fVar202 * auVar98._24_4_;
  auVar351._28_4_ = auVar98._28_4_;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + lVar10 + 6);
  auVar15 = vpmovsxwd_avx(auVar24);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + lVar10 + 0xe);
  auVar126 = vpmovsxwd_avx(auVar3);
  auVar299._16_16_ = auVar126;
  auVar299._0_16_ = auVar15;
  auVar98 = vcvtdq2ps_avx(auVar299);
  auVar98 = vsubps_avx(auVar98,auVar266);
  auVar96._0_4_ = fVar174 * auVar98._0_4_;
  auVar96._4_4_ = fVar197 * auVar98._4_4_;
  auVar96._8_4_ = fVar198 * auVar98._8_4_;
  auVar96._12_4_ = fVar199 * auVar98._12_4_;
  auVar13._16_4_ = fVar200 * auVar98._16_4_;
  auVar13._0_16_ = auVar96;
  auVar13._20_4_ = fVar201 * auVar98._20_4_;
  auVar13._24_4_ = fVar202 * auVar98._24_4_;
  auVar13._28_4_ = auVar11._28_4_ + auVar166._28_4_;
  lVar84 = (ulong)(byte)PVar7 * 0x10;
  auVar232._8_8_ = 0;
  auVar232._0_8_ = *(ulong *)(prim + lVar84 + 6);
  auVar15 = vpmovsxwd_avx(auVar232);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + lVar84 + 0xe);
  auVar126 = vpmovsxwd_avx(auVar4);
  lVar84 = lVar84 + uVar85 * -2;
  auVar127._8_8_ = 0;
  auVar127._0_8_ = *(ulong *)(prim + lVar84 + 6);
  auVar24 = vpmovsxwd_avx(auVar127);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + lVar84 + 0xe);
  auVar3 = vpmovsxwd_avx(auVar5);
  auVar267._16_16_ = auVar3;
  auVar267._0_16_ = auVar24;
  auVar98 = vcvtdq2ps_avx(auVar267);
  auVar98 = vsubps_avx(auVar98,auVar140);
  auVar262._0_4_ = fVar228 * auVar98._0_4_;
  auVar262._4_4_ = fVar247 * auVar98._4_4_;
  auVar262._8_4_ = fVar249 * auVar98._8_4_;
  auVar262._12_4_ = fVar251 * auVar98._12_4_;
  auVar11._16_4_ = fVar253 * auVar98._16_4_;
  auVar11._0_16_ = auVar262;
  auVar11._20_4_ = fVar255 * auVar98._20_4_;
  auVar11._24_4_ = fVar257 * auVar98._24_4_;
  auVar11._28_4_ = auVar98._28_4_;
  auVar300._16_16_ = auVar126;
  auVar300._0_16_ = auVar15;
  auVar98 = vcvtdq2ps_avx(auVar300);
  auVar98 = vsubps_avx(auVar98,auVar140);
  auVar125._0_4_ = fVar228 * auVar98._0_4_;
  auVar125._4_4_ = fVar247 * auVar98._4_4_;
  auVar125._8_4_ = fVar249 * auVar98._8_4_;
  auVar125._12_4_ = fVar251 * auVar98._12_4_;
  auVar14._16_4_ = fVar253 * auVar98._16_4_;
  auVar14._0_16_ = auVar125;
  auVar14._20_4_ = fVar255 * auVar98._20_4_;
  auVar14._24_4_ = fVar257 * auVar98._24_4_;
  auVar14._28_4_ = auVar98._28_4_;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar82 + uVar85 + 6);
  auVar15 = vpmovsxwd_avx(auVar6);
  auVar181._8_8_ = 0;
  auVar181._0_8_ = *(ulong *)(prim + uVar82 + uVar85 + 0xe);
  auVar126 = vpmovsxwd_avx(auVar181);
  auVar238._16_16_ = auVar126;
  auVar238._0_16_ = auVar15;
  auVar98 = vcvtdq2ps_avx(auVar238);
  auVar98 = vsubps_avx(auVar98,auVar164);
  auVar231._0_4_ = fVar203 * auVar98._0_4_;
  auVar231._4_4_ = fVar219 * auVar98._4_4_;
  auVar231._8_4_ = fVar220 * auVar98._8_4_;
  auVar231._12_4_ = fVar221 * auVar98._12_4_;
  auVar352._16_4_ = fVar222 * auVar98._16_4_;
  auVar352._0_16_ = auVar231;
  auVar352._20_4_ = fVar224 * auVar98._20_4_;
  auVar352._24_4_ = fVar226 * auVar98._24_4_;
  auVar352._28_4_ = auVar98._28_4_;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = *(ulong *)(prim + uVar85 * 0x17 + 6);
  auVar15 = vpmovsxwd_avx(auVar94);
  auVar160._8_8_ = 0;
  auVar160._0_8_ = *(ulong *)(prim + uVar85 * 0x17 + 0xe);
  auVar126 = vpmovsxwd_avx(auVar160);
  auVar301._16_16_ = auVar126;
  auVar301._0_16_ = auVar15;
  auVar98 = vcvtdq2ps_avx(auVar301);
  auVar98 = vsubps_avx(auVar98,auVar164);
  auVar157._0_4_ = fVar203 * auVar98._0_4_;
  auVar157._4_4_ = fVar219 * auVar98._4_4_;
  auVar157._8_4_ = fVar220 * auVar98._8_4_;
  auVar157._12_4_ = fVar221 * auVar98._12_4_;
  auVar25._16_4_ = fVar222 * auVar98._16_4_;
  auVar25._0_16_ = auVar157;
  auVar25._20_4_ = fVar224 * auVar98._20_4_;
  auVar25._24_4_ = fVar226 * auVar98._24_4_;
  auVar25._28_4_ = auVar98._28_4_;
  auVar15 = vpminsd_avx(auVar351._16_16_,auVar13._16_16_);
  auVar126 = vpminsd_avx(auVar87,auVar96);
  auVar327._16_16_ = auVar15;
  auVar327._0_16_ = auVar126;
  auVar15 = vpminsd_avx(auVar11._16_16_,auVar14._16_16_);
  auVar126 = vpminsd_avx(auVar262,auVar125);
  auVar349._16_16_ = auVar15;
  auVar349._0_16_ = auVar126;
  auVar98 = vmaxps_avx(auVar327,auVar349);
  auVar15 = vpminsd_avx(auVar352._16_16_,auVar25._16_16_);
  auVar126 = vpminsd_avx(auVar231,auVar157);
  auVar373._16_16_ = auVar15;
  auVar373._0_16_ = auVar126;
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar387._4_4_ = uVar1;
  auVar387._0_4_ = uVar1;
  auVar387._8_4_ = uVar1;
  auVar387._12_4_ = uVar1;
  auVar387._16_4_ = uVar1;
  auVar387._20_4_ = uVar1;
  auVar387._24_4_ = uVar1;
  auVar387._28_4_ = uVar1;
  auVar152 = vmaxps_avx(auVar373,auVar387);
  auVar98 = vmaxps_avx(auVar98,auVar152);
  local_340._4_4_ = auVar98._4_4_ * 0.99999964;
  local_340._0_4_ = auVar98._0_4_ * 0.99999964;
  local_340._8_4_ = auVar98._8_4_ * 0.99999964;
  local_340._12_4_ = auVar98._12_4_ * 0.99999964;
  local_340._16_4_ = auVar98._16_4_ * 0.99999964;
  local_340._20_4_ = auVar98._20_4_ * 0.99999964;
  local_340._24_4_ = auVar98._24_4_ * 0.99999964;
  local_340._28_4_ = auVar98._28_4_;
  auVar15 = vpmaxsd_avx(auVar351._16_16_,auVar13._16_16_);
  auVar126 = vpmaxsd_avx(auVar87,auVar96);
  auVar100._16_16_ = auVar15;
  auVar100._0_16_ = auVar126;
  auVar15 = vpmaxsd_avx(auVar11._16_16_,auVar14._16_16_);
  auVar126 = vpmaxsd_avx(auVar262,auVar125);
  auVar141._16_16_ = auVar15;
  auVar141._0_16_ = auVar126;
  auVar98 = vminps_avx(auVar100,auVar141);
  auVar15 = vpmaxsd_avx(auVar352._16_16_,auVar25._16_16_);
  auVar126 = vpmaxsd_avx(auVar231,auVar157);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar191._4_4_ = uVar1;
  auVar191._0_4_ = uVar1;
  auVar191._8_4_ = uVar1;
  auVar191._12_4_ = uVar1;
  auVar191._16_4_ = uVar1;
  auVar191._20_4_ = uVar1;
  auVar191._24_4_ = uVar1;
  auVar191._28_4_ = uVar1;
  auVar142._16_16_ = auVar15;
  auVar142._0_16_ = auVar126;
  auVar152 = vminps_avx(auVar142,auVar191);
  auVar98 = vminps_avx(auVar98,auVar152);
  auVar152._4_4_ = auVar98._4_4_ * 1.0000004;
  auVar152._0_4_ = auVar98._0_4_ * 1.0000004;
  auVar152._8_4_ = auVar98._8_4_ * 1.0000004;
  auVar152._12_4_ = auVar98._12_4_ * 1.0000004;
  auVar152._16_4_ = auVar98._16_4_ * 1.0000004;
  auVar152._20_4_ = auVar98._20_4_ * 1.0000004;
  auVar152._24_4_ = auVar98._24_4_ * 1.0000004;
  auVar152._28_4_ = auVar98._28_4_;
  auVar98 = vcmpps_avx(local_340,auVar152,2);
  auVar15 = vpshufd_avx(ZEXT116((byte)PVar7),0);
  auVar143._16_16_ = auVar15;
  auVar143._0_16_ = auVar15;
  auVar152 = vcvtdq2ps_avx(auVar143);
  auVar152 = vcmpps_avx(_DAT_01faff40,auVar152,1);
  auVar98 = vandps_avx(auVar98,auVar152);
  uVar79 = vmovmskps_avx(auVar98);
  if (uVar79 == 0) {
    return;
  }
  uVar79 = uVar79 & 0xff;
  auVar101._16_16_ = mm_lookupmask_ps._240_16_;
  auVar101._0_16_ = mm_lookupmask_ps._240_16_;
  local_7c8 = prim + lVar73 + 0x16;
  local_420 = vblendps_avx(auVar101,ZEXT832(0) << 0x20,0x80);
  local_950 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_948 = prim;
LAB_00fe69c1:
  uVar85 = (ulong)uVar79;
  lVar84 = 0;
  if (uVar85 != 0) {
    for (; (uVar79 >> lVar84 & 1) == 0; lVar84 = lVar84 + 1) {
    }
  }
  uVar85 = uVar85 - 1 & uVar85;
  local_8e0 = *(uint *)(local_948 + lVar84 * 4 + 6);
  lVar84 = lVar84 * 0x40;
  lVar10 = 0;
  if (uVar85 != 0) {
    for (; (uVar85 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
    }
  }
  uVar79 = *(uint *)(local_948 + 2);
  auVar15 = *(undefined1 (*) [16])(local_7c8 + lVar84);
  if (((uVar85 != 0) && (uVar82 = uVar85 - 1 & uVar85, uVar82 != 0)) && (lVar10 = 0, uVar82 != 0)) {
    for (; (uVar82 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
    }
  }
  auVar126 = *(undefined1 (*) [16])(local_7c8 + lVar84 + 0x10);
  auVar24 = *(undefined1 (*) [16])(local_7c8 + lVar84 + 0x20);
  auVar3 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c
                        );
  auVar4 = vinsertps_avx(auVar3,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar174 = *(float *)(ray + k * 4 + 0x40);
  auVar338._4_4_ = fVar174;
  auVar338._0_4_ = fVar174;
  auVar338._8_4_ = fVar174;
  auVar338._12_4_ = fVar174;
  fStack_750 = fVar174;
  _local_760 = auVar338;
  fStack_74c = fVar174;
  fStack_748 = fVar174;
  fStack_744 = fVar174;
  auVar3 = *(undefined1 (*) [16])(local_7c8 + lVar84 + 0x30);
  fVar197 = *(float *)(ray + k * 4 + 0x50);
  auVar372._4_4_ = fVar197;
  auVar372._0_4_ = fVar197;
  auVar372._8_4_ = fVar197;
  auVar372._12_4_ = fVar197;
  fStack_8b0 = fVar197;
  _local_8c0 = auVar372;
  fStack_8ac = fVar197;
  fStack_8a8 = fVar197;
  fStack_8a4 = fVar197;
  auVar232 = vunpcklps_avx(auVar338,auVar372);
  fVar198 = *(float *)(ray + k * 4 + 0x60);
  auVar393._4_4_ = fVar198;
  auVar393._0_4_ = fVar198;
  auVar393._8_4_ = fVar198;
  auVar393._12_4_ = fVar198;
  fStack_710 = fVar198;
  _local_720 = auVar393;
  fStack_70c = fVar198;
  fStack_708 = fVar198;
  register0x000015dc = fVar198;
  _local_910 = vinsertps_avx(auVar232,auVar393,0x28);
  auVar88._0_4_ = (auVar15._0_4_ + auVar126._0_4_ + auVar24._0_4_ + auVar3._0_4_) * 0.25;
  auVar88._4_4_ = (auVar15._4_4_ + auVar126._4_4_ + auVar24._4_4_ + auVar3._4_4_) * 0.25;
  auVar88._8_4_ = (auVar15._8_4_ + auVar126._8_4_ + auVar24._8_4_ + auVar3._8_4_) * 0.25;
  auVar88._12_4_ = (auVar15._12_4_ + auVar126._12_4_ + auVar24._12_4_ + auVar3._12_4_) * 0.25;
  auVar232 = vsubps_avx(auVar88,auVar4);
  auVar232 = vdpps_avx(auVar232,_local_910,0x7f);
  local_920 = vdpps_avx(_local_910,_local_910,0x7f);
  auVar127 = vrcpss_avx(local_920,local_920);
  fVar199 = auVar232._0_4_ * auVar127._0_4_ * (2.0 - local_920._0_4_ * auVar127._0_4_);
  auVar127 = vshufps_avx(ZEXT416((uint)fVar199),ZEXT416((uint)fVar199),0);
  auVar204._0_4_ = auVar4._0_4_ + local_910._0_4_ * auVar127._0_4_;
  auVar204._4_4_ = auVar4._4_4_ + local_910._4_4_ * auVar127._4_4_;
  auVar204._8_4_ = auVar4._8_4_ + local_910._8_4_ * auVar127._8_4_;
  auVar204._12_4_ = auVar4._12_4_ + local_910._12_4_ * auVar127._12_4_;
  auVar232 = vblendps_avx(auVar204,_DAT_01f7aa10,8);
  auVar4 = vsubps_avx(auVar15,auVar232);
  auVar5 = vsubps_avx(auVar24,auVar232);
  auVar6 = vsubps_avx(auVar126,auVar232);
  auVar3 = vsubps_avx(auVar3,auVar232);
  auVar15 = vshufps_avx(auVar4,auVar4,0);
  auVar126 = vshufps_avx(auVar4,auVar4,0x55);
  local_980._16_16_ = auVar126;
  local_980._0_16_ = auVar126;
  auVar353 = ZEXT3264(local_980);
  auVar126 = vshufps_avx(auVar4,auVar4,0xaa);
  local_9a0._16_16_ = auVar126;
  local_9a0._0_16_ = auVar126;
  auVar363 = ZEXT3264(local_9a0);
  auVar126 = vshufps_avx(auVar4,auVar4,0xff);
  local_9c0._16_16_ = auVar126;
  local_9c0._0_16_ = auVar126;
  auVar397 = ZEXT3264(local_9c0);
  auVar126 = vshufps_avx(auVar6,auVar6,0);
  auVar239._16_16_ = auVar126;
  auVar239._0_16_ = auVar126;
  auVar126 = vshufps_avx(auVar6,auVar6,0x55);
  register0x00001290 = auVar126;
  _local_1e0 = auVar126;
  auVar126 = vshufps_avx(auVar6,auVar6,0xaa);
  local_a00._16_16_ = auVar126;
  local_a00._0_16_ = auVar126;
  auVar275 = ZEXT3264(local_a00);
  auVar126 = vshufps_avx(auVar6,auVar6,0xff);
  local_a20._16_16_ = auVar126;
  local_a20._0_16_ = auVar126;
  auVar329 = ZEXT3264(local_a20);
  auVar126 = vshufps_avx(auVar5,auVar5,0);
  local_2e0._16_16_ = auVar126;
  local_2e0._0_16_ = auVar126;
  auVar126 = vshufps_avx(auVar5,auVar5,0x55);
  local_300._16_16_ = auVar126;
  local_300._0_16_ = auVar126;
  auVar126 = vshufps_avx(auVar5,auVar5,0xaa);
  register0x00001290 = auVar126;
  _local_200 = auVar126;
  auVar126 = vshufps_avx(auVar5,auVar5,0xff);
  register0x00001290 = auVar126;
  _local_220 = auVar126;
  auVar126 = vshufps_avx(auVar3,auVar3,0);
  register0x00001290 = auVar126;
  _local_240 = auVar126;
  auVar126 = vshufps_avx(auVar3,auVar3,0x55);
  register0x00001290 = auVar126;
  _local_260 = auVar126;
  auVar126 = vshufps_avx(auVar3,auVar3,0xaa);
  register0x00001290 = auVar126;
  _local_280 = auVar126;
  auVar126 = vshufps_avx(auVar3,auVar3,0xff);
  register0x00001290 = auVar126;
  _local_2a0 = auVar126;
  auVar126 = ZEXT416((uint)(fVar174 * fVar174 + fVar197 * fVar197 + fVar198 * fVar198));
  auVar126 = vshufps_avx(auVar126,auVar126,0);
  local_2c0._16_16_ = auVar126;
  local_2c0._0_16_ = auVar126;
  fVar174 = *(float *)(ray + k * 4 + 0x30);
  local_7f0 = ZEXT416((uint)fVar199);
  auVar126 = vshufps_avx(ZEXT416((uint)(fVar174 - fVar199)),ZEXT416((uint)(fVar174 - fVar199)),0);
  local_320._16_16_ = auVar126;
  local_320._0_16_ = auVar126;
  local_690 = vpshufd_avx(ZEXT416(uVar79),0);
  local_6a0 = vpshufd_avx(ZEXT416(local_8e0),0);
  local_c00 = auVar127._0_8_;
  uStack_bf8 = auVar127._8_8_;
  local_880 = local_c00;
  uStack_878 = uStack_bf8;
  uStack_870 = local_c00;
  uStack_868 = uStack_bf8;
  local_c08 = 1;
  uVar82 = 0;
  auVar102._8_4_ = 0x7fffffff;
  auVar102._0_8_ = 0x7fffffff7fffffff;
  auVar102._12_4_ = 0x7fffffff;
  auVar102._16_4_ = 0x7fffffff;
  auVar102._20_4_ = 0x7fffffff;
  auVar102._24_4_ = 0x7fffffff;
  auVar102._28_4_ = 0x7fffffff;
  local_460 = vandps_avx(local_2c0,auVar102);
  auVar126 = vsqrtss_avx(local_920,local_920);
  auVar24 = vsqrtss_avx(local_920,local_920);
  local_490 = ZEXT816(0x3f80000000000000);
  local_440 = auVar239;
  do {
    auVar192._8_4_ = 0x3f800000;
    auVar192._0_8_ = 0x3f8000003f800000;
    auVar192._12_4_ = 0x3f800000;
    auVar192._16_4_ = 0x3f800000;
    auVar192._20_4_ = 0x3f800000;
    iVar83 = (int)uVar82;
    auVar192._24_4_ = 0x3f800000;
    auVar192._28_4_ = 0x3f800000;
    auVar232 = vmovshdup_avx(local_490);
    auVar181 = vsubps_avx(auVar232,local_490);
    auVar232 = vshufps_avx(local_490,local_490,0);
    local_6c0._16_16_ = auVar232;
    local_6c0._0_16_ = auVar232;
    auVar127 = vshufps_avx(auVar181,auVar181,0);
    local_6e0._16_16_ = auVar127;
    local_6e0._0_16_ = auVar127;
    fVar123 = auVar127._0_4_;
    fVar154 = auVar127._4_4_;
    fVar155 = auVar127._8_4_;
    fVar156 = auVar127._12_4_;
    fVar86 = auVar232._0_4_;
    auVar144._0_4_ = fVar86 + fVar123 * 0.0;
    fVar114 = auVar232._4_4_;
    auVar144._4_4_ = fVar114 + fVar154 * 0.14285715;
    fVar116 = auVar232._8_4_;
    auVar144._8_4_ = fVar116 + fVar155 * 0.2857143;
    fVar118 = auVar232._12_4_;
    auVar144._12_4_ = fVar118 + fVar156 * 0.42857146;
    auVar144._16_4_ = fVar86 + fVar123 * 0.5714286;
    auVar144._20_4_ = fVar114 + fVar154 * 0.71428573;
    auVar144._24_4_ = fVar116 + fVar155 * 0.8571429;
    auVar144._28_4_ = fVar118 + fVar156;
    auVar98 = vsubps_avx(auVar192,auVar144);
    fVar219 = auVar239._28_4_;
    fVar197 = auVar98._0_4_;
    fVar198 = auVar98._4_4_;
    fVar199 = auVar98._8_4_;
    fVar200 = auVar98._12_4_;
    fVar310 = auVar15._12_4_;
    fVar201 = auVar98._16_4_;
    fVar202 = auVar98._20_4_;
    fVar203 = auVar98._24_4_;
    fVar249 = fVar310 + 1.0;
    fVar330 = fVar219 + fVar249;
    fVar259 = local_2e0._0_4_ * auVar144._0_4_ + auVar239._0_4_ * fVar197;
    fVar276 = local_2e0._4_4_ * auVar144._4_4_ + auVar239._4_4_ * fVar198;
    fVar279 = local_2e0._8_4_ * auVar144._8_4_ + auVar239._8_4_ * fVar199;
    fVar282 = local_2e0._12_4_ * auVar144._12_4_ + auVar239._12_4_ * fVar200;
    fVar285 = local_2e0._16_4_ * auVar144._16_4_ + auVar239._16_4_ * fVar201;
    fVar288 = local_2e0._20_4_ * auVar144._20_4_ + auVar239._20_4_ * fVar202;
    fVar291 = local_2e0._24_4_ * auVar144._24_4_ + auVar239._24_4_ * fVar203;
    fVar220 = local_300._0_4_ * auVar144._0_4_ + (float)local_1e0._0_4_ * fVar197;
    fVar221 = local_300._4_4_ * auVar144._4_4_ + (float)local_1e0._4_4_ * fVar198;
    fVar222 = local_300._8_4_ * auVar144._8_4_ + fStack_1d8 * fVar199;
    fVar224 = local_300._12_4_ * auVar144._12_4_ + fStack_1d4 * fVar200;
    fVar226 = local_300._16_4_ * auVar144._16_4_ + fStack_1d0 * fVar201;
    fVar228 = local_300._20_4_ * auVar144._20_4_ + fStack_1cc * fVar202;
    fVar247 = local_300._24_4_ * auVar144._24_4_ + fStack_1c8 * fVar203;
    fVar251 = (float)local_200._0_4_ * auVar144._0_4_ + auVar275._0_4_ * fVar197;
    fVar253 = (float)local_200._4_4_ * auVar144._4_4_ + auVar275._4_4_ * fVar198;
    fVar255 = fStack_1f8 * auVar144._8_4_ + auVar275._8_4_ * fVar199;
    fVar257 = fStack_1f4 * auVar144._12_4_ + auVar275._12_4_ * fVar200;
    fVar223 = fStack_1f0 * auVar144._16_4_ + auVar275._16_4_ * fVar201;
    fVar225 = fStack_1ec * auVar144._20_4_ + auVar275._20_4_ * fVar202;
    fVar227 = fStack_1e8 * auVar144._24_4_ + auVar275._24_4_ * fVar203;
    fVar229 = (float)local_220._0_4_ * auVar144._0_4_ + auVar329._0_4_ * fVar197;
    fVar248 = (float)local_220._4_4_ * auVar144._4_4_ + auVar329._4_4_ * fVar198;
    fVar250 = fStack_218 * auVar144._8_4_ + auVar329._8_4_ * fVar199;
    fVar252 = fStack_214 * auVar144._12_4_ + auVar329._12_4_ * fVar200;
    fVar254 = fStack_210 * auVar144._16_4_ + auVar329._16_4_ * fVar201;
    fVar256 = fStack_20c * auVar144._20_4_ + auVar329._20_4_ * fVar202;
    fVar258 = fStack_208 * auVar144._24_4_ + auVar329._24_4_ * fVar203;
    fVar360 = auVar353._28_4_;
    fVar386 = fVar360 + local_2e0._28_4_;
    fVar370 = auVar329._28_4_ + fVar360;
    auVar334._0_4_ =
         fVar197 * (auVar239._0_4_ * auVar144._0_4_ + auVar15._0_4_ * fVar197) +
         auVar144._0_4_ * fVar259;
    auVar334._4_4_ =
         fVar198 * (auVar239._4_4_ * auVar144._4_4_ + auVar15._4_4_ * fVar198) +
         auVar144._4_4_ * fVar276;
    auVar334._8_4_ =
         fVar199 * (auVar239._8_4_ * auVar144._8_4_ + auVar15._8_4_ * fVar199) +
         auVar144._8_4_ * fVar279;
    auVar334._12_4_ =
         fVar200 * (auVar239._12_4_ * auVar144._12_4_ + fVar310 * fVar200) +
         auVar144._12_4_ * fVar282;
    auVar334._16_4_ =
         fVar201 * (auVar239._16_4_ * auVar144._16_4_ + auVar15._0_4_ * fVar201) +
         auVar144._16_4_ * fVar285;
    auVar334._20_4_ =
         fVar202 * (auVar239._20_4_ * auVar144._20_4_ + auVar15._4_4_ * fVar202) +
         auVar144._20_4_ * fVar288;
    auVar334._24_4_ =
         fVar203 * (auVar239._24_4_ * auVar144._24_4_ + auVar15._8_4_ * fVar203) +
         auVar144._24_4_ * fVar291;
    auVar334._28_4_ = fStack_1e4 + fVar360;
    auVar340._0_4_ =
         fVar197 * ((float)local_1e0._0_4_ * auVar144._0_4_ + auVar353._0_4_ * fVar197) +
         auVar144._0_4_ * fVar220;
    auVar340._4_4_ =
         fVar198 * ((float)local_1e0._4_4_ * auVar144._4_4_ + auVar353._4_4_ * fVar198) +
         auVar144._4_4_ * fVar221;
    auVar340._8_4_ =
         fVar199 * (fStack_1d8 * auVar144._8_4_ + auVar353._8_4_ * fVar199) +
         auVar144._8_4_ * fVar222;
    auVar340._12_4_ =
         fVar200 * (fStack_1d4 * auVar144._12_4_ + auVar353._12_4_ * fVar200) +
         auVar144._12_4_ * fVar224;
    auVar340._16_4_ =
         fVar201 * (fStack_1d0 * auVar144._16_4_ + auVar353._16_4_ * fVar201) +
         auVar144._16_4_ * fVar226;
    auVar340._20_4_ =
         fVar202 * (fStack_1cc * auVar144._20_4_ + auVar353._20_4_ * fVar202) +
         auVar144._20_4_ * fVar228;
    auVar340._24_4_ =
         fVar203 * (fStack_1c8 * auVar144._24_4_ + auVar353._24_4_ * fVar203) +
         auVar144._24_4_ * fVar247;
    auVar340._28_4_ = fStack_204 + fVar360;
    auVar350._0_4_ =
         (auVar275._0_4_ * auVar144._0_4_ + auVar363._0_4_ * fVar197) * fVar197 +
         auVar144._0_4_ * fVar251;
    auVar350._4_4_ =
         (auVar275._4_4_ * auVar144._4_4_ + auVar363._4_4_ * fVar198) * fVar198 +
         auVar144._4_4_ * fVar253;
    auVar350._8_4_ =
         (auVar275._8_4_ * auVar144._8_4_ + auVar363._8_4_ * fVar199) * fVar199 +
         auVar144._8_4_ * fVar255;
    auVar350._12_4_ =
         (auVar275._12_4_ * auVar144._12_4_ + auVar363._12_4_ * fVar200) * fVar200 +
         auVar144._12_4_ * fVar257;
    auVar350._16_4_ =
         (auVar275._16_4_ * auVar144._16_4_ + auVar363._16_4_ * fVar201) * fVar201 +
         auVar144._16_4_ * fVar223;
    auVar350._20_4_ =
         (auVar275._20_4_ * auVar144._20_4_ + auVar363._20_4_ * fVar202) * fVar202 +
         auVar144._20_4_ * fVar225;
    auVar350._24_4_ =
         (auVar275._24_4_ * auVar144._24_4_ + auVar363._24_4_ * fVar203) * fVar203 +
         auVar144._24_4_ * fVar227;
    auVar350._28_4_ = fVar330 + fVar360;
    auVar302._0_4_ =
         auVar144._0_4_ * fVar229 +
         fVar197 * (auVar329._0_4_ * auVar144._0_4_ + auVar397._0_4_ * fVar197);
    auVar302._4_4_ =
         auVar144._4_4_ * fVar248 +
         fVar198 * (auVar329._4_4_ * auVar144._4_4_ + auVar397._4_4_ * fVar198);
    auVar302._8_4_ =
         auVar144._8_4_ * fVar250 +
         fVar199 * (auVar329._8_4_ * auVar144._8_4_ + auVar397._8_4_ * fVar199);
    auVar302._12_4_ =
         auVar144._12_4_ * fVar252 +
         fVar200 * (auVar329._12_4_ * auVar144._12_4_ + auVar397._12_4_ * fVar200);
    auVar302._16_4_ =
         auVar144._16_4_ * fVar254 +
         fVar201 * (auVar329._16_4_ * auVar144._16_4_ + auVar397._16_4_ * fVar201);
    auVar302._20_4_ =
         auVar144._20_4_ * fVar256 +
         fVar202 * (auVar329._20_4_ * auVar144._20_4_ + auVar397._20_4_ * fVar202);
    auVar302._24_4_ =
         auVar144._24_4_ * fVar258 +
         fVar203 * (auVar329._24_4_ * auVar144._24_4_ + auVar397._24_4_ * fVar203);
    auVar302._28_4_ = fVar330 + fVar310;
    auVar268._0_4_ =
         (auVar144._0_4_ * (float)local_240._0_4_ + local_2e0._0_4_ * fVar197) * auVar144._0_4_ +
         fVar197 * fVar259;
    auVar268._4_4_ =
         (auVar144._4_4_ * (float)local_240._4_4_ + local_2e0._4_4_ * fVar198) * auVar144._4_4_ +
         fVar198 * fVar276;
    auVar268._8_4_ =
         (auVar144._8_4_ * fStack_238 + local_2e0._8_4_ * fVar199) * auVar144._8_4_ +
         fVar199 * fVar279;
    auVar268._12_4_ =
         (auVar144._12_4_ * fStack_234 + local_2e0._12_4_ * fVar200) * auVar144._12_4_ +
         fVar200 * fVar282;
    auVar268._16_4_ =
         (auVar144._16_4_ * fStack_230 + local_2e0._16_4_ * fVar201) * auVar144._16_4_ +
         fVar201 * fVar285;
    auVar268._20_4_ =
         (auVar144._20_4_ * fStack_22c + local_2e0._20_4_ * fVar202) * auVar144._20_4_ +
         fVar202 * fVar288;
    auVar268._24_4_ =
         (auVar144._24_4_ * fStack_228 + local_2e0._24_4_ * fVar203) * auVar144._24_4_ +
         fVar203 * fVar291;
    auVar268._28_4_ = fVar330 + fVar249 + auVar275._28_4_;
    auVar193._0_4_ =
         (auVar144._0_4_ * (float)local_260._0_4_ + local_300._0_4_ * fVar197) * auVar144._0_4_ +
         fVar197 * fVar220;
    auVar193._4_4_ =
         (auVar144._4_4_ * (float)local_260._4_4_ + local_300._4_4_ * fVar198) * auVar144._4_4_ +
         fVar198 * fVar221;
    auVar193._8_4_ =
         (auVar144._8_4_ * fStack_258 + local_300._8_4_ * fVar199) * auVar144._8_4_ +
         fVar199 * fVar222;
    auVar193._12_4_ =
         (auVar144._12_4_ * fStack_254 + local_300._12_4_ * fVar200) * auVar144._12_4_ +
         fVar200 * fVar224;
    auVar193._16_4_ =
         (auVar144._16_4_ * fStack_250 + local_300._16_4_ * fVar201) * auVar144._16_4_ +
         fVar201 * fVar226;
    auVar193._20_4_ =
         (auVar144._20_4_ * fStack_24c + local_300._20_4_ * fVar202) * auVar144._20_4_ +
         fVar202 * fVar228;
    auVar193._24_4_ =
         (auVar144._24_4_ * fStack_248 + local_300._24_4_ * fVar203) * auVar144._24_4_ +
         fVar203 * fVar247;
    auVar193._28_4_ = fVar330 + fVar219 + fVar249;
    auVar214._0_4_ =
         (auVar144._0_4_ * (float)local_280._0_4_ + (float)local_200._0_4_ * fVar197) *
         auVar144._0_4_ + fVar197 * fVar251;
    auVar214._4_4_ =
         (auVar144._4_4_ * (float)local_280._4_4_ + (float)local_200._4_4_ * fVar198) *
         auVar144._4_4_ + fVar198 * fVar253;
    auVar214._8_4_ =
         (auVar144._8_4_ * fStack_278 + fStack_1f8 * fVar199) * auVar144._8_4_ + fVar199 * fVar255;
    auVar214._12_4_ =
         (auVar144._12_4_ * fStack_274 + fStack_1f4 * fVar200) * auVar144._12_4_ + fVar200 * fVar257
    ;
    auVar214._16_4_ =
         (auVar144._16_4_ * fStack_270 + fStack_1f0 * fVar201) * auVar144._16_4_ + fVar201 * fVar223
    ;
    auVar214._20_4_ =
         (auVar144._20_4_ * fStack_26c + fStack_1ec * fVar202) * auVar144._20_4_ + fVar202 * fVar225
    ;
    auVar214._24_4_ =
         (auVar144._24_4_ * fStack_268 + fStack_1e8 * fVar203) * auVar144._24_4_ + fVar203 * fVar227
    ;
    auVar214._28_4_ = fVar370 + fVar310 + auVar275._28_4_;
    auVar240._0_4_ =
         (auVar144._0_4_ * (float)local_2a0._0_4_ + (float)local_220._0_4_ * fVar197) *
         auVar144._0_4_ + fVar197 * fVar229;
    auVar240._4_4_ =
         (auVar144._4_4_ * (float)local_2a0._4_4_ + (float)local_220._4_4_ * fVar198) *
         auVar144._4_4_ + fVar198 * fVar248;
    auVar240._8_4_ =
         (auVar144._8_4_ * fStack_298 + fStack_218 * fVar199) * auVar144._8_4_ + fVar199 * fVar250;
    auVar240._12_4_ =
         (auVar144._12_4_ * fStack_294 + fStack_214 * fVar200) * auVar144._12_4_ + fVar200 * fVar252
    ;
    auVar240._16_4_ =
         (auVar144._16_4_ * fStack_290 + fStack_210 * fVar201) * auVar144._16_4_ + fVar201 * fVar254
    ;
    auVar240._20_4_ =
         (auVar144._20_4_ * fStack_28c + fStack_20c * fVar202) * auVar144._20_4_ + fVar202 * fVar256
    ;
    auVar240._24_4_ =
         (auVar144._24_4_ * fStack_288 + fStack_208 * fVar203) * auVar144._24_4_ + fVar203 * fVar258
    ;
    auVar240._28_4_ = fVar386 + fVar360 + fVar219;
    auVar374._0_4_ = auVar334._0_4_ * fVar197 + auVar144._0_4_ * auVar268._0_4_;
    auVar374._4_4_ = auVar334._4_4_ * fVar198 + auVar144._4_4_ * auVar268._4_4_;
    auVar374._8_4_ = auVar334._8_4_ * fVar199 + auVar144._8_4_ * auVar268._8_4_;
    auVar374._12_4_ = auVar334._12_4_ * fVar200 + auVar144._12_4_ * auVar268._12_4_;
    auVar374._16_4_ = auVar334._16_4_ * fVar201 + auVar144._16_4_ * auVar268._16_4_;
    auVar374._20_4_ = auVar334._20_4_ * fVar202 + auVar144._20_4_ * auVar268._20_4_;
    auVar374._24_4_ = auVar334._24_4_ * fVar203 + auVar144._24_4_ * auVar268._24_4_;
    auVar374._28_4_ = fVar386 + fVar330;
    auVar388._0_4_ = auVar340._0_4_ * fVar197 + auVar144._0_4_ * auVar193._0_4_;
    auVar388._4_4_ = auVar340._4_4_ * fVar198 + auVar144._4_4_ * auVar193._4_4_;
    auVar388._8_4_ = auVar340._8_4_ * fVar199 + auVar144._8_4_ * auVar193._8_4_;
    auVar388._12_4_ = auVar340._12_4_ * fVar200 + auVar144._12_4_ * auVar193._12_4_;
    auVar388._16_4_ = auVar340._16_4_ * fVar201 + auVar144._16_4_ * auVar193._16_4_;
    auVar388._20_4_ = auVar340._20_4_ * fVar202 + auVar144._20_4_ * auVar193._20_4_;
    auVar388._24_4_ = auVar340._24_4_ * fVar203 + auVar144._24_4_ * auVar193._24_4_;
    auVar388._28_4_ = fVar330 + fVar370;
    local_500._0_4_ = auVar350._0_4_ * fVar197 + auVar144._0_4_ * auVar214._0_4_;
    local_500._4_4_ = auVar350._4_4_ * fVar198 + auVar144._4_4_ * auVar214._4_4_;
    local_500._8_4_ = auVar350._8_4_ * fVar199 + auVar144._8_4_ * auVar214._8_4_;
    local_500._12_4_ = auVar350._12_4_ * fVar200 + auVar144._12_4_ * auVar214._12_4_;
    local_500._16_4_ = auVar350._16_4_ * fVar201 + auVar144._16_4_ * auVar214._16_4_;
    local_500._20_4_ = auVar350._20_4_ * fVar202 + auVar144._20_4_ * auVar214._20_4_;
    local_500._24_4_ = auVar350._24_4_ * fVar203 + auVar144._24_4_ * auVar214._24_4_;
    local_500._28_4_ = fVar370 + fVar330;
    local_bc0 = auVar181._0_4_;
    local_700._0_4_ = fVar197 * auVar302._0_4_ + auVar144._0_4_ * auVar240._0_4_;
    local_700._4_4_ = fVar198 * auVar302._4_4_ + auVar144._4_4_ * auVar240._4_4_;
    local_700._8_4_ = fVar199 * auVar302._8_4_ + auVar144._8_4_ * auVar240._8_4_;
    local_700._12_4_ = fVar200 * auVar302._12_4_ + auVar144._12_4_ * auVar240._12_4_;
    local_700._16_4_ = fVar201 * auVar302._16_4_ + auVar144._16_4_ * auVar240._16_4_;
    local_700._20_4_ = fVar202 * auVar302._20_4_ + auVar144._20_4_ * auVar240._20_4_;
    local_700._24_4_ = fVar203 * auVar302._24_4_ + auVar144._24_4_ * auVar240._24_4_;
    local_700._28_4_ = auVar98._28_4_ + auVar144._28_4_;
    auVar98 = vsubps_avx(auVar268,auVar334);
    auVar152 = vsubps_avx(auVar193,auVar340);
    auVar351 = vsubps_avx(auVar214,auVar350);
    auVar11 = vsubps_avx(auVar240,auVar302);
    auVar232 = vshufps_avx(ZEXT416((uint)(local_bc0 * 0.04761905)),
                           ZEXT416((uint)(local_bc0 * 0.04761905)),0);
    fVar202 = auVar232._0_4_;
    fVar260 = fVar202 * auVar98._0_4_ * 3.0;
    fVar219 = auVar232._4_4_;
    fVar277 = fVar219 * auVar98._4_4_ * 3.0;
    local_940._4_4_ = fVar277;
    local_940._0_4_ = fVar260;
    fVar228 = auVar232._8_4_;
    fVar280 = fVar228 * auVar98._8_4_ * 3.0;
    fStack_938 = fVar280;
    fVar257 = auVar232._12_4_;
    fVar283 = fVar257 * auVar98._12_4_ * 3.0;
    fStack_934 = fVar283;
    fVar286 = fVar202 * auVar98._16_4_ * 3.0;
    unique0x1000ab44 = fVar286;
    fVar289 = fVar219 * auVar98._20_4_ * 3.0;
    unique0x1000ab48 = fVar289;
    fVar292 = fVar228 * auVar98._24_4_ * 3.0;
    unique0x1000ab4c = fVar292;
    unique0x1000ab50 = auVar268._28_4_;
    fVar294 = fVar202 * auVar152._0_4_ * 3.0;
    fVar305 = fVar219 * auVar152._4_4_ * 3.0;
    auVar26._4_4_ = fVar305;
    auVar26._0_4_ = fVar294;
    fVar307 = fVar228 * auVar152._8_4_ * 3.0;
    auVar26._8_4_ = fVar307;
    fVar311 = fVar257 * auVar152._12_4_ * 3.0;
    auVar26._12_4_ = fVar311;
    fVar314 = fVar202 * auVar152._16_4_ * 3.0;
    auVar26._16_4_ = fVar314;
    fVar317 = fVar219 * auVar152._20_4_ * 3.0;
    auVar26._20_4_ = fVar317;
    fVar320 = fVar228 * auVar152._24_4_ * 3.0;
    auVar26._24_4_ = fVar320;
    auVar26._28_4_ = auVar302._28_4_;
    fVar361 = fVar202 * auVar351._0_4_ * 3.0;
    fVar364 = fVar219 * auVar351._4_4_ * 3.0;
    auVar27._4_4_ = fVar364;
    auVar27._0_4_ = fVar361;
    fVar365 = fVar228 * auVar351._8_4_ * 3.0;
    auVar27._8_4_ = fVar365;
    fVar366 = fVar257 * auVar351._12_4_ * 3.0;
    auVar27._12_4_ = fVar366;
    fVar367 = fVar202 * auVar351._16_4_ * 3.0;
    auVar27._16_4_ = fVar367;
    fVar368 = fVar219 * auVar351._20_4_ * 3.0;
    auVar27._20_4_ = fVar368;
    fVar369 = fVar228 * auVar351._24_4_ * 3.0;
    auVar27._24_4_ = fVar369;
    auVar27._28_4_ = fVar370;
    fVar203 = fVar202 * auVar11._0_4_ * 3.0;
    fVar226 = fVar219 * auVar11._4_4_ * 3.0;
    auVar28._4_4_ = fVar226;
    auVar28._0_4_ = fVar203;
    fVar247 = fVar228 * auVar11._8_4_ * 3.0;
    auVar28._8_4_ = fVar247;
    fVar223 = fVar257 * auVar11._12_4_ * 3.0;
    auVar28._12_4_ = fVar223;
    fVar202 = fVar202 * auVar11._16_4_ * 3.0;
    auVar28._16_4_ = fVar202;
    fVar219 = fVar219 * auVar11._20_4_ * 3.0;
    auVar28._20_4_ = fVar219;
    fVar228 = fVar228 * auVar11._24_4_ * 3.0;
    auVar28._24_4_ = fVar228;
    auVar28._28_4_ = fVar257;
    auVar98 = vperm2f128_avx(auVar388,auVar388,1);
    auVar98 = vshufps_avx(auVar98,auVar388,0x30);
    auVar11 = vshufps_avx(auVar388,auVar98,0x29);
    auVar98 = vperm2f128_avx(local_500,local_500,1);
    auVar98 = vshufps_avx(auVar98,local_500,0x30);
    local_a40 = vshufps_avx(local_500,auVar98,0x29);
    auVar152 = vsubps_avx(local_700,auVar28);
    auVar98 = vperm2f128_avx(auVar152,auVar152,1);
    auVar98 = vshufps_avx(auVar98,auVar152,0x30);
    auVar166 = vshufps_avx(auVar152,auVar98,0x29);
    local_520 = vsubps_avx(auVar11,auVar388);
    _local_5a0 = vsubps_avx(local_a40,local_500);
    fVar198 = local_520._0_4_;
    fVar220 = local_520._4_4_;
    auVar29._4_4_ = fVar364 * fVar220;
    auVar29._0_4_ = fVar361 * fVar198;
    fVar249 = local_520._8_4_;
    auVar29._8_4_ = fVar365 * fVar249;
    fVar227 = local_520._12_4_;
    auVar29._12_4_ = fVar366 * fVar227;
    fVar258 = local_520._16_4_;
    auVar29._16_4_ = fVar367 * fVar258;
    fVar291 = local_520._20_4_;
    auVar29._20_4_ = fVar368 * fVar291;
    fVar17 = local_520._24_4_;
    auVar29._24_4_ = fVar369 * fVar17;
    auVar29._28_4_ = auVar152._28_4_;
    fVar347 = local_5a0._0_4_;
    fVar354 = local_5a0._4_4_;
    auVar30._4_4_ = fVar354 * fVar305;
    auVar30._0_4_ = fVar347 * fVar294;
    fVar355 = local_5a0._8_4_;
    auVar30._8_4_ = fVar355 * fVar307;
    fVar356 = local_5a0._12_4_;
    auVar30._12_4_ = fVar356 * fVar311;
    fVar357 = local_5a0._16_4_;
    auVar30._16_4_ = fVar357 * fVar314;
    fVar358 = local_5a0._20_4_;
    auVar30._20_4_ = fVar358 * fVar317;
    fVar359 = local_5a0._24_4_;
    auVar30._24_4_ = fVar359 * fVar320;
    auVar30._28_4_ = auVar98._28_4_;
    auVar379 = vsubps_avx(auVar30,auVar29);
    auVar98 = vperm2f128_avx(auVar374,auVar374,1);
    auVar98 = vshufps_avx(auVar98,auVar374,0x30);
    auVar12 = vshufps_avx(auVar374,auVar98,0x29);
    local_540 = vsubps_avx(auVar12,auVar374);
    auVar31._4_4_ = fVar354 * fVar277;
    auVar31._0_4_ = fVar347 * fVar260;
    auVar31._8_4_ = fVar355 * fVar280;
    auVar31._12_4_ = fVar356 * fVar283;
    auVar31._16_4_ = fVar357 * fVar286;
    auVar31._20_4_ = fVar358 * fVar289;
    auVar31._24_4_ = fVar359 * fVar292;
    auVar31._28_4_ = auVar12._28_4_;
    fVar199 = local_540._0_4_;
    fVar221 = local_540._4_4_;
    auVar32._4_4_ = fVar364 * fVar221;
    auVar32._0_4_ = fVar361 * fVar199;
    fVar251 = local_540._8_4_;
    auVar32._8_4_ = fVar365 * fVar251;
    fVar229 = local_540._12_4_;
    auVar32._12_4_ = fVar366 * fVar229;
    fVar259 = local_540._16_4_;
    auVar32._16_4_ = fVar367 * fVar259;
    fVar310 = local_540._20_4_;
    auVar32._20_4_ = fVar368 * fVar310;
    fVar18 = local_540._24_4_;
    auVar32._24_4_ = fVar369 * fVar18;
    auVar32._28_4_ = local_a40._28_4_;
    auVar13 = vsubps_avx(auVar32,auVar31);
    auVar33._4_4_ = fVar221 * fVar305;
    auVar33._0_4_ = fVar199 * fVar294;
    auVar33._8_4_ = fVar251 * fVar307;
    auVar33._12_4_ = fVar229 * fVar311;
    auVar33._16_4_ = fVar259 * fVar314;
    auVar33._20_4_ = fVar310 * fVar317;
    auVar33._24_4_ = fVar18 * fVar320;
    auVar33._28_4_ = local_a40._28_4_;
    auVar34._4_4_ = fVar277 * fVar220;
    auVar34._0_4_ = fVar260 * fVar198;
    auVar34._8_4_ = fVar280 * fVar249;
    auVar34._12_4_ = fVar283 * fVar227;
    auVar34._16_4_ = fVar286 * fVar258;
    auVar34._20_4_ = fVar289 * fVar291;
    auVar34._24_4_ = fVar292 * fVar17;
    auVar34._28_4_ = auVar340._28_4_;
    auVar14 = vsubps_avx(auVar34,auVar33);
    fVar197 = auVar14._28_4_;
    auVar165._0_4_ = fVar199 * fVar199 + fVar198 * fVar198 + fVar347 * fVar347;
    auVar165._4_4_ = fVar221 * fVar221 + fVar220 * fVar220 + fVar354 * fVar354;
    auVar165._8_4_ = fVar251 * fVar251 + fVar249 * fVar249 + fVar355 * fVar355;
    auVar165._12_4_ = fVar229 * fVar229 + fVar227 * fVar227 + fVar356 * fVar356;
    auVar165._16_4_ = fVar259 * fVar259 + fVar258 * fVar258 + fVar357 * fVar357;
    auVar165._20_4_ = fVar310 * fVar310 + fVar291 * fVar291 + fVar358 * fVar358;
    auVar165._24_4_ = fVar18 * fVar18 + fVar17 * fVar17 + fVar359 * fVar359;
    auVar165._28_4_ = fVar197 + fVar197 + auVar379._28_4_;
    auVar98 = vrcpps_avx(auVar165);
    fVar225 = auVar98._0_4_;
    fVar252 = auVar98._4_4_;
    auVar35._4_4_ = fVar252 * auVar165._4_4_;
    auVar35._0_4_ = fVar225 * auVar165._0_4_;
    fVar254 = auVar98._8_4_;
    auVar35._8_4_ = fVar254 * auVar165._8_4_;
    fVar256 = auVar98._12_4_;
    auVar35._12_4_ = fVar256 * auVar165._12_4_;
    fVar282 = auVar98._16_4_;
    auVar35._16_4_ = fVar282 * auVar165._16_4_;
    fVar285 = auVar98._20_4_;
    auVar35._20_4_ = fVar285 * auVar165._20_4_;
    fVar288 = auVar98._24_4_;
    auVar35._24_4_ = fVar288 * auVar165._24_4_;
    auVar35._28_4_ = auVar340._28_4_;
    auVar375._8_4_ = 0x3f800000;
    auVar375._0_8_ = 0x3f8000003f800000;
    auVar375._12_4_ = 0x3f800000;
    auVar375._16_4_ = 0x3f800000;
    auVar375._20_4_ = 0x3f800000;
    auVar375._24_4_ = 0x3f800000;
    auVar375._28_4_ = 0x3f800000;
    auVar352 = vsubps_avx(auVar375,auVar35);
    fVar225 = auVar352._0_4_ * fVar225 + fVar225;
    fVar252 = auVar352._4_4_ * fVar252 + fVar252;
    fVar254 = auVar352._8_4_ * fVar254 + fVar254;
    fVar256 = auVar352._12_4_ * fVar256 + fVar256;
    fVar282 = auVar352._16_4_ * fVar282 + fVar282;
    fVar285 = auVar352._20_4_ * fVar285 + fVar285;
    fVar288 = auVar352._24_4_ * fVar288 + fVar288;
    auVar152 = vperm2f128_avx(auVar26,auVar26,1);
    auVar152 = vshufps_avx(auVar152,auVar26,0x30);
    auVar152 = vshufps_avx(auVar26,auVar152,0x29);
    auVar351 = vperm2f128_avx(auVar27,auVar27,1);
    auVar351 = vshufps_avx(auVar351,auVar27,0x30);
    local_8a0 = vshufps_avx(auVar27,auVar351,0x29);
    fVar371 = local_8a0._0_4_;
    fVar380 = local_8a0._4_4_;
    auVar36._4_4_ = fVar380 * fVar220;
    auVar36._0_4_ = fVar371 * fVar198;
    fVar381 = local_8a0._8_4_;
    auVar36._8_4_ = fVar381 * fVar249;
    fVar382 = local_8a0._12_4_;
    auVar36._12_4_ = fVar382 * fVar227;
    fVar383 = local_8a0._16_4_;
    auVar36._16_4_ = fVar383 * fVar258;
    fVar384 = local_8a0._20_4_;
    auVar36._20_4_ = fVar384 * fVar291;
    fVar385 = local_8a0._24_4_;
    auVar36._24_4_ = fVar385 * fVar17;
    auVar36._28_4_ = auVar351._28_4_;
    fVar200 = auVar152._0_4_;
    fVar222 = auVar152._4_4_;
    auVar37._4_4_ = fVar354 * fVar222;
    auVar37._0_4_ = fVar347 * fVar200;
    fVar253 = auVar152._8_4_;
    auVar37._8_4_ = fVar355 * fVar253;
    fVar248 = auVar152._12_4_;
    auVar37._12_4_ = fVar356 * fVar248;
    fVar276 = auVar152._16_4_;
    auVar37._16_4_ = fVar357 * fVar276;
    fVar330 = auVar152._20_4_;
    auVar37._20_4_ = fVar358 * fVar330;
    fVar19 = auVar152._24_4_;
    auVar37._24_4_ = fVar359 * fVar19;
    auVar37._28_4_ = fVar370;
    auVar351 = vsubps_avx(auVar37,auVar36);
    auVar152 = vperm2f128_avx(_local_940,_local_940,1);
    auVar152 = vshufps_avx(auVar152,_local_940,0x30);
    local_860 = vshufps_avx(_local_940,auVar152,0x29);
    fVar201 = local_860._0_4_;
    fVar224 = local_860._4_4_;
    auVar38._4_4_ = fVar354 * fVar224;
    auVar38._0_4_ = fVar347 * fVar201;
    fVar255 = local_860._8_4_;
    auVar38._8_4_ = fVar355 * fVar255;
    fVar250 = local_860._12_4_;
    auVar38._12_4_ = fVar356 * fVar250;
    fVar279 = local_860._16_4_;
    auVar38._16_4_ = fVar357 * fVar279;
    fVar360 = local_860._20_4_;
    auVar38._20_4_ = fVar358 * fVar360;
    fVar20 = local_860._24_4_;
    auVar38._24_4_ = fVar359 * fVar20;
    auVar38._28_4_ = auVar152._28_4_;
    auVar39._4_4_ = fVar380 * fVar221;
    auVar39._0_4_ = fVar371 * fVar199;
    auVar39._8_4_ = fVar381 * fVar251;
    auVar39._12_4_ = fVar382 * fVar229;
    auVar39._16_4_ = fVar383 * fVar259;
    auVar39._20_4_ = fVar384 * fVar310;
    uVar80 = local_8a0._28_4_;
    auVar39._24_4_ = fVar385 * fVar18;
    auVar39._28_4_ = uVar80;
    auVar152 = vsubps_avx(auVar39,auVar38);
    auVar40._4_4_ = fVar221 * fVar222;
    auVar40._0_4_ = fVar199 * fVar200;
    auVar40._8_4_ = fVar251 * fVar253;
    auVar40._12_4_ = fVar229 * fVar248;
    auVar40._16_4_ = fVar259 * fVar276;
    auVar40._20_4_ = fVar310 * fVar330;
    auVar40._24_4_ = fVar18 * fVar19;
    auVar40._28_4_ = uVar80;
    auVar41._4_4_ = fVar224 * fVar220;
    auVar41._0_4_ = fVar201 * fVar198;
    auVar41._8_4_ = fVar255 * fVar249;
    auVar41._12_4_ = fVar250 * fVar227;
    auVar41._16_4_ = fVar279 * fVar258;
    auVar41._20_4_ = fVar360 * fVar291;
    auVar41._24_4_ = fVar20 * fVar17;
    auVar41._28_4_ = auVar388._28_4_;
    auVar25 = vsubps_avx(auVar41,auVar40);
    auVar42._4_4_ =
         (auVar379._4_4_ * auVar379._4_4_ +
         auVar13._4_4_ * auVar13._4_4_ + auVar14._4_4_ * auVar14._4_4_) * fVar252;
    auVar42._0_4_ =
         (auVar379._0_4_ * auVar379._0_4_ +
         auVar13._0_4_ * auVar13._0_4_ + auVar14._0_4_ * auVar14._0_4_) * fVar225;
    auVar42._8_4_ =
         (auVar379._8_4_ * auVar379._8_4_ +
         auVar13._8_4_ * auVar13._8_4_ + auVar14._8_4_ * auVar14._8_4_) * fVar254;
    auVar42._12_4_ =
         (auVar379._12_4_ * auVar379._12_4_ +
         auVar13._12_4_ * auVar13._12_4_ + auVar14._12_4_ * auVar14._12_4_) * fVar256;
    auVar42._16_4_ =
         (auVar379._16_4_ * auVar379._16_4_ +
         auVar13._16_4_ * auVar13._16_4_ + auVar14._16_4_ * auVar14._16_4_) * fVar282;
    auVar42._20_4_ =
         (auVar379._20_4_ * auVar379._20_4_ +
         auVar13._20_4_ * auVar13._20_4_ + auVar14._20_4_ * auVar14._20_4_) * fVar285;
    auVar42._24_4_ =
         (auVar379._24_4_ * auVar379._24_4_ +
         auVar13._24_4_ * auVar13._24_4_ + auVar14._24_4_ * auVar14._24_4_) * fVar288;
    auVar42._28_4_ = auVar379._28_4_ + auVar13._28_4_ + fVar197;
    auVar43._4_4_ =
         (auVar351._4_4_ * auVar351._4_4_ +
         auVar152._4_4_ * auVar152._4_4_ + auVar25._4_4_ * auVar25._4_4_) * fVar252;
    auVar43._0_4_ =
         (auVar351._0_4_ * auVar351._0_4_ +
         auVar152._0_4_ * auVar152._0_4_ + auVar25._0_4_ * auVar25._0_4_) * fVar225;
    auVar43._8_4_ =
         (auVar351._8_4_ * auVar351._8_4_ +
         auVar152._8_4_ * auVar152._8_4_ + auVar25._8_4_ * auVar25._8_4_) * fVar254;
    auVar43._12_4_ =
         (auVar351._12_4_ * auVar351._12_4_ +
         auVar152._12_4_ * auVar152._12_4_ + auVar25._12_4_ * auVar25._12_4_) * fVar256;
    auVar43._16_4_ =
         (auVar351._16_4_ * auVar351._16_4_ +
         auVar152._16_4_ * auVar152._16_4_ + auVar25._16_4_ * auVar25._16_4_) * fVar282;
    auVar43._20_4_ =
         (auVar351._20_4_ * auVar351._20_4_ +
         auVar152._20_4_ * auVar152._20_4_ + auVar25._20_4_ * auVar25._20_4_) * fVar285;
    auVar43._24_4_ =
         (auVar351._24_4_ * auVar351._24_4_ +
         auVar152._24_4_ * auVar152._24_4_ + auVar25._24_4_ * auVar25._24_4_) * fVar288;
    auVar43._28_4_ = auVar352._28_4_ + auVar98._28_4_;
    auVar98 = vmaxps_avx(auVar42,auVar43);
    auVar152 = vperm2f128_avx(local_700,local_700,1);
    auVar152 = vshufps_avx(auVar152,local_700,0x30);
    auVar379 = vshufps_avx(local_700,auVar152,0x29);
    auVar103._0_4_ = (float)local_700._0_4_ + fVar203;
    auVar103._4_4_ = local_700._4_4_ + fVar226;
    auVar103._8_4_ = local_700._8_4_ + fVar247;
    auVar103._12_4_ = local_700._12_4_ + fVar223;
    auVar103._16_4_ = local_700._16_4_ + fVar202;
    auVar103._20_4_ = local_700._20_4_ + fVar219;
    auVar103._24_4_ = local_700._24_4_ + fVar228;
    auVar103._28_4_ = local_700._28_4_ + fVar257;
    auVar152 = vmaxps_avx(local_700,auVar103);
    auVar351 = vmaxps_avx(auVar166,auVar379);
    auVar152 = vmaxps_avx(auVar152,auVar351);
    auVar351 = vrsqrtps_avx(auVar165);
    fVar197 = auVar351._0_4_;
    fVar202 = auVar351._4_4_;
    fVar203 = auVar351._8_4_;
    fVar219 = auVar351._12_4_;
    fVar226 = auVar351._16_4_;
    fVar228 = auVar351._20_4_;
    fVar247 = auVar351._24_4_;
    local_360 = fVar197 * 1.5 + fVar197 * fVar197 * fVar197 * auVar165._0_4_ * -0.5;
    fStack_35c = fVar202 * 1.5 + fVar202 * fVar202 * fVar202 * auVar165._4_4_ * -0.5;
    fStack_358 = fVar203 * 1.5 + fVar203 * fVar203 * fVar203 * auVar165._8_4_ * -0.5;
    fStack_354 = fVar219 * 1.5 + fVar219 * fVar219 * fVar219 * auVar165._12_4_ * -0.5;
    fStack_350 = fVar226 * 1.5 + fVar226 * fVar226 * fVar226 * auVar165._16_4_ * -0.5;
    fStack_34c = fVar228 * 1.5 + fVar228 * fVar228 * fVar228 * auVar165._20_4_ * -0.5;
    fStack_348 = fVar247 * 1.5 + fVar247 * fVar247 * fVar247 * auVar165._24_4_ * -0.5;
    auVar13 = vsubps_avx(ZEXT832(0) << 0x20,auVar388);
    auVar14 = vsubps_avx(ZEXT832(0) << 0x20,local_500);
    fVar202 = auVar14._0_4_;
    fVar226 = auVar14._4_4_;
    fVar257 = auVar14._8_4_;
    fVar252 = auVar14._12_4_;
    fVar282 = auVar14._16_4_;
    fVar370 = auVar14._20_4_;
    fVar21 = auVar14._24_4_;
    fVar203 = auVar13._0_4_;
    fVar228 = auVar13._4_4_;
    fVar223 = auVar13._8_4_;
    fVar254 = auVar13._12_4_;
    fVar285 = auVar13._16_4_;
    fVar386 = auVar13._20_4_;
    fVar22 = auVar13._24_4_;
    auVar352 = vsubps_avx(ZEXT832(0) << 0x20,auVar374);
    fVar219 = auVar352._0_4_;
    fVar247 = auVar352._4_4_;
    fVar225 = auVar352._8_4_;
    fVar256 = auVar352._12_4_;
    fVar288 = auVar352._16_4_;
    fVar16 = auVar352._20_4_;
    fVar23 = auVar352._24_4_;
    auVar376._0_4_ =
         (float)local_760._0_4_ * fVar219 +
         (float)local_8c0._0_4_ * fVar203 + (float)local_720._0_4_ * fVar202;
    auVar376._4_4_ =
         (float)local_760._4_4_ * fVar247 +
         (float)local_8c0._4_4_ * fVar228 + (float)local_720._4_4_ * fVar226;
    auVar376._8_4_ = fStack_758 * fVar225 + fStack_8b8 * fVar223 + fStack_718 * fVar257;
    auVar376._12_4_ = fStack_754 * fVar256 + fStack_8b4 * fVar254 + fStack_714 * fVar252;
    auVar376._16_4_ = fStack_750 * fVar288 + fStack_8b0 * fVar285 + fStack_710 * fVar282;
    auVar376._20_4_ = fStack_74c * fVar16 + fStack_8ac * fVar386 + fStack_70c * fVar370;
    auVar376._24_4_ = fStack_748 * fVar23 + fStack_8a8 * fVar22 + fStack_708 * fVar21;
    auVar376._28_4_ = auVar388._28_4_ + auVar25._28_4_ + 1.5;
    auVar389._0_4_ = fVar219 * fVar219 + fVar203 * fVar203 + fVar202 * fVar202;
    auVar389._4_4_ = fVar247 * fVar247 + fVar228 * fVar228 + fVar226 * fVar226;
    auVar389._8_4_ = fVar225 * fVar225 + fVar223 * fVar223 + fVar257 * fVar257;
    auVar389._12_4_ = fVar256 * fVar256 + fVar254 * fVar254 + fVar252 * fVar252;
    auVar389._16_4_ = fVar288 * fVar288 + fVar285 * fVar285 + fVar282 * fVar282;
    auVar389._20_4_ = fVar16 * fVar16 + fVar386 * fVar386 + fVar370 * fVar370;
    auVar389._24_4_ = fVar23 * fVar23 + fVar22 * fVar22 + fVar21 * fVar21;
    auVar389._28_4_ = local_500._28_4_ + local_500._28_4_ + auVar388._28_4_;
    local_480 = (float)local_760._0_4_ * fVar199 * local_360 +
                local_360 * fVar198 * (float)local_8c0._0_4_ +
                (float)local_720._0_4_ * fVar347 * local_360;
    fStack_47c = (float)local_760._4_4_ * fVar221 * fStack_35c +
                 fStack_35c * fVar220 * (float)local_8c0._4_4_ +
                 (float)local_720._4_4_ * fVar354 * fStack_35c;
    fStack_478 = fStack_758 * fVar251 * fStack_358 +
                 fStack_358 * fVar249 * fStack_8b8 + fStack_718 * fVar355 * fStack_358;
    fStack_474 = fStack_754 * fVar229 * fStack_354 +
                 fStack_354 * fVar227 * fStack_8b4 + fStack_714 * fVar356 * fStack_354;
    fStack_470 = fStack_750 * fVar259 * fStack_350 +
                 fStack_350 * fVar258 * fStack_8b0 + fStack_710 * fVar357 * fStack_350;
    fStack_46c = fStack_74c * fVar310 * fStack_34c +
                 fStack_34c * fVar291 * fStack_8ac + fStack_70c * fVar358 * fStack_34c;
    fStack_468 = fStack_748 * fVar18 * fStack_348 +
                 fStack_348 * fVar17 * fStack_8a8 + fStack_708 * fVar359 * fStack_348;
    fVar197 = fStack_744 + fStack_8a4 + 0.0;
    fVar295 = fVar219 * fVar199 * local_360 +
              local_360 * fVar198 * fVar203 + fVar347 * local_360 * fVar202;
    fVar306 = fVar247 * fVar221 * fStack_35c +
              fStack_35c * fVar220 * fVar228 + fVar354 * fStack_35c * fVar226;
    fVar308 = fVar225 * fVar251 * fStack_358 +
              fStack_358 * fVar249 * fVar223 + fVar355 * fStack_358 * fVar257;
    fVar312 = fVar256 * fVar229 * fStack_354 +
              fStack_354 * fVar227 * fVar254 + fVar356 * fStack_354 * fVar252;
    fVar315 = fVar288 * fVar259 * fStack_350 +
              fStack_350 * fVar258 * fVar285 + fVar357 * fStack_350 * fVar282;
    fVar318 = fVar16 * fVar310 * fStack_34c +
              fStack_34c * fVar291 * fVar386 + fVar358 * fStack_34c * fVar370;
    fVar321 = fVar23 * fVar18 * fStack_348 +
              fStack_348 * fVar17 * fVar22 + fVar359 * fStack_348 * fVar21;
    fVar323 = fStack_8a4 + fVar197;
    auVar44._4_4_ = fStack_47c * fVar306;
    auVar44._0_4_ = local_480 * fVar295;
    auVar44._8_4_ = fStack_478 * fVar308;
    auVar44._12_4_ = fStack_474 * fVar312;
    auVar44._16_4_ = fStack_470 * fVar315;
    auVar44._20_4_ = fStack_46c * fVar318;
    auVar44._24_4_ = fStack_468 * fVar321;
    auVar44._28_4_ = fVar197;
    auVar25 = vsubps_avx(auVar376,auVar44);
    auVar45._4_4_ = fVar306 * fVar306;
    auVar45._0_4_ = fVar295 * fVar295;
    auVar45._8_4_ = fVar308 * fVar308;
    auVar45._12_4_ = fVar312 * fVar312;
    auVar45._16_4_ = fVar315 * fVar315;
    auVar45._20_4_ = fVar318 * fVar318;
    auVar45._24_4_ = fVar321 * fVar321;
    auVar45._28_4_ = fStack_8a4;
    auVar99 = vsubps_avx(auVar389,auVar45);
    local_4e0 = vsqrtps_avx(auVar98);
    fVar197 = (local_4e0._0_4_ + auVar152._0_4_) * 1.0000002;
    fVar115 = (local_4e0._4_4_ + auVar152._4_4_) * 1.0000002;
    fVar117 = (local_4e0._8_4_ + auVar152._8_4_) * 1.0000002;
    fVar119 = (local_4e0._12_4_ + auVar152._12_4_) * 1.0000002;
    fVar120 = (local_4e0._16_4_ + auVar152._16_4_) * 1.0000002;
    fVar121 = (local_4e0._20_4_ + auVar152._20_4_) * 1.0000002;
    fVar122 = (local_4e0._24_4_ + auVar152._24_4_) * 1.0000002;
    auVar46._4_4_ = fVar115 * fVar115;
    auVar46._0_4_ = fVar197 * fVar197;
    auVar46._8_4_ = fVar117 * fVar117;
    auVar46._12_4_ = fVar119 * fVar119;
    auVar46._16_4_ = fVar120 * fVar120;
    auVar46._20_4_ = fVar121 * fVar121;
    auVar46._24_4_ = fVar122 * fVar122;
    auVar46._28_4_ = local_4e0._28_4_ + auVar152._28_4_;
    fVar337 = auVar25._0_4_ + auVar25._0_4_;
    fVar346 = auVar25._4_4_ + auVar25._4_4_;
    local_900._0_8_ = CONCAT44(fVar346,fVar337);
    local_900._8_4_ = auVar25._8_4_ + auVar25._8_4_;
    local_900._12_4_ = auVar25._12_4_ + auVar25._12_4_;
    local_900._16_4_ = auVar25._16_4_ + auVar25._16_4_;
    local_900._20_4_ = auVar25._20_4_ + auVar25._20_4_;
    local_900._24_4_ = auVar25._24_4_ + auVar25._24_4_;
    local_900._28_4_ = auVar25._28_4_ + auVar25._28_4_;
    auVar152 = vsubps_avx(auVar99,auVar46);
    local_380._4_4_ = fStack_47c * fStack_47c;
    local_380._0_4_ = local_480 * local_480;
    local_380._8_4_ = fStack_478 * fStack_478;
    local_380._12_4_ = fStack_474 * fStack_474;
    local_380._16_4_ = fStack_470 * fStack_470;
    local_380._20_4_ = fStack_46c * fStack_46c;
    local_380._24_4_ = fStack_468 * fStack_468;
    local_380._28_4_ = local_5a0._28_4_;
    auVar25 = vsubps_avx(local_2c0,local_380);
    local_580._4_4_ = fVar346 * fVar346;
    local_580._0_4_ = fVar337 * fVar337;
    fStack_578 = local_900._8_4_ * local_900._8_4_;
    fStack_574 = local_900._12_4_ * local_900._12_4_;
    fStack_570 = local_900._16_4_ * local_900._16_4_;
    fStack_56c = local_900._20_4_ * local_900._20_4_;
    fStack_568 = local_900._24_4_ * local_900._24_4_;
    unique0x100111c4 = 0x3f800002;
    fVar115 = auVar25._0_4_;
    fVar117 = auVar25._4_4_;
    fStack_8dc = fVar117 * 4.0;
    fVar119 = auVar25._8_4_;
    fStack_8d8 = fVar119 * 4.0;
    fVar120 = auVar25._12_4_;
    fStack_8d4 = fVar120 * 4.0;
    fVar121 = auVar25._16_4_;
    fStack_8d0 = fVar121 * 4.0;
    fVar122 = auVar25._20_4_;
    fStack_8cc = fVar122 * 4.0;
    fVar336 = auVar25._24_4_;
    fStack_8c8 = fVar336 * 4.0;
    uStack_8c4 = 0x40800000;
    auVar47._4_4_ = auVar152._4_4_ * fStack_8dc;
    auVar47._0_4_ = auVar152._0_4_ * fVar115 * 4.0;
    auVar47._8_4_ = auVar152._8_4_ * fStack_8d8;
    auVar47._12_4_ = auVar152._12_4_ * fStack_8d4;
    auVar47._16_4_ = auVar152._16_4_ * fStack_8d0;
    auVar47._20_4_ = auVar152._20_4_ * fStack_8cc;
    auVar47._24_4_ = auVar152._24_4_ * fStack_8c8;
    auVar47._28_4_ = 0x40800000;
    auVar100 = vsubps_avx(_local_580,auVar47);
    auVar98 = vcmpps_avx(auVar100,ZEXT832(0) << 0x20,5);
    auVar275 = ZEXT3264(auVar98);
    fVar197 = auVar25._28_4_;
    if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar98 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar98 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar98 >> 0x7f,0) == '\0') &&
          (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar98 >> 0xbf,0) == '\0') &&
        (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar98[0x1f]) {
      auVar104._8_4_ = 0x7f800000;
      auVar104._0_8_ = 0x7f8000007f800000;
      auVar104._12_4_ = 0x7f800000;
      auVar104._16_4_ = 0x7f800000;
      auVar104._20_4_ = 0x7f800000;
      auVar104._24_4_ = 0x7f800000;
      auVar104._28_4_ = 0x7f800000;
      auVar390._8_4_ = 0xff800000;
      auVar390._0_8_ = 0xff800000ff800000;
      auVar390._12_4_ = 0xff800000;
      auVar390._16_4_ = 0xff800000;
      auVar390._20_4_ = 0xff800000;
      auVar390._24_4_ = 0xff800000;
      auVar390._28_4_ = 0xff800000;
    }
    else {
      auVar140 = vcmpps_avx(auVar100,ZEXT832(0) << 0x20,5);
      auVar141 = vsqrtps_avx(auVar100);
      auVar269._0_4_ = fVar115 + fVar115;
      auVar269._4_4_ = fVar117 + fVar117;
      auVar269._8_4_ = fVar119 + fVar119;
      auVar269._12_4_ = fVar120 + fVar120;
      auVar269._16_4_ = fVar121 + fVar121;
      auVar269._20_4_ = fVar122 + fVar122;
      auVar269._24_4_ = fVar336 + fVar336;
      auVar269._28_4_ = fVar197 + fVar197;
      auVar100 = vrcpps_avx(auVar269);
      fVar261 = auVar100._0_4_;
      fVar278 = auVar100._4_4_;
      auVar48._4_4_ = auVar269._4_4_ * fVar278;
      auVar48._0_4_ = auVar269._0_4_ * fVar261;
      fVar281 = auVar100._8_4_;
      auVar48._8_4_ = auVar269._8_4_ * fVar281;
      fVar284 = auVar100._12_4_;
      auVar48._12_4_ = auVar269._12_4_ * fVar284;
      fVar287 = auVar100._16_4_;
      auVar48._16_4_ = auVar269._16_4_ * fVar287;
      fVar290 = auVar100._20_4_;
      auVar48._20_4_ = auVar269._20_4_ * fVar290;
      fVar293 = auVar100._24_4_;
      auVar48._24_4_ = auVar269._24_4_ * fVar293;
      auVar48._28_4_ = auVar269._28_4_;
      auVar328._8_4_ = 0x3f800000;
      auVar328._0_8_ = 0x3f8000003f800000;
      auVar328._12_4_ = 0x3f800000;
      auVar328._16_4_ = 0x3f800000;
      auVar328._20_4_ = 0x3f800000;
      auVar328._24_4_ = 0x3f800000;
      auVar328._28_4_ = 0x3f800000;
      auVar100 = vsubps_avx(auVar328,auVar48);
      fVar261 = fVar261 + fVar261 * auVar100._0_4_;
      fVar278 = fVar278 + fVar278 * auVar100._4_4_;
      fVar281 = fVar281 + fVar281 * auVar100._8_4_;
      fVar284 = fVar284 + fVar284 * auVar100._12_4_;
      fVar287 = fVar287 + fVar287 * auVar100._16_4_;
      fVar290 = fVar290 + fVar290 * auVar100._20_4_;
      fVar293 = fVar293 + fVar293 * auVar100._24_4_;
      auVar303._0_8_ = CONCAT44(fVar346,fVar337) ^ 0x8000000080000000;
      auVar303._8_4_ = -local_900._8_4_;
      auVar303._12_4_ = -local_900._12_4_;
      auVar303._16_4_ = -local_900._16_4_;
      auVar303._20_4_ = -local_900._20_4_;
      auVar303._24_4_ = -local_900._24_4_;
      auVar303._28_4_ = -local_900._28_4_;
      auVar100 = vsubps_avx(auVar303,auVar141);
      fVar337 = auVar100._0_4_ * fVar261;
      fVar346 = auVar100._4_4_ * fVar278;
      auVar49._4_4_ = fVar346;
      auVar49._0_4_ = fVar337;
      fVar309 = auVar100._8_4_ * fVar281;
      auVar49._8_4_ = fVar309;
      fVar313 = auVar100._12_4_ * fVar284;
      auVar49._12_4_ = fVar313;
      fVar316 = auVar100._16_4_ * fVar287;
      auVar49._16_4_ = fVar316;
      fVar319 = auVar100._20_4_ * fVar290;
      auVar49._20_4_ = fVar319;
      fVar322 = auVar100._24_4_ * fVar293;
      auVar49._24_4_ = fVar322;
      auVar49._28_4_ = auVar100._28_4_;
      auVar100 = vsubps_avx(auVar141,local_900);
      fVar261 = auVar100._0_4_ * fVar261;
      fVar278 = auVar100._4_4_ * fVar278;
      auVar50._4_4_ = fVar278;
      auVar50._0_4_ = fVar261;
      fVar281 = auVar100._8_4_ * fVar281;
      auVar50._8_4_ = fVar281;
      fVar284 = auVar100._12_4_ * fVar284;
      auVar50._12_4_ = fVar284;
      fVar287 = auVar100._16_4_ * fVar287;
      auVar50._16_4_ = fVar287;
      fVar290 = auVar100._20_4_ * fVar290;
      auVar50._20_4_ = fVar290;
      fVar293 = auVar100._24_4_ * fVar293;
      auVar50._24_4_ = fVar293;
      auVar50._28_4_ = auVar100._28_4_;
      local_560 = local_360 * (fVar295 + local_480 * fVar337);
      fStack_55c = fStack_35c * (fVar306 + fStack_47c * fVar346);
      fStack_558 = fStack_358 * (fVar308 + fStack_478 * fVar309);
      fStack_554 = fStack_354 * (fVar312 + fStack_474 * fVar313);
      fStack_550 = fStack_350 * (fVar315 + fStack_470 * fVar316);
      fStack_54c = fStack_34c * (fVar318 + fStack_46c * fVar319);
      fStack_548 = fStack_348 * (fVar321 + fStack_468 * fVar322);
      fStack_544 = local_900._28_4_;
      auVar341._8_4_ = 0x7fffffff;
      auVar341._0_8_ = 0x7fffffff7fffffff;
      auVar341._12_4_ = 0x7fffffff;
      auVar341._16_4_ = 0x7fffffff;
      auVar341._20_4_ = 0x7fffffff;
      auVar341._24_4_ = 0x7fffffff;
      auVar341._28_4_ = 0x7fffffff;
      auVar100 = vandps_avx(local_380,auVar341);
      auVar100 = vmaxps_avx(local_460,auVar100);
      auVar51._4_4_ = auVar100._4_4_ * 1.9073486e-06;
      auVar51._0_4_ = auVar100._0_4_ * 1.9073486e-06;
      auVar51._8_4_ = auVar100._8_4_ * 1.9073486e-06;
      auVar51._12_4_ = auVar100._12_4_ * 1.9073486e-06;
      auVar51._16_4_ = auVar100._16_4_ * 1.9073486e-06;
      auVar51._20_4_ = auVar100._20_4_ * 1.9073486e-06;
      auVar51._24_4_ = auVar100._24_4_ * 1.9073486e-06;
      auVar51._28_4_ = auVar100._28_4_;
      auVar100 = vandps_avx(auVar25,auVar341);
      auVar100 = vcmpps_avx(auVar100,auVar51,1);
      auVar342._8_4_ = 0x7f800000;
      auVar342._0_8_ = 0x7f8000007f800000;
      auVar342._12_4_ = 0x7f800000;
      auVar342._16_4_ = 0x7f800000;
      auVar342._20_4_ = 0x7f800000;
      auVar342._24_4_ = 0x7f800000;
      auVar342._28_4_ = 0x7f800000;
      auVar104 = vblendvps_avx(auVar342,auVar49,auVar140);
      local_5c0 = auVar104;
      local_5e0._4_4_ = fStack_35c * (fVar306 + fStack_47c * fVar278);
      local_5e0._0_4_ = local_360 * (fVar295 + local_480 * fVar261);
      fStack_5d8 = fStack_358 * (fVar308 + fStack_478 * fVar281);
      fStack_5d4 = fStack_354 * (fVar312 + fStack_474 * fVar284);
      fStack_5d0 = fStack_350 * (fVar315 + fStack_470 * fVar287);
      fStack_5cc = fStack_34c * (fVar318 + fStack_46c * fVar290);
      fStack_5c8 = fStack_348 * (fVar321 + fStack_468 * fVar293);
      uStack_5c4 = auVar104._28_4_;
      auVar270._8_4_ = 0xff800000;
      auVar270._0_8_ = 0xff800000ff800000;
      auVar270._12_4_ = 0xff800000;
      auVar270._16_4_ = 0xff800000;
      auVar270._20_4_ = 0xff800000;
      auVar270._24_4_ = 0xff800000;
      auVar270._28_4_ = 0xff800000;
      auVar390 = vblendvps_avx(auVar270,auVar50,auVar140);
      auVar141 = auVar140 & auVar100;
      if ((((((((auVar141 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar141 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar141 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar141 >> 0x7f,0) == '\0') &&
            (auVar141 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar141 >> 0xbf,0) == '\0') &&
          (auVar141 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar141[0x1f]) {
        auVar275 = ZEXT3264(auVar98);
      }
      else {
        auVar98 = vandps_avx(auVar100,auVar140);
        auVar232 = vpackssdw_avx(auVar98._0_16_,auVar98._16_16_);
        auVar100 = vcmpps_avx(auVar152,ZEXT832(0) << 0x20,2);
        auVar395._8_4_ = 0xff800000;
        auVar395._0_8_ = 0xff800000ff800000;
        auVar395._12_4_ = 0xff800000;
        auVar395._16_4_ = 0xff800000;
        auVar395._20_4_ = 0xff800000;
        auVar395._24_4_ = 0xff800000;
        auVar395._28_4_ = 0xff800000;
        auVar378._8_4_ = 0x7f800000;
        auVar378._0_8_ = 0x7f8000007f800000;
        auVar378._12_4_ = 0x7f800000;
        auVar378._16_4_ = 0x7f800000;
        auVar378._20_4_ = 0x7f800000;
        auVar378._24_4_ = 0x7f800000;
        auVar378._28_4_ = 0x7f800000;
        auVar152 = vblendvps_avx(auVar378,auVar395,auVar100);
        auVar127 = vpmovsxwd_avx(auVar232);
        auVar232 = vpunpckhwd_avx(auVar232,auVar232);
        auVar246._16_16_ = auVar232;
        auVar246._0_16_ = auVar127;
        auVar104 = vblendvps_avx(auVar104,auVar152,auVar246);
        auVar152 = vblendvps_avx(auVar395,auVar378,auVar100);
        auVar390 = vblendvps_avx(auVar390,auVar152,auVar246);
        auVar152 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar111._0_4_ = auVar98._0_4_ ^ auVar152._0_4_;
        auVar111._4_4_ = auVar98._4_4_ ^ auVar152._4_4_;
        auVar111._8_4_ = auVar98._8_4_ ^ auVar152._8_4_;
        auVar111._12_4_ = auVar98._12_4_ ^ auVar152._12_4_;
        auVar111._16_4_ = auVar98._16_4_ ^ auVar152._16_4_;
        auVar111._20_4_ = auVar98._20_4_ ^ auVar152._20_4_;
        auVar111._24_4_ = auVar98._24_4_ ^ auVar152._24_4_;
        auVar111._28_4_ = auVar98._28_4_ ^ auVar152._28_4_;
        auVar98 = vorps_avx(auVar100,auVar111);
        auVar98 = vandps_avx(auVar140,auVar98);
        auVar275 = ZEXT3264(auVar98);
      }
    }
    auVar98 = local_420 & auVar275._0_32_;
    if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar98 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar98 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar98 >> 0x7f,0) == '\0') &&
          (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar98 >> 0xbf,0) == '\0') &&
        (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar98[0x1f]) {
LAB_00fe7a95:
      auVar397 = ZEXT3264(local_9c0);
      auVar363 = ZEXT3264(local_9a0);
      auVar353 = ZEXT3264(local_980);
      auVar275 = ZEXT3264(local_a00);
      auVar329 = ZEXT3264(local_a20);
    }
    else {
      fStack_464 = fStack_744 + fStack_8a4 + 0.0;
      fStack_344 = auVar351._28_4_ + auVar165._28_4_;
      auVar127 = ZEXT416((uint)*(float *)(ray + k * 4 + 0x80));
      local_5c0._0_16_ = auVar127;
      auVar232 = ZEXT416((uint)(*(float *)(ray + k * 4 + 0x80) - (float)local_7f0._0_4_));
      auVar232 = vshufps_avx(auVar232,auVar232,0);
      auVar241._16_16_ = auVar232;
      auVar241._0_16_ = auVar232;
      auVar100 = vminps_avx(auVar241,auVar390);
      fVar290 = auVar14._28_4_;
      auVar145._0_4_ =
           (float)local_760._0_4_ * fVar260 +
           fVar294 * (float)local_8c0._0_4_ + (float)local_720._0_4_ * fVar361;
      auVar145._4_4_ =
           (float)local_760._4_4_ * fVar277 +
           fVar305 * (float)local_8c0._4_4_ + (float)local_720._4_4_ * fVar364;
      auVar145._8_4_ = fStack_758 * fVar280 + fVar307 * fStack_8b8 + fStack_718 * fVar365;
      auVar145._12_4_ = fStack_754 * fVar283 + fVar311 * fStack_8b4 + fStack_714 * fVar366;
      auVar145._16_4_ = fStack_750 * fVar286 + fVar314 * fStack_8b0 + fStack_710 * fVar367;
      auVar145._20_4_ = fStack_74c * fVar289 + fVar317 * fStack_8ac + fStack_70c * fVar368;
      auVar145._24_4_ = fStack_748 * fVar292 + fVar320 * fStack_8a8 + fStack_708 * fVar369;
      auVar145._28_4_ = fVar290 + auVar302._28_4_ + fVar290;
      auVar98 = vrcpps_avx(auVar145);
      fVar337 = auVar98._0_4_;
      fVar346 = auVar98._4_4_;
      auVar52._4_4_ = auVar145._4_4_ * fVar346;
      auVar52._0_4_ = auVar145._0_4_ * fVar337;
      fVar261 = auVar98._8_4_;
      auVar52._8_4_ = auVar145._8_4_ * fVar261;
      fVar278 = auVar98._12_4_;
      auVar52._12_4_ = auVar145._12_4_ * fVar278;
      fVar281 = auVar98._16_4_;
      auVar52._16_4_ = auVar145._16_4_ * fVar281;
      fVar284 = auVar98._20_4_;
      auVar52._20_4_ = auVar145._20_4_ * fVar284;
      fVar287 = auVar98._24_4_;
      auVar52._24_4_ = auVar145._24_4_ * fVar287;
      auVar52._28_4_ = auVar352._28_4_;
      auVar343._8_4_ = 0x3f800000;
      auVar343._0_8_ = 0x3f8000003f800000;
      auVar343._12_4_ = 0x3f800000;
      auVar343._16_4_ = 0x3f800000;
      auVar343._20_4_ = 0x3f800000;
      auVar343._24_4_ = 0x3f800000;
      auVar343._28_4_ = 0x3f800000;
      auVar351 = vsubps_avx(auVar343,auVar52);
      auVar304._8_4_ = 0x7fffffff;
      auVar304._0_8_ = 0x7fffffff7fffffff;
      auVar304._12_4_ = 0x7fffffff;
      auVar304._16_4_ = 0x7fffffff;
      auVar304._20_4_ = 0x7fffffff;
      auVar304._24_4_ = 0x7fffffff;
      auVar304._28_4_ = 0x7fffffff;
      auVar98 = vandps_avx(auVar145,auVar304);
      auVar335._8_4_ = 0x219392ef;
      auVar335._0_8_ = 0x219392ef219392ef;
      auVar335._12_4_ = 0x219392ef;
      auVar335._16_4_ = 0x219392ef;
      auVar335._20_4_ = 0x219392ef;
      auVar335._24_4_ = 0x219392ef;
      auVar335._28_4_ = 0x219392ef;
      auVar152 = vcmpps_avx(auVar98,auVar335,1);
      auVar53._4_4_ =
           (fVar346 + fVar346 * auVar351._4_4_) *
           -(fVar247 * fVar277 + fVar228 * fVar305 + fVar226 * fVar364);
      auVar53._0_4_ =
           (fVar337 + fVar337 * auVar351._0_4_) *
           -(fVar219 * fVar260 + fVar203 * fVar294 + fVar202 * fVar361);
      auVar53._8_4_ =
           (fVar261 + fVar261 * auVar351._8_4_) *
           -(fVar225 * fVar280 + fVar223 * fVar307 + fVar257 * fVar365);
      auVar53._12_4_ =
           (fVar278 + fVar278 * auVar351._12_4_) *
           -(fVar256 * fVar283 + fVar254 * fVar311 + fVar252 * fVar366);
      auVar53._16_4_ =
           (fVar281 + fVar281 * auVar351._16_4_) *
           -(fVar288 * fVar286 + fVar285 * fVar314 + fVar282 * fVar367);
      auVar53._20_4_ =
           (fVar284 + fVar284 * auVar351._20_4_) *
           -(fVar16 * fVar289 + fVar386 * fVar317 + fVar370 * fVar368);
      auVar53._24_4_ =
           (fVar287 + fVar287 * auVar351._24_4_) *
           -(fVar23 * fVar292 + fVar22 * fVar320 + fVar21 * fVar369);
      auVar53._28_4_ = -(fVar290 + auVar13._28_4_ + fVar290);
      auVar351 = ZEXT1232(ZEXT412(0)) << 0x20;
      auVar98 = vcmpps_avx(auVar145,auVar351,1);
      auVar98 = vorps_avx(auVar152,auVar98);
      auVar391._8_4_ = 0xff800000;
      auVar391._0_8_ = 0xff800000ff800000;
      auVar391._12_4_ = 0xff800000;
      auVar391._16_4_ = 0xff800000;
      auVar391._20_4_ = 0xff800000;
      auVar391._24_4_ = 0xff800000;
      auVar391._28_4_ = 0xff800000;
      auVar98 = vblendvps_avx(auVar53,auVar391,auVar98);
      auVar351 = vcmpps_avx(auVar145,auVar351,6);
      auVar152 = vorps_avx(auVar152,auVar351);
      auVar394._8_4_ = 0x7f800000;
      auVar394._0_8_ = 0x7f8000007f800000;
      auVar394._12_4_ = 0x7f800000;
      auVar394._16_4_ = 0x7f800000;
      auVar394._20_4_ = 0x7f800000;
      auVar394._24_4_ = 0x7f800000;
      auVar394._28_4_ = 0x7f800000;
      auVar152 = vblendvps_avx(auVar53,auVar394,auVar152);
      auVar351 = vmaxps_avx(local_320,auVar104);
      auVar351 = vmaxps_avx(auVar351,auVar98);
      auVar13 = vminps_avx(auVar100,auVar152);
      auVar352 = ZEXT1232(ZEXT412(0)) << 0x20;
      auVar98 = vsubps_avx(auVar352,auVar11);
      auVar152 = vsubps_avx(auVar352,local_a40);
      auVar54._4_4_ = auVar152._4_4_ * -fVar380;
      auVar54._0_4_ = auVar152._0_4_ * -fVar371;
      auVar54._8_4_ = auVar152._8_4_ * -fVar381;
      auVar54._12_4_ = auVar152._12_4_ * -fVar382;
      auVar54._16_4_ = auVar152._16_4_ * -fVar383;
      auVar54._20_4_ = auVar152._20_4_ * -fVar384;
      auVar54._24_4_ = auVar152._24_4_ * -fVar385;
      auVar54._28_4_ = auVar152._28_4_;
      auVar55._4_4_ = fVar222 * auVar98._4_4_;
      auVar55._0_4_ = fVar200 * auVar98._0_4_;
      auVar55._8_4_ = fVar253 * auVar98._8_4_;
      auVar55._12_4_ = fVar248 * auVar98._12_4_;
      auVar55._16_4_ = fVar276 * auVar98._16_4_;
      auVar55._20_4_ = fVar330 * auVar98._20_4_;
      auVar55._24_4_ = fVar19 * auVar98._24_4_;
      auVar55._28_4_ = auVar98._28_4_;
      auVar98 = vsubps_avx(auVar54,auVar55);
      auVar152 = vsubps_avx(auVar352,auVar12);
      auVar56._4_4_ = fVar224 * auVar152._4_4_;
      auVar56._0_4_ = fVar201 * auVar152._0_4_;
      auVar56._8_4_ = fVar255 * auVar152._8_4_;
      auVar56._12_4_ = fVar250 * auVar152._12_4_;
      auVar56._16_4_ = fVar279 * auVar152._16_4_;
      auVar56._20_4_ = fVar360 * auVar152._20_4_;
      uVar1 = auVar152._28_4_;
      auVar56._24_4_ = fVar20 * auVar152._24_4_;
      auVar56._28_4_ = uVar1;
      auVar11 = vsubps_avx(auVar98,auVar56);
      auVar57._4_4_ = (float)local_720._4_4_ * -fVar380;
      auVar57._0_4_ = (float)local_720._0_4_ * -fVar371;
      auVar57._8_4_ = fStack_718 * -fVar381;
      auVar57._12_4_ = fStack_714 * -fVar382;
      auVar57._16_4_ = fStack_710 * -fVar383;
      auVar57._20_4_ = fStack_70c * -fVar384;
      auVar57._24_4_ = fStack_708 * -fVar385;
      auVar57._28_4_ = uVar80 ^ 0x80000000;
      auVar377._8_4_ = 0x3f800000;
      auVar377._0_8_ = 0x3f8000003f800000;
      auVar377._12_4_ = 0x3f800000;
      auVar377._16_4_ = 0x3f800000;
      auVar377._20_4_ = 0x3f800000;
      auVar377._24_4_ = 0x3f800000;
      auVar377._28_4_ = 0x3f800000;
      auVar58._4_4_ = fVar222 * (float)local_8c0._4_4_;
      auVar58._0_4_ = fVar200 * (float)local_8c0._0_4_;
      auVar58._8_4_ = fVar253 * fStack_8b8;
      auVar58._12_4_ = fVar248 * fStack_8b4;
      auVar58._16_4_ = fVar276 * fStack_8b0;
      auVar58._20_4_ = fVar330 * fStack_8ac;
      auVar58._24_4_ = fVar19 * fStack_8a8;
      auVar58._28_4_ = uVar1;
      auVar98 = vsubps_avx(auVar57,auVar58);
      auVar59._4_4_ = (float)local_760._4_4_ * fVar224;
      auVar59._0_4_ = (float)local_760._0_4_ * fVar201;
      auVar59._8_4_ = fStack_758 * fVar255;
      auVar59._12_4_ = fStack_754 * fVar250;
      auVar59._16_4_ = fStack_750 * fVar279;
      auVar59._20_4_ = fStack_74c * fVar360;
      auVar59._24_4_ = fStack_748 * fVar20;
      auVar59._28_4_ = uVar1;
      auVar12 = vsubps_avx(auVar98,auVar59);
      auVar98 = vrcpps_avx(auVar12);
      fVar200 = auVar98._0_4_;
      fVar201 = auVar98._4_4_;
      auVar60._4_4_ = auVar12._4_4_ * fVar201;
      auVar60._0_4_ = auVar12._0_4_ * fVar200;
      fVar202 = auVar98._8_4_;
      auVar60._8_4_ = auVar12._8_4_ * fVar202;
      fVar203 = auVar98._12_4_;
      auVar60._12_4_ = auVar12._12_4_ * fVar203;
      fVar219 = auVar98._16_4_;
      auVar60._16_4_ = auVar12._16_4_ * fVar219;
      fVar222 = auVar98._20_4_;
      auVar60._20_4_ = auVar12._20_4_ * fVar222;
      fVar224 = auVar98._24_4_;
      auVar60._24_4_ = auVar12._24_4_ * fVar224;
      auVar60._28_4_ = fStack_744;
      auVar14 = vsubps_avx(auVar377,auVar60);
      auVar98 = vandps_avx(auVar12,auVar304);
      auVar152 = vcmpps_avx(auVar98,auVar335,1);
      auVar61._4_4_ = (fVar201 + fVar201 * auVar14._4_4_) * -auVar11._4_4_;
      auVar61._0_4_ = (fVar200 + fVar200 * auVar14._0_4_) * -auVar11._0_4_;
      auVar61._8_4_ = (fVar202 + fVar202 * auVar14._8_4_) * -auVar11._8_4_;
      auVar61._12_4_ = (fVar203 + fVar203 * auVar14._12_4_) * -auVar11._12_4_;
      auVar61._16_4_ = (fVar219 + fVar219 * auVar14._16_4_) * -auVar11._16_4_;
      auVar61._20_4_ = (fVar222 + fVar222 * auVar14._20_4_) * -auVar11._20_4_;
      auVar61._24_4_ = (fVar224 + fVar224 * auVar14._24_4_) * -auVar11._24_4_;
      auVar61._28_4_ = auVar11._28_4_ ^ 0x80000000;
      auVar98 = vcmpps_avx(auVar12,auVar352,1);
      auVar98 = vorps_avx(auVar152,auVar98);
      auVar98 = vblendvps_avx(auVar61,auVar391,auVar98);
      _local_9e0 = vmaxps_avx(auVar351,auVar98);
      auVar98 = vcmpps_avx(auVar12,ZEXT832(0) << 0x20,6);
      auVar98 = vorps_avx(auVar152,auVar98);
      auVar152 = vblendvps_avx(auVar61,auVar394,auVar98);
      auVar98 = vandps_avx(auVar275._0_32_,local_420);
      local_3a0 = vminps_avx(auVar13,auVar152);
      auVar152 = vcmpps_avx(_local_9e0,local_3a0,2);
      auVar351 = auVar98 & auVar152;
      if ((((((((auVar351 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar351 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar351 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar351 >> 0x7f,0) == '\0') &&
            (auVar351 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar351 >> 0xbf,0) == '\0') &&
          (auVar351 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar351[0x1f]) goto LAB_00fe7a95;
      auVar351 = vminps_avx(local_700,auVar103);
      auVar11 = vminps_avx(auVar166,auVar379);
      auVar351 = vminps_avx(auVar351,auVar11);
      auVar351 = vsubps_avx(auVar351,local_4e0);
      auVar98 = vandps_avx(auVar152,auVar98);
      auVar75._4_4_ = fStack_55c;
      auVar75._0_4_ = local_560;
      auVar75._8_4_ = fStack_558;
      auVar75._12_4_ = fStack_554;
      auVar75._16_4_ = fStack_550;
      auVar75._20_4_ = fStack_54c;
      auVar75._24_4_ = fStack_548;
      auVar75._28_4_ = fStack_544;
      auVar152 = vminps_avx(auVar75,auVar377);
      auVar152 = vmaxps_avx(auVar152,ZEXT832(0) << 0x20);
      local_1a0[0] = fVar86 + fVar123 * (auVar152._0_4_ + 0.0) * 0.125;
      local_1a0[1] = fVar114 + fVar154 * (auVar152._4_4_ + 1.0) * 0.125;
      local_1a0[2] = fVar116 + fVar155 * (auVar152._8_4_ + 2.0) * 0.125;
      local_1a0[3] = fVar118 + fVar156 * (auVar152._12_4_ + 3.0) * 0.125;
      fStack_190 = fVar86 + fVar123 * (auVar152._16_4_ + 4.0) * 0.125;
      fStack_18c = fVar114 + fVar154 * (auVar152._20_4_ + 5.0) * 0.125;
      fStack_188 = fVar116 + fVar155 * (auVar152._24_4_ + 6.0) * 0.125;
      fStack_184 = fVar118 + auVar152._28_4_ + 7.0;
      auVar152 = vminps_avx(_local_5e0,auVar377);
      auVar152 = vmaxps_avx(auVar152,ZEXT832(0) << 0x20);
      local_1c0[0] = fVar86 + fVar123 * (auVar152._0_4_ + 0.0) * 0.125;
      local_1c0[1] = fVar114 + fVar154 * (auVar152._4_4_ + 1.0) * 0.125;
      local_1c0[2] = fVar116 + fVar155 * (auVar152._8_4_ + 2.0) * 0.125;
      local_1c0[3] = fVar118 + fVar156 * (auVar152._12_4_ + 3.0) * 0.125;
      fStack_1b0 = fVar86 + fVar123 * (auVar152._16_4_ + 4.0) * 0.125;
      fStack_1ac = fVar114 + fVar154 * (auVar152._20_4_ + 5.0) * 0.125;
      fStack_1a8 = fVar116 + fVar155 * (auVar152._24_4_ + 6.0) * 0.125;
      fStack_1a4 = fVar118 + auVar152._28_4_ + 7.0;
      auVar62._4_4_ = auVar351._4_4_ * 0.99999976;
      auVar62._0_4_ = auVar351._0_4_ * 0.99999976;
      auVar62._8_4_ = auVar351._8_4_ * 0.99999976;
      auVar62._12_4_ = auVar351._12_4_ * 0.99999976;
      auVar62._16_4_ = auVar351._16_4_ * 0.99999976;
      auVar62._20_4_ = auVar351._20_4_ * 0.99999976;
      auVar62._24_4_ = auVar351._24_4_ * 0.99999976;
      auVar62._28_4_ = 0x3f7ffffc;
      auVar152 = vmaxps_avx(ZEXT832(0) << 0x20,auVar62);
      auVar63._4_4_ = auVar152._4_4_ * auVar152._4_4_;
      auVar63._0_4_ = auVar152._0_4_ * auVar152._0_4_;
      auVar63._8_4_ = auVar152._8_4_ * auVar152._8_4_;
      auVar63._12_4_ = auVar152._12_4_ * auVar152._12_4_;
      auVar63._16_4_ = auVar152._16_4_ * auVar152._16_4_;
      auVar63._20_4_ = auVar152._20_4_ * auVar152._20_4_;
      auVar63._24_4_ = auVar152._24_4_ * auVar152._24_4_;
      auVar63._28_4_ = auVar152._28_4_;
      local_840 = vsubps_avx(auVar99,auVar63);
      auVar64._4_4_ = local_840._4_4_ * fStack_8dc;
      auVar64._0_4_ = local_840._0_4_ * fVar115 * 4.0;
      auVar64._8_4_ = local_840._8_4_ * fStack_8d8;
      auVar64._12_4_ = local_840._12_4_ * fStack_8d4;
      auVar64._16_4_ = local_840._16_4_ * fStack_8d0;
      auVar64._20_4_ = local_840._20_4_ * fStack_8cc;
      auVar64._24_4_ = local_840._24_4_ * fStack_8c8;
      auVar64._28_4_ = auVar152._28_4_;
      auVar351 = vsubps_avx(_local_580,auVar64);
      auVar152 = vcmpps_avx(auVar351,ZEXT832(0) << 0x20,5);
      if ((((((((auVar152 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar152 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar152 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar152 >> 0x7f,0) == '\0') &&
            (auVar152 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar152 >> 0xbf,0) == '\0') &&
          (auVar152 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar152[0x1f]) {
        auVar166 = SUB6432(ZEXT864(0),0) << 0x20;
        _local_7a0 = ZEXT832(0) << 0x20;
        _local_580 = ZEXT832(0) << 0x20;
        auVar188 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar213 = ZEXT828(0) << 0x20;
        auVar242._8_4_ = 0x7f800000;
        auVar242._0_8_ = 0x7f8000007f800000;
        auVar242._12_4_ = 0x7f800000;
        auVar242._16_4_ = 0x7f800000;
        auVar242._20_4_ = 0x7f800000;
        auVar242._24_4_ = 0x7f800000;
        auVar242._28_4_ = 0x7f800000;
        auVar271._8_4_ = 0xff800000;
        auVar271._0_8_ = 0xff800000ff800000;
        auVar271._12_4_ = 0xff800000;
        auVar271._16_4_ = 0xff800000;
        auVar271._20_4_ = 0xff800000;
        auVar271._24_4_ = 0xff800000;
        auVar271._28_4_ = 0xff800000;
        local_840 = auVar27;
        _local_780 = _local_7a0;
      }
      else {
        auVar166 = vsqrtps_avx(auVar351);
        auVar194._0_4_ = fVar115 + fVar115;
        auVar194._4_4_ = fVar117 + fVar117;
        auVar194._8_4_ = fVar119 + fVar119;
        auVar194._12_4_ = fVar120 + fVar120;
        auVar194._16_4_ = fVar121 + fVar121;
        auVar194._20_4_ = fVar122 + fVar122;
        auVar194._24_4_ = fVar336 + fVar336;
        auVar194._28_4_ = fVar197 + fVar197;
        auVar11 = vrcpps_avx(auVar194);
        fVar197 = auVar11._0_4_;
        fVar200 = auVar11._4_4_;
        auVar65._4_4_ = auVar194._4_4_ * fVar200;
        auVar65._0_4_ = auVar194._0_4_ * fVar197;
        fVar201 = auVar11._8_4_;
        auVar65._8_4_ = auVar194._8_4_ * fVar201;
        fVar202 = auVar11._12_4_;
        auVar65._12_4_ = auVar194._12_4_ * fVar202;
        fVar203 = auVar11._16_4_;
        auVar65._16_4_ = auVar194._16_4_ * fVar203;
        fVar219 = auVar11._20_4_;
        auVar65._20_4_ = auVar194._20_4_ * fVar219;
        fVar222 = auVar11._24_4_;
        auVar65._24_4_ = auVar194._24_4_ * fVar222;
        auVar65._28_4_ = auVar194._28_4_;
        auVar12 = vsubps_avx(auVar377,auVar65);
        fVar197 = fVar197 + fVar197 * auVar12._0_4_;
        fVar200 = fVar200 + fVar200 * auVar12._4_4_;
        fVar201 = fVar201 + fVar201 * auVar12._8_4_;
        fVar202 = fVar202 + fVar202 * auVar12._12_4_;
        fVar203 = fVar203 + fVar203 * auVar12._16_4_;
        fVar219 = fVar219 + fVar219 * auVar12._20_4_;
        fVar222 = fVar222 + fVar222 * auVar12._24_4_;
        fVar224 = auVar11._28_4_ + auVar12._28_4_;
        auVar215._0_8_ = local_900._0_8_ ^ 0x8000000080000000;
        auVar215._8_4_ = -local_900._8_4_;
        auVar215._12_4_ = -local_900._12_4_;
        auVar215._16_4_ = -local_900._16_4_;
        auVar215._20_4_ = -local_900._20_4_;
        auVar215._24_4_ = -local_900._24_4_;
        auVar215._28_4_ = -local_900._28_4_;
        auVar11 = vsubps_avx(auVar215,auVar166);
        fVar226 = auVar11._0_4_ * fVar197;
        fVar228 = auVar11._4_4_ * fVar200;
        auVar66._4_4_ = fVar228;
        auVar66._0_4_ = fVar226;
        fVar247 = auVar11._8_4_ * fVar201;
        auVar66._8_4_ = fVar247;
        fVar253 = auVar11._12_4_ * fVar202;
        auVar66._12_4_ = fVar253;
        fVar255 = auVar11._16_4_ * fVar203;
        auVar66._16_4_ = fVar255;
        fVar257 = auVar11._20_4_ * fVar219;
        auVar66._20_4_ = fVar257;
        fVar223 = auVar11._24_4_ * fVar222;
        auVar66._24_4_ = fVar223;
        auVar66._28_4_ = 0x3f800000;
        auVar166 = vsubps_avx(auVar166,local_900);
        auVar329._0_4_ = auVar166._0_4_ * fVar197;
        auVar329._4_4_ = auVar166._4_4_ * fVar200;
        auVar329._8_4_ = auVar166._8_4_ * fVar201;
        auVar329._12_4_ = auVar166._12_4_ * fVar202;
        auVar329._16_4_ = auVar166._16_4_ * fVar203;
        auVar329._20_4_ = auVar166._20_4_ * fVar219;
        auVar329._28_36_ = auVar275._28_36_;
        auVar329._24_4_ = auVar166._24_4_ * fVar222;
        fVar197 = local_360 * (fVar226 * local_480 + fVar295);
        fVar200 = fStack_35c * (fVar228 * fStack_47c + fVar306);
        fVar201 = fStack_358 * (fVar247 * fStack_478 + fVar308);
        fVar202 = fStack_354 * (fVar253 * fStack_474 + fVar312);
        fVar203 = fStack_350 * (fVar255 * fStack_470 + fVar315);
        fVar219 = fStack_34c * (fVar257 * fStack_46c + fVar318);
        fVar222 = fStack_348 * (fVar223 * fStack_468 + fVar321);
        auVar167._0_4_ = auVar374._0_4_ + fVar199 * fVar197;
        auVar167._4_4_ = auVar374._4_4_ + fVar221 * fVar200;
        auVar167._8_4_ = auVar374._8_4_ + fVar251 * fVar201;
        auVar167._12_4_ = auVar374._12_4_ + fVar229 * fVar202;
        auVar167._16_4_ = auVar374._16_4_ + fVar259 * fVar203;
        auVar167._20_4_ = auVar374._20_4_ + fVar310 * fVar219;
        auVar167._24_4_ = auVar374._24_4_ + fVar18 * fVar222;
        auVar167._28_4_ = auVar374._28_4_ + auVar166._28_4_ + fVar323;
        auVar67._4_4_ = fVar228 * (float)local_760._4_4_;
        auVar67._0_4_ = fVar226 * (float)local_760._0_4_;
        auVar67._8_4_ = fVar247 * fStack_758;
        auVar67._12_4_ = fVar253 * fStack_754;
        auVar67._16_4_ = fVar255 * fStack_750;
        auVar67._20_4_ = fVar257 * fStack_74c;
        auVar67._24_4_ = fVar223 * fStack_748;
        auVar67._28_4_ = fVar224;
        auVar166 = vsubps_avx(auVar67,auVar167);
        auVar195._0_4_ = auVar388._0_4_ + fVar198 * fVar197;
        auVar195._4_4_ = auVar388._4_4_ + fVar220 * fVar200;
        auVar195._8_4_ = auVar388._8_4_ + fVar249 * fVar201;
        auVar195._12_4_ = auVar388._12_4_ + fVar227 * fVar202;
        auVar195._16_4_ = auVar388._16_4_ + fVar258 * fVar203;
        auVar195._20_4_ = auVar388._20_4_ + fVar291 * fVar219;
        auVar195._24_4_ = auVar388._24_4_ + fVar17 * fVar222;
        auVar195._28_4_ = auVar388._28_4_ + fVar224;
        auVar243._0_4_ = (float)local_8c0._0_4_ * fVar226;
        auVar243._4_4_ = (float)local_8c0._4_4_ * fVar228;
        auVar243._8_4_ = fStack_8b8 * fVar247;
        auVar243._12_4_ = fStack_8b4 * fVar253;
        auVar243._16_4_ = fStack_8b0 * fVar255;
        auVar243._20_4_ = fStack_8ac * fVar257;
        auVar243._24_4_ = fStack_8a8 * fVar223;
        auVar243._28_4_ = 0;
        _local_940 = vsubps_avx(auVar243,auVar195);
        auVar216._0_4_ = local_500._0_4_ + fVar347 * fVar197;
        auVar216._4_4_ = local_500._4_4_ + fVar354 * fVar200;
        auVar216._8_4_ = local_500._8_4_ + fVar355 * fVar201;
        auVar216._12_4_ = local_500._12_4_ + fVar356 * fVar202;
        auVar216._16_4_ = local_500._16_4_ + fVar357 * fVar203;
        auVar216._20_4_ = local_500._20_4_ + fVar358 * fVar219;
        auVar216._24_4_ = local_500._24_4_ + fVar359 * fVar222;
        auVar216._28_4_ = local_500._28_4_ + auVar11._28_4_;
        auVar68._4_4_ = (float)local_720._4_4_ * fVar228;
        auVar68._0_4_ = (float)local_720._0_4_ * fVar226;
        auVar68._8_4_ = fStack_718 * fVar247;
        auVar68._12_4_ = fStack_714 * fVar253;
        auVar68._16_4_ = fStack_710 * fVar255;
        auVar68._20_4_ = fStack_70c * fVar257;
        auVar68._24_4_ = fStack_708 * fVar223;
        auVar68._28_4_ = 0;
        auVar11 = vsubps_avx(auVar68,auVar216);
        auVar213 = auVar11._0_28_;
        fVar197 = local_360 * (auVar329._0_4_ * local_480 + fVar295);
        fVar200 = fStack_35c * (auVar329._4_4_ * fStack_47c + fVar306);
        fVar201 = fStack_358 * (auVar329._8_4_ * fStack_478 + fVar308);
        fVar202 = fStack_354 * (auVar329._12_4_ * fStack_474 + fVar312);
        fVar203 = fStack_350 * (auVar329._16_4_ * fStack_470 + fVar315);
        fVar219 = fStack_34c * (auVar329._20_4_ * fStack_46c + fVar318);
        fVar222 = fStack_348 * (auVar329._24_4_ * fStack_468 + fVar321);
        auVar272._0_4_ = auVar374._0_4_ + fVar199 * fVar197;
        auVar272._4_4_ = auVar374._4_4_ + fVar221 * fVar200;
        auVar272._8_4_ = auVar374._8_4_ + fVar251 * fVar201;
        auVar272._12_4_ = auVar374._12_4_ + fVar229 * fVar202;
        auVar272._16_4_ = auVar374._16_4_ + fVar259 * fVar203;
        auVar272._20_4_ = auVar374._20_4_ + fVar310 * fVar219;
        auVar272._24_4_ = auVar374._24_4_ + fVar18 * fVar222;
        auVar272._28_4_ = auVar374._28_4_ + (float)local_540._28_4_;
        auVar69._4_4_ = auVar329._4_4_ * (float)local_760._4_4_;
        auVar69._0_4_ = auVar329._0_4_ * (float)local_760._0_4_;
        auVar69._8_4_ = auVar329._8_4_ * fStack_758;
        auVar69._12_4_ = auVar329._12_4_ * fStack_754;
        auVar69._16_4_ = auVar329._16_4_ * fStack_750;
        auVar69._20_4_ = auVar329._20_4_ * fStack_74c;
        auVar69._24_4_ = auVar329._24_4_ * fStack_748;
        auVar69._28_4_ = fStack_744;
        _local_780 = vsubps_avx(auVar69,auVar272);
        auVar273._0_4_ = auVar388._0_4_ + fVar198 * fVar197;
        auVar273._4_4_ = auVar388._4_4_ + fVar220 * fVar200;
        auVar273._8_4_ = auVar388._8_4_ + fVar249 * fVar201;
        auVar273._12_4_ = auVar388._12_4_ + fVar227 * fVar202;
        auVar273._16_4_ = auVar388._16_4_ + fVar258 * fVar203;
        auVar273._20_4_ = auVar388._20_4_ + fVar291 * fVar219;
        auVar273._24_4_ = auVar388._24_4_ + fVar17 * fVar222;
        auVar273._28_4_ = auVar388._28_4_ + local_780._28_4_;
        auVar70._4_4_ = (float)local_8c0._4_4_ * auVar329._4_4_;
        auVar70._0_4_ = (float)local_8c0._0_4_ * auVar329._0_4_;
        auVar70._8_4_ = fStack_8b8 * auVar329._8_4_;
        auVar70._12_4_ = fStack_8b4 * auVar329._12_4_;
        auVar70._16_4_ = fStack_8b0 * auVar329._16_4_;
        auVar70._20_4_ = fStack_8ac * auVar329._20_4_;
        auVar70._24_4_ = fStack_8a8 * auVar329._24_4_;
        auVar70._28_4_ = fStack_744;
        _local_7a0 = vsubps_avx(auVar70,auVar273);
        auVar244._0_4_ = local_500._0_4_ + fVar347 * fVar197;
        auVar244._4_4_ = local_500._4_4_ + fVar354 * fVar200;
        auVar244._8_4_ = local_500._8_4_ + fVar355 * fVar201;
        auVar244._12_4_ = local_500._12_4_ + fVar356 * fVar202;
        auVar244._16_4_ = local_500._16_4_ + fVar357 * fVar203;
        auVar244._20_4_ = local_500._20_4_ + fVar358 * fVar219;
        auVar244._24_4_ = local_500._24_4_ + fVar359 * fVar222;
        auVar244._28_4_ = local_500._28_4_ + fVar323 + 0.0;
        auVar71._4_4_ = (float)local_720._4_4_ * auVar329._4_4_;
        auVar71._0_4_ = (float)local_720._0_4_ * auVar329._0_4_;
        auVar71._8_4_ = fStack_718 * auVar329._8_4_;
        auVar71._12_4_ = fStack_714 * auVar329._12_4_;
        auVar71._16_4_ = fStack_710 * auVar329._16_4_;
        auVar71._20_4_ = fStack_70c * auVar329._20_4_;
        auVar71._24_4_ = fStack_708 * auVar329._24_4_;
        auVar71._28_4_ = local_7a0._28_4_;
        _local_580 = vsubps_avx(auVar71,auVar244);
        auVar11 = vcmpps_avx(auVar351,_DAT_01faff00,5);
        auVar245._8_4_ = 0x7f800000;
        auVar245._0_8_ = 0x7f8000007f800000;
        auVar245._12_4_ = 0x7f800000;
        auVar245._16_4_ = 0x7f800000;
        auVar245._20_4_ = 0x7f800000;
        auVar245._24_4_ = 0x7f800000;
        auVar245._28_4_ = 0x7f800000;
        auVar242 = vblendvps_avx(auVar245,auVar66,auVar11);
        auVar344._8_4_ = 0x7fffffff;
        auVar344._0_8_ = 0x7fffffff7fffffff;
        auVar344._12_4_ = 0x7fffffff;
        auVar344._16_4_ = 0x7fffffff;
        auVar344._20_4_ = 0x7fffffff;
        auVar344._24_4_ = 0x7fffffff;
        auVar344._28_4_ = 0x7fffffff;
        auVar351 = vandps_avx(auVar344,local_380);
        auVar351 = vmaxps_avx(local_460,auVar351);
        auVar72._4_4_ = auVar351._4_4_ * 1.9073486e-06;
        auVar72._0_4_ = auVar351._0_4_ * 1.9073486e-06;
        auVar72._8_4_ = auVar351._8_4_ * 1.9073486e-06;
        auVar72._12_4_ = auVar351._12_4_ * 1.9073486e-06;
        auVar72._16_4_ = auVar351._16_4_ * 1.9073486e-06;
        auVar72._20_4_ = auVar351._20_4_ * 1.9073486e-06;
        auVar72._24_4_ = auVar351._24_4_ * 1.9073486e-06;
        auVar72._28_4_ = auVar351._28_4_;
        auVar351 = vandps_avx(auVar344,auVar25);
        auVar351 = vcmpps_avx(auVar351,auVar72,1);
        auVar274._8_4_ = 0xff800000;
        auVar274._0_8_ = 0xff800000ff800000;
        auVar274._12_4_ = 0xff800000;
        auVar274._16_4_ = 0xff800000;
        auVar274._20_4_ = 0xff800000;
        auVar274._24_4_ = 0xff800000;
        auVar274._28_4_ = 0xff800000;
        auVar271 = vblendvps_avx(auVar274,auVar329._0_32_,auVar11);
        auVar12 = auVar11 & auVar351;
        if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar12 >> 0x7f,0) != '\0') ||
              (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar12 >> 0xbf,0) != '\0') ||
            (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar12[0x1f] < '\0') {
          auVar152 = vandps_avx(auVar351,auVar11);
          auVar232 = vpackssdw_avx(auVar152._0_16_,auVar152._16_16_);
          auVar379 = ZEXT1232(ZEXT412(0)) << 0x20;
          auVar12 = vcmpps_avx(local_840,auVar379,2);
          auVar392._8_4_ = 0xff800000;
          auVar392._0_8_ = 0xff800000ff800000;
          auVar392._12_4_ = 0xff800000;
          auVar392._16_4_ = 0xff800000;
          auVar392._20_4_ = 0xff800000;
          auVar392._24_4_ = 0xff800000;
          auVar392._28_4_ = 0xff800000;
          auVar396._8_4_ = 0x7f800000;
          auVar396._0_8_ = 0x7f8000007f800000;
          auVar396._12_4_ = 0x7f800000;
          auVar396._16_4_ = 0x7f800000;
          auVar396._20_4_ = 0x7f800000;
          auVar396._24_4_ = 0x7f800000;
          auVar396._28_4_ = 0x7f800000;
          auVar351 = vblendvps_avx(auVar396,auVar392,auVar12);
          auVar181 = vpmovsxwd_avx(auVar232);
          auVar232 = vpunpckhwd_avx(auVar232,auVar232);
          auVar345._16_16_ = auVar232;
          auVar345._0_16_ = auVar181;
          auVar242 = vblendvps_avx(auVar242,auVar351,auVar345);
          auVar351 = vblendvps_avx(auVar392,auVar396,auVar12);
          auVar271 = vblendvps_avx(auVar271,auVar351,auVar345);
          auVar351 = vcmpps_avx(auVar379,ZEXT1232(ZEXT412(0)) << 0x20,0xf);
          auVar112._0_4_ = auVar351._0_4_ ^ auVar152._0_4_;
          auVar112._4_4_ = auVar351._4_4_ ^ auVar152._4_4_;
          auVar112._8_4_ = auVar351._8_4_ ^ auVar152._8_4_;
          auVar112._12_4_ = auVar351._12_4_ ^ auVar152._12_4_;
          auVar112._16_4_ = auVar351._16_4_ ^ auVar152._16_4_;
          auVar112._20_4_ = auVar351._20_4_ ^ auVar152._20_4_;
          auVar112._24_4_ = auVar351._24_4_ ^ auVar152._24_4_;
          auVar112._28_4_ = auVar351._28_4_ ^ auVar152._28_4_;
          auVar152 = vorps_avx(auVar12,auVar112);
          auVar152 = vandps_avx(auVar11,auVar152);
        }
        auVar188 = local_940._0_28_;
        local_a40 = auVar166;
      }
      _local_400 = _local_9e0;
      local_3e0 = vminps_avx(local_3a0,auVar242);
      local_3c0 = vmaxps_avx(_local_9e0,auVar271);
      auVar351 = vcmpps_avx(_local_9e0,local_3e0,2);
      local_4e0 = vandps_avx(auVar98,auVar351);
      auVar351 = vcmpps_avx(local_3c0,local_3a0,2);
      local_520 = vandps_avx(auVar98,auVar351);
      auVar98 = vorps_avx(local_520,local_4e0);
      auVar397 = ZEXT3264(local_9c0);
      if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar98 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar98 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar98 >> 0x7f,0) == '\0') &&
            (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar98 >> 0xbf,0) == '\0') &&
          (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar98[0x1f])
      goto LAB_00fe7a95;
      _local_5a0 = local_3c0;
      auVar351 = _local_5a0;
      _local_5e0 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
      local_540._0_4_ = auVar152._0_4_ ^ local_5e0._0_4_;
      local_540._4_4_ = auVar152._4_4_ ^ local_5e0._4_4_;
      local_540._8_4_ = auVar152._8_4_ ^ local_5e0._8_4_;
      local_540._12_4_ = auVar152._12_4_ ^ local_5e0._12_4_;
      local_540._16_4_ = auVar152._16_4_ ^ local_5e0._16_4_;
      local_540._20_4_ = auVar152._20_4_ ^ local_5e0._20_4_;
      local_540._24_4_ = auVar152._24_4_ ^ local_5e0._24_4_;
      local_540._28_4_ = (uint)auVar152._28_4_ ^ (uint)local_5e0._28_4_;
      auVar107._0_4_ =
           auVar166._0_4_ * (float)local_760._0_4_ +
           auVar188._0_4_ * (float)local_8c0._0_4_ + (float)local_720._0_4_ * auVar213._0_4_;
      auVar107._4_4_ =
           auVar166._4_4_ * (float)local_760._4_4_ +
           auVar188._4_4_ * (float)local_8c0._4_4_ + (float)local_720._4_4_ * auVar213._4_4_;
      auVar107._8_4_ =
           auVar166._8_4_ * fStack_758 + auVar188._8_4_ * fStack_8b8 + fStack_718 * auVar213._8_4_;
      auVar107._12_4_ =
           auVar166._12_4_ * fStack_754 +
           auVar188._12_4_ * fStack_8b4 + fStack_714 * auVar213._12_4_;
      auVar107._16_4_ =
           auVar166._16_4_ * fStack_750 +
           auVar188._16_4_ * fStack_8b0 + fStack_710 * auVar213._16_4_;
      auVar107._20_4_ =
           auVar166._20_4_ * fStack_74c +
           auVar188._20_4_ * fStack_8ac + fStack_70c * auVar213._20_4_;
      auVar107._24_4_ =
           auVar166._24_4_ * fStack_748 +
           auVar188._24_4_ * fStack_8a8 + fStack_708 * auVar213._24_4_;
      auVar107._28_4_ = auVar152._28_4_ + local_5e0._28_4_ + auVar166._28_4_;
      auVar147._8_4_ = 0x7fffffff;
      auVar147._0_8_ = 0x7fffffff7fffffff;
      auVar147._12_4_ = 0x7fffffff;
      auVar147._16_4_ = 0x7fffffff;
      auVar147._20_4_ = 0x7fffffff;
      auVar147._24_4_ = 0x7fffffff;
      auVar147._28_4_ = 0x7fffffff;
      auVar98 = vandps_avx(auVar107,auVar147);
      auVar148._8_4_ = 0x3e99999a;
      auVar148._0_8_ = 0x3e99999a3e99999a;
      auVar148._12_4_ = 0x3e99999a;
      auVar148._16_4_ = 0x3e99999a;
      auVar148._20_4_ = 0x3e99999a;
      auVar148._24_4_ = 0x3e99999a;
      auVar148._28_4_ = 0x3e99999a;
      auVar98 = vcmpps_avx(auVar98,auVar148,1);
      auVar98 = vorps_avx(auVar98,local_540);
      auVar149._8_4_ = 3;
      auVar149._0_8_ = 0x300000003;
      auVar149._12_4_ = 3;
      auVar149._16_4_ = 3;
      auVar149._20_4_ = 3;
      auVar149._24_4_ = 3;
      auVar149._28_4_ = 3;
      auVar168._8_4_ = 2;
      auVar168._0_8_ = 0x200000002;
      auVar168._12_4_ = 2;
      auVar168._16_4_ = 2;
      auVar168._20_4_ = 2;
      auVar168._24_4_ = 2;
      auVar168._28_4_ = 2;
      auVar98 = vblendvps_avx(auVar168,auVar149,auVar98);
      local_7c0 = ZEXT432(local_c08);
      auVar181 = vpshufd_avx(ZEXT416(local_c08),0);
      auVar232 = vpcmpgtd_avx(auVar98._16_16_,auVar181);
      local_560 = auVar181._0_4_;
      fStack_55c = auVar181._4_4_;
      fStack_558 = auVar181._8_4_;
      fStack_554 = auVar181._12_4_;
      auVar181 = vpcmpgtd_avx(auVar98._0_16_,auVar181);
      auVar150._16_16_ = auVar232;
      auVar150._0_16_ = auVar181;
      local_500 = vblendps_avx(ZEXT1632(auVar181),auVar150,0xf0);
      local_4c0 = vandnps_avx(local_500,local_4e0);
      auVar153 = ZEXT3264(local_4c0);
      auVar98 = local_4e0 & ~local_500;
      auVar275 = ZEXT3264(local_a00);
      auVar329 = ZEXT3264(local_a20);
      local_aa0 = auVar6._0_4_;
      fStack_a9c = auVar6._4_4_;
      fStack_a98 = auVar6._8_4_;
      fStack_a94 = auVar6._12_4_;
      local_a80 = auVar4._0_4_;
      fStack_a7c = auVar4._4_4_;
      fStack_a78 = auVar4._8_4_;
      fStack_a74 = auVar4._12_4_;
      local_a90 = auVar5._0_4_;
      fStack_a8c = auVar5._4_4_;
      fStack_a88 = auVar5._8_4_;
      fStack_a84 = auVar5._12_4_;
      local_ab0 = auVar3._0_4_;
      fStack_aac = auVar3._4_4_;
      fStack_aa8 = auVar3._8_4_;
      fStack_aa4 = auVar3._12_4_;
      if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar98 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar98 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar98 >> 0x7f,0) == '\0') &&
            (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar98 >> 0xbf,0) == '\0') &&
          (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar98[0x1f])
      {
        auVar232 = vshufps_avx(auVar127,auVar127,0);
        auVar108._16_16_ = auVar232;
        auVar108._0_16_ = auVar232;
        local_5a0._0_4_ = local_3c0._0_4_;
        local_5a0._4_4_ = local_3c0._4_4_;
        fStack_598 = local_3c0._8_4_;
        fStack_594 = local_3c0._12_4_;
        fStack_590 = local_3c0._16_4_;
        fStack_58c = local_3c0._20_4_;
        fStack_588 = local_3c0._24_4_;
        fStack_584 = local_3c0._28_4_;
        auVar213 = local_760._0_28_;
        fVar197 = (float)local_5a0._0_4_;
        fVar198 = (float)local_5a0._4_4_;
        fVar199 = fStack_598;
        fVar200 = fStack_594;
        fVar201 = fStack_590;
        fVar202 = fStack_58c;
        fVar203 = fStack_588;
        fVar219 = fStack_584;
        _local_5a0 = auVar351;
      }
      else {
        local_740._4_4_ = (float)local_9e0._4_4_ + local_880._4_4_;
        local_740._0_4_ = (float)local_9e0._0_4_ + (float)local_880;
        fStack_738 = fStack_9d8 + (float)uStack_878;
        fStack_734 = fStack_9d4 + uStack_878._4_4_;
        fStack_730 = fStack_9d0 + (float)uStack_870;
        fStack_72c = fStack_9cc + uStack_870._4_4_;
        fStack_728 = fStack_9c8 + (float)uStack_868;
        fStack_724 = fStack_9c4 + uStack_868._4_4_;
        do {
          auVar109._8_4_ = 0x7f800000;
          auVar109._0_8_ = 0x7f8000007f800000;
          auVar109._12_4_ = 0x7f800000;
          auVar109._16_4_ = 0x7f800000;
          auVar109._20_4_ = 0x7f800000;
          auVar109._24_4_ = 0x7f800000;
          auVar109._28_4_ = 0x7f800000;
          auVar98 = auVar153._0_32_;
          auVar152 = vblendvps_avx(auVar109,_local_9e0,auVar98);
          auVar351 = vshufps_avx(auVar152,auVar152,0xb1);
          auVar351 = vminps_avx(auVar152,auVar351);
          auVar11 = vshufpd_avx(auVar351,auVar351,5);
          auVar351 = vminps_avx(auVar351,auVar11);
          auVar11 = vperm2f128_avx(auVar351,auVar351,1);
          auVar351 = vminps_avx(auVar351,auVar11);
          auVar152 = vcmpps_avx(auVar152,auVar351,0);
          auVar351 = auVar98 & auVar152;
          if ((((((((auVar351 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar351 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar351 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar351 >> 0x7f,0) != '\0') ||
                (auVar351 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar351 >> 0xbf,0) != '\0') ||
              (auVar351 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar351[0x1f] < '\0') {
            auVar98 = vandps_avx(auVar152,auVar98);
          }
          uVar76 = vmovmskps_avx(auVar98);
          uVar80 = 0;
          if (uVar76 != 0) {
            for (; (uVar76 >> uVar80 & 1) == 0; uVar80 = uVar80 + 1) {
            }
          }
          uVar78 = (ulong)uVar80;
          *(undefined4 *)(local_4c0 + uVar78 * 4) = 0;
          fVar197 = local_1a0[uVar78];
          uVar80 = *(uint *)(local_400 + uVar78 * 4);
          fVar198 = auVar126._0_4_;
          if ((float)local_920._0_4_ < 0.0) {
            fVar198 = sqrtf((float)local_920._0_4_);
          }
          auVar127 = vminps_avx(auVar4,auVar6);
          auVar232 = vmaxps_avx(auVar4,auVar6);
          auVar181 = vminps_avx(auVar5,auVar3);
          auVar94 = vminps_avx(auVar127,auVar181);
          auVar127 = vmaxps_avx(auVar5,auVar3);
          auVar181 = vmaxps_avx(auVar232,auVar127);
          auVar175._8_4_ = 0x7fffffff;
          auVar175._0_8_ = 0x7fffffff7fffffff;
          auVar175._12_4_ = 0x7fffffff;
          auVar232 = vandps_avx(auVar94,auVar175);
          auVar127 = vandps_avx(auVar181,auVar175);
          auVar232 = vmaxps_avx(auVar232,auVar127);
          auVar127 = vmovshdup_avx(auVar232);
          auVar127 = vmaxss_avx(auVar127,auVar232);
          auVar232 = vshufpd_avx(auVar232,auVar232,1);
          auVar232 = vmaxss_avx(auVar232,auVar127);
          local_a40._0_4_ = auVar232._0_4_ * 1.9073486e-06;
          local_8a0._0_4_ = fVar198 * 1.9073486e-06;
          local_700._0_16_ = vshufps_avx(auVar181,auVar181,0xff);
          auVar232 = vinsertps_avx(ZEXT416(uVar80),ZEXT416((uint)fVar197),0x10);
          lVar84 = 5;
          do {
            auVar127 = vmovshdup_avx(auVar232);
            fVar228 = auVar127._0_4_;
            fVar201 = 1.0 - fVar228;
            auVar127 = vshufps_avx(auVar232,auVar232,0x55);
            fVar197 = auVar127._0_4_;
            fVar198 = auVar127._4_4_;
            fVar199 = auVar127._8_4_;
            fVar200 = auVar127._12_4_;
            auVar127 = vshufps_avx(ZEXT416((uint)fVar201),ZEXT416((uint)fVar201),0);
            fVar202 = auVar127._0_4_;
            fVar203 = auVar127._4_4_;
            fVar219 = auVar127._8_4_;
            fVar220 = auVar127._12_4_;
            fVar221 = local_a90 * fVar197 + local_aa0 * fVar202;
            fVar222 = fStack_a8c * fVar198 + fStack_a9c * fVar203;
            fVar224 = fStack_a88 * fVar199 + fStack_a98 * fVar219;
            fVar226 = fStack_a84 * fVar200 + fStack_a94 * fVar220;
            auVar233._0_4_ =
                 fVar202 * (local_aa0 * fVar197 + fVar202 * local_a80) + fVar197 * fVar221;
            auVar233._4_4_ =
                 fVar203 * (fStack_a9c * fVar198 + fVar203 * fStack_a7c) + fVar198 * fVar222;
            auVar233._8_4_ =
                 fVar219 * (fStack_a98 * fVar199 + fVar219 * fStack_a78) + fVar199 * fVar224;
            auVar233._12_4_ =
                 fVar220 * (fStack_a94 * fVar200 + fVar220 * fStack_a74) + fVar200 * fVar226;
            auVar176._0_4_ =
                 fVar202 * fVar221 + fVar197 * (fVar197 * local_ab0 + local_a90 * fVar202);
            auVar176._4_4_ =
                 fVar203 * fVar222 + fVar198 * (fVar198 * fStack_aac + fStack_a8c * fVar203);
            auVar176._8_4_ =
                 fVar219 * fVar224 + fVar199 * (fVar199 * fStack_aa8 + fStack_a88 * fVar219);
            auVar176._12_4_ =
                 fVar220 * fVar226 + fVar200 * (fVar200 * fStack_aa4 + fStack_a84 * fVar220);
            auVar127 = vshufps_avx(auVar232,auVar232,0);
            auVar128._0_4_ = auVar127._0_4_ * (float)local_910._0_4_ + 0.0;
            auVar128._4_4_ = auVar127._4_4_ * (float)local_910._4_4_ + 0.0;
            auVar128._8_4_ = auVar127._8_4_ * fStack_908 + 0.0;
            auVar128._12_4_ = auVar127._12_4_ * fStack_904 + 0.0;
            auVar90._0_4_ = fVar202 * auVar233._0_4_ + fVar197 * auVar176._0_4_;
            auVar90._4_4_ = fVar203 * auVar233._4_4_ + fVar198 * auVar176._4_4_;
            auVar90._8_4_ = fVar219 * auVar233._8_4_ + fVar199 * auVar176._8_4_;
            auVar90._12_4_ = fVar220 * auVar233._12_4_ + fVar200 * auVar176._12_4_;
            local_840._0_16_ = auVar90;
            auVar127 = vsubps_avx(auVar128,auVar90);
            _local_940 = auVar127;
            auVar127 = vdpps_avx(auVar127,auVar127,0x7f);
            fVar197 = auVar127._0_4_;
            if (fVar197 < 0.0) {
              fVar198 = sqrtf(fVar197);
            }
            else {
              auVar181 = vsqrtss_avx(auVar127,auVar127);
              fVar198 = auVar181._0_4_;
            }
            auVar181 = vsubps_avx(auVar176,auVar233);
            auVar263._0_4_ = auVar181._0_4_ * 3.0;
            auVar263._4_4_ = auVar181._4_4_ * 3.0;
            auVar263._8_4_ = auVar181._8_4_ * 3.0;
            auVar263._12_4_ = auVar181._12_4_ * 3.0;
            auVar181 = vshufps_avx(ZEXT416((uint)(fVar228 * 6.0)),ZEXT416((uint)(fVar228 * 6.0)),0);
            auVar94 = ZEXT416((uint)((fVar201 - (fVar228 + fVar228)) * 6.0));
            auVar160 = vshufps_avx(auVar94,auVar94,0);
            auVar94 = ZEXT416((uint)((fVar228 - (fVar201 + fVar201)) * 6.0));
            auVar87 = vshufps_avx(auVar94,auVar94,0);
            auVar124 = vshufps_avx(ZEXT416((uint)(fVar201 * 6.0)),ZEXT416((uint)(fVar201 * 6.0)),0);
            auVar94 = vdpps_avx(auVar263,auVar263,0x7f);
            auVar129._0_4_ =
                 auVar124._0_4_ * local_a80 +
                 auVar87._0_4_ * local_aa0 + auVar181._0_4_ * local_ab0 + auVar160._0_4_ * local_a90
            ;
            auVar129._4_4_ =
                 auVar124._4_4_ * fStack_a7c +
                 auVar87._4_4_ * fStack_a9c +
                 auVar181._4_4_ * fStack_aac + auVar160._4_4_ * fStack_a8c;
            auVar129._8_4_ =
                 auVar124._8_4_ * fStack_a78 +
                 auVar87._8_4_ * fStack_a98 +
                 auVar181._8_4_ * fStack_aa8 + auVar160._8_4_ * fStack_a88;
            auVar129._12_4_ =
                 auVar124._12_4_ * fStack_a74 +
                 auVar87._12_4_ * fStack_a94 +
                 auVar181._12_4_ * fStack_aa4 + auVar160._12_4_ * fStack_a84;
            auVar181 = vblendps_avx(auVar94,_DAT_01f7aa10,0xe);
            auVar160 = vrsqrtss_avx(auVar181,auVar181);
            fVar200 = auVar160._0_4_;
            fVar199 = auVar94._0_4_;
            auVar160 = vdpps_avx(auVar263,auVar129,0x7f);
            auVar87 = vshufps_avx(auVar94,auVar94,0);
            auVar130._0_4_ = auVar129._0_4_ * auVar87._0_4_;
            auVar130._4_4_ = auVar129._4_4_ * auVar87._4_4_;
            auVar130._8_4_ = auVar129._8_4_ * auVar87._8_4_;
            auVar130._12_4_ = auVar129._12_4_ * auVar87._12_4_;
            auVar160 = vshufps_avx(auVar160,auVar160,0);
            auVar205._0_4_ = auVar263._0_4_ * auVar160._0_4_;
            auVar205._4_4_ = auVar263._4_4_ * auVar160._4_4_;
            auVar205._8_4_ = auVar263._8_4_ * auVar160._8_4_;
            auVar205._12_4_ = auVar263._12_4_ * auVar160._12_4_;
            auVar124 = vsubps_avx(auVar130,auVar205);
            auVar160 = vrcpss_avx(auVar181,auVar181);
            auVar181 = vmaxss_avx(ZEXT416((uint)local_a40._0_4_),
                                  ZEXT416((uint)(auVar232._0_4_ * (float)local_8a0._0_4_)));
            auVar160 = ZEXT416((uint)(auVar160._0_4_ * (2.0 - fVar199 * auVar160._0_4_)));
            auVar160 = vshufps_avx(auVar160,auVar160,0);
            uVar78 = CONCAT44(auVar263._4_4_,auVar263._0_4_);
            auVar324._0_8_ = uVar78 ^ 0x8000000080000000;
            auVar324._8_4_ = -auVar263._8_4_;
            auVar324._12_4_ = -auVar263._12_4_;
            auVar87 = ZEXT416((uint)(fVar200 * 1.5 + fVar199 * -0.5 * fVar200 * fVar200 * fVar200));
            auVar87 = vshufps_avx(auVar87,auVar87,0);
            auVar177._0_4_ = auVar87._0_4_ * auVar124._0_4_ * auVar160._0_4_;
            auVar177._4_4_ = auVar87._4_4_ * auVar124._4_4_ * auVar160._4_4_;
            auVar177._8_4_ = auVar87._8_4_ * auVar124._8_4_ * auVar160._8_4_;
            auVar177._12_4_ = auVar87._12_4_ * auVar124._12_4_ * auVar160._12_4_;
            local_860._0_4_ = auVar263._0_4_ * auVar87._0_4_;
            local_860._4_4_ = auVar263._4_4_ * auVar87._4_4_;
            local_860._8_4_ = auVar263._8_4_ * auVar87._8_4_;
            local_860._12_4_ = auVar263._12_4_ * auVar87._12_4_;
            if (fVar199 < 0.0) {
              fVar199 = sqrtf(fVar199);
            }
            else {
              auVar94 = vsqrtss_avx(auVar94,auVar94);
              fVar199 = auVar94._0_4_;
            }
            auVar94 = vdpps_avx(_local_940,local_860._0_16_,0x7f);
            fVar198 = ((float)local_a40._0_4_ / fVar199) * (fVar198 + 1.0) +
                      fVar198 * (float)local_a40._0_4_ + auVar181._0_4_;
            auVar160 = vdpps_avx(auVar324,local_860._0_16_,0x7f);
            auVar87 = vdpps_avx(_local_940,auVar177,0x7f);
            auVar124 = vdpps_avx(_local_910,local_860._0_16_,0x7f);
            auVar125 = vdpps_avx(_local_940,auVar324,0x7f);
            fVar199 = auVar160._0_4_ + auVar87._0_4_;
            fVar200 = auVar94._0_4_;
            auVar91._0_4_ = fVar200 * fVar200;
            auVar91._4_4_ = auVar94._4_4_ * auVar94._4_4_;
            auVar91._8_4_ = auVar94._8_4_ * auVar94._8_4_;
            auVar91._12_4_ = auVar94._12_4_ * auVar94._12_4_;
            auVar87 = vsubps_avx(auVar127,auVar91);
            local_860._0_16_ = ZEXT416((uint)fVar199);
            auVar160 = vdpps_avx(_local_940,_local_910,0x7f);
            fVar201 = auVar125._0_4_ - fVar200 * fVar199;
            fVar200 = auVar160._0_4_ - fVar200 * auVar124._0_4_;
            auVar160 = vrsqrtss_avx(auVar87,auVar87);
            fVar202 = auVar87._0_4_;
            fVar199 = auVar160._0_4_;
            fVar199 = fVar199 * 1.5 + fVar202 * -0.5 * fVar199 * fVar199 * fVar199;
            if (fVar202 < 0.0) {
              local_900._0_4_ = fVar201;
              local_6c0._0_4_ = fVar200;
              local_6e0._0_4_ = fVar199;
              fVar202 = sqrtf(fVar202);
              fVar199 = (float)local_6e0._0_4_;
              fVar201 = (float)local_900._0_4_;
              fVar200 = (float)local_6c0._0_4_;
            }
            else {
              auVar160 = vsqrtss_avx(auVar87,auVar87);
              fVar202 = auVar160._0_4_;
            }
            auVar397 = ZEXT3264(local_9c0);
            auVar329 = ZEXT3264(local_a20);
            auVar125 = vpermilps_avx(local_840._0_16_,0xff);
            auVar157 = vshufps_avx(auVar263,auVar263,0xff);
            fVar201 = fVar201 * fVar199 - auVar157._0_4_;
            auVar206._0_8_ = auVar124._0_8_ ^ 0x8000000080000000;
            auVar206._8_4_ = auVar124._8_4_ ^ 0x80000000;
            auVar206._12_4_ = auVar124._12_4_ ^ 0x80000000;
            auVar234._0_4_ = -fVar201;
            auVar234._4_4_ = 0x80000000;
            auVar234._8_4_ = 0x80000000;
            auVar234._12_4_ = 0x80000000;
            auVar160 = vinsertps_avx(auVar234,ZEXT416((uint)(fVar200 * fVar199)),0x1c);
            auVar124 = vmovsldup_avx(ZEXT416((uint)(local_860._0_4_ * fVar200 * fVar199 -
                                                   auVar124._0_4_ * fVar201)));
            auVar160 = vdivps_avx(auVar160,auVar124);
            auVar87 = vinsertps_avx(local_860._0_16_,auVar206,0x10);
            auVar87 = vdivps_avx(auVar87,auVar124);
            auVar124 = vmovsldup_avx(auVar94);
            auVar96 = ZEXT416((uint)(fVar202 - auVar125._0_4_));
            auVar125 = vmovsldup_avx(auVar96);
            auVar158._0_4_ = auVar124._0_4_ * auVar160._0_4_ + auVar125._0_4_ * auVar87._0_4_;
            auVar158._4_4_ = auVar124._4_4_ * auVar160._4_4_ + auVar125._4_4_ * auVar87._4_4_;
            auVar158._8_4_ = auVar124._8_4_ * auVar160._8_4_ + auVar125._8_4_ * auVar87._8_4_;
            auVar158._12_4_ = auVar124._12_4_ * auVar160._12_4_ + auVar125._12_4_ * auVar87._12_4_;
            auVar232 = vsubps_avx(auVar232,auVar158);
            auVar159._8_4_ = 0x7fffffff;
            auVar159._0_8_ = 0x7fffffff7fffffff;
            auVar159._12_4_ = 0x7fffffff;
            auVar94 = vandps_avx(auVar94,auVar159);
            if (auVar94._0_4_ < fVar198) {
              auVar178._8_4_ = 0x7fffffff;
              auVar178._0_8_ = 0x7fffffff7fffffff;
              auVar178._12_4_ = 0x7fffffff;
              auVar94 = vandps_avx(auVar96,auVar178);
              if (auVar94._0_4_ < (float)local_700._0_4_ * 1.9073486e-06 + fVar198 + auVar181._0_4_)
              {
                fVar198 = auVar232._0_4_ + (float)local_7f0._0_4_;
                auVar275 = ZEXT3264(local_a00);
                if ((fVar174 <= fVar198) &&
                   (fVar199 = *(float *)(ray + k * 4 + 0x80), fVar198 <= fVar199)) {
                  auVar181 = vmovshdup_avx(auVar232);
                  fVar200 = auVar181._0_4_;
                  if ((0.0 <= fVar200) && (fVar200 <= 1.0)) {
                    auVar127 = vrsqrtss_avx(auVar127,auVar127);
                    fVar201 = auVar127._0_4_;
                    pGVar8 = (context->scene->geometries).items[uVar79].ptr;
                    if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      auVar127 = ZEXT416((uint)(fVar201 * 1.5 +
                                               fVar197 * -0.5 * fVar201 * fVar201 * fVar201));
                      auVar127 = vshufps_avx(auVar127,auVar127,0);
                      auVar179._0_4_ = auVar127._0_4_ * (float)local_940._0_4_;
                      auVar179._4_4_ = auVar127._4_4_ * (float)local_940._4_4_;
                      auVar179._8_4_ = auVar127._8_4_ * fStack_938;
                      auVar179._12_4_ = auVar127._12_4_ * fStack_934;
                      auVar131._0_4_ = auVar263._0_4_ + auVar157._0_4_ * auVar179._0_4_;
                      auVar131._4_4_ = auVar263._4_4_ + auVar157._4_4_ * auVar179._4_4_;
                      auVar131._8_4_ = auVar263._8_4_ + auVar157._8_4_ * auVar179._8_4_;
                      auVar131._12_4_ = auVar263._12_4_ + auVar157._12_4_ * auVar179._12_4_;
                      auVar127 = vshufps_avx(auVar179,auVar179,0xc9);
                      auVar181 = vshufps_avx(auVar263,auVar263,0xc9);
                      auVar180._0_4_ = auVar181._0_4_ * auVar179._0_4_;
                      auVar180._4_4_ = auVar181._4_4_ * auVar179._4_4_;
                      auVar180._8_4_ = auVar181._8_4_ * auVar179._8_4_;
                      auVar180._12_4_ = auVar181._12_4_ * auVar179._12_4_;
                      auVar207._0_4_ = auVar263._0_4_ * auVar127._0_4_;
                      auVar207._4_4_ = auVar263._4_4_ * auVar127._4_4_;
                      auVar207._8_4_ = auVar263._8_4_ * auVar127._8_4_;
                      auVar207._12_4_ = auVar263._12_4_ * auVar127._12_4_;
                      auVar94 = vsubps_avx(auVar207,auVar180);
                      auVar127 = vshufps_avx(auVar94,auVar94,0xc9);
                      auVar181 = vshufps_avx(auVar131,auVar131,0xc9);
                      auVar208._0_4_ = auVar181._0_4_ * auVar127._0_4_;
                      auVar208._4_4_ = auVar181._4_4_ * auVar127._4_4_;
                      auVar208._8_4_ = auVar181._8_4_ * auVar127._8_4_;
                      auVar208._12_4_ = auVar181._12_4_ * auVar127._12_4_;
                      auVar127 = vshufps_avx(auVar94,auVar94,0xd2);
                      auVar132._0_4_ = auVar131._0_4_ * auVar127._0_4_;
                      auVar132._4_4_ = auVar131._4_4_ * auVar127._4_4_;
                      auVar132._8_4_ = auVar131._8_4_ * auVar127._8_4_;
                      auVar132._12_4_ = auVar131._12_4_ * auVar127._12_4_;
                      auVar127 = vsubps_avx(auVar208,auVar132);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = fVar198;
                        uVar1 = vextractps_avx(auVar127,1);
                        *(undefined4 *)(ray + k * 4 + 0xc0) = uVar1;
                        uVar1 = vextractps_avx(auVar127,2);
                        *(undefined4 *)(ray + k * 4 + 0xd0) = uVar1;
                        *(int *)(ray + k * 4 + 0xe0) = auVar127._0_4_;
                        *(float *)(ray + k * 4 + 0xf0) = fVar200;
                        *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                        *(uint *)(ray + k * 4 + 0x110) = local_8e0;
                        *(uint *)(ray + k * 4 + 0x120) = uVar79;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      }
                      else {
                        local_650 = vshufps_avx(auVar232,auVar232,0x55);
                        auVar232 = vshufps_avx(auVar127,auVar127,0x55);
                        auStack_670 = vshufps_avx(auVar127,auVar127,0xaa);
                        local_660 = vshufps_avx(auVar127,auVar127,0);
                        local_680 = (RTCHitN  [16])auVar232;
                        local_640 = ZEXT816(0) << 0x20;
                        local_630 = local_6a0._0_8_;
                        uStack_628 = local_6a0._8_8_;
                        local_620 = local_690._0_8_;
                        uStack_618 = local_690._8_8_;
                        uVar80 = context->user->instID[0];
                        _local_610 = CONCAT44(uVar80,uVar80);
                        _uStack_608 = CONCAT44(uVar80,uVar80);
                        uVar80 = context->user->instPrimID[0];
                        auVar133._4_4_ = uVar80;
                        auVar133._0_4_ = uVar80;
                        auVar133._8_4_ = uVar80;
                        auVar133._12_4_ = uVar80;
                        auStack_600 = auVar133;
                        *(float *)(ray + k * 4 + 0x80) = fVar198;
                        local_820._0_16_ = *local_950;
                        local_a70.valid = (int *)local_820;
                        local_a70.geometryUserPtr = pGVar8->userPtr;
                        local_a70.context = context->user;
                        local_a70.hit = local_680;
                        local_a70.N = 4;
                        auVar127 = *local_950;
                        local_a70.ray = (RTCRayN *)ray;
                        if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar8->intersectionFilterN)(&local_a70);
                          auVar275._8_56_ = extraout_var;
                          auVar275._0_8_ = extraout_XMM1_Qa;
                          auVar133 = auVar275._0_16_;
                          auVar329 = ZEXT3264(local_a20);
                          auVar275 = ZEXT3264(local_a00);
                          auVar397 = ZEXT3264(local_9c0);
                          auVar127 = local_820._0_16_;
                        }
                        if (auVar127 == (undefined1  [16])0x0) {
                          auVar232 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                          auVar127 = vpcmpeqd_avx(auVar133,auVar133);
                          auVar232 = auVar232 ^ auVar127;
                        }
                        else {
                          p_Var9 = context->args->filter;
                          auVar181 = vpcmpeqd_avx(auVar232,auVar232);
                          if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var9)(&local_a70);
                            auVar329 = ZEXT3264(local_a20);
                            auVar275 = ZEXT3264(local_a00);
                            auVar397 = ZEXT3264(local_9c0);
                            auVar181 = vpcmpeqd_avx(auVar181,auVar181);
                            auVar127 = local_820._0_16_;
                          }
                          auVar94 = vpcmpeqd_avx(auVar127,_DAT_01f7aa10);
                          auVar232 = auVar94 ^ auVar181;
                          if (auVar127 != (undefined1  [16])0x0) {
                            auVar94 = auVar94 ^ auVar181;
                            auVar127 = vmaskmovps_avx(auVar94,*(undefined1 (*) [16])local_a70.hit);
                            *(undefined1 (*) [16])(local_a70.ray + 0xc0) = auVar127;
                            auVar127 = vmaskmovps_avx(auVar94,*(undefined1 (*) [16])
                                                               (local_a70.hit + 0x10));
                            *(undefined1 (*) [16])(local_a70.ray + 0xd0) = auVar127;
                            auVar127 = vmaskmovps_avx(auVar94,*(undefined1 (*) [16])
                                                               (local_a70.hit + 0x20));
                            *(undefined1 (*) [16])(local_a70.ray + 0xe0) = auVar127;
                            auVar127 = vmaskmovps_avx(auVar94,*(undefined1 (*) [16])
                                                               (local_a70.hit + 0x30));
                            *(undefined1 (*) [16])(local_a70.ray + 0xf0) = auVar127;
                            auVar127 = vmaskmovps_avx(auVar94,*(undefined1 (*) [16])
                                                               (local_a70.hit + 0x40));
                            *(undefined1 (*) [16])(local_a70.ray + 0x100) = auVar127;
                            auVar127 = vmaskmovps_avx(auVar94,*(undefined1 (*) [16])
                                                               (local_a70.hit + 0x50));
                            *(undefined1 (*) [16])(local_a70.ray + 0x110) = auVar127;
                            auVar127 = vmaskmovps_avx(auVar94,*(undefined1 (*) [16])
                                                               (local_a70.hit + 0x60));
                            *(undefined1 (*) [16])(local_a70.ray + 0x120) = auVar127;
                            auVar127 = vmaskmovps_avx(auVar94,*(undefined1 (*) [16])
                                                               (local_a70.hit + 0x70));
                            *(undefined1 (*) [16])(local_a70.ray + 0x130) = auVar127;
                            auVar127 = vmaskmovps_avx(auVar94,*(undefined1 (*) [16])
                                                               (local_a70.hit + 0x80));
                            *(undefined1 (*) [16])(local_a70.ray + 0x140) = auVar127;
                          }
                        }
                        auVar92._8_8_ = 0x100000001;
                        auVar92._0_8_ = 0x100000001;
                        if ((auVar92 & auVar232) == (undefined1  [16])0x0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar199;
                        }
                      }
                    }
                  }
                }
                break;
              }
            }
            lVar84 = lVar84 + -1;
            auVar275 = ZEXT3264(local_a00);
          } while (lVar84 != 0);
          auVar152 = local_4c0;
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar108._4_4_ = uVar1;
          auVar108._0_4_ = uVar1;
          auVar108._8_4_ = uVar1;
          auVar108._12_4_ = uVar1;
          auVar108._16_4_ = uVar1;
          auVar108._20_4_ = uVar1;
          auVar108._24_4_ = uVar1;
          auVar108._28_4_ = uVar1;
          auVar98 = vcmpps_avx(_local_740,auVar108,2);
          local_4c0 = vandps_avx(auVar98,local_4c0);
          auVar153 = ZEXT3264(local_4c0);
          auVar152 = auVar152 & auVar98;
          auVar213 = local_760._0_28_;
        } while ((((((((auVar152 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                      (auVar152 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar152 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    SUB321(auVar152 >> 0x7f,0) != '\0') ||
                   (auVar152 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  SUB321(auVar152 >> 0xbf,0) != '\0') ||
                 (auVar152 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 auVar152[0x1f] < '\0');
        auVar153 = ZEXT3264(local_3c0);
        fVar197 = (float)local_5a0._0_4_;
        fVar198 = (float)local_5a0._4_4_;
        fVar199 = fStack_598;
        fVar200 = fStack_594;
        fVar201 = fStack_590;
        fVar202 = fStack_58c;
        fVar203 = fStack_588;
        fVar219 = fStack_584;
      }
      auVar363 = ZEXT3264(local_9a0);
      auVar353 = ZEXT3264(local_980);
      auVar151._0_4_ =
           auVar213._0_4_ * (float)local_780._0_4_ +
           (float)local_8c0._0_4_ * (float)local_7a0._0_4_ +
           (float)local_720._0_4_ * (float)local_580._0_4_;
      auVar151._4_4_ =
           auVar213._4_4_ * (float)local_780._4_4_ +
           (float)local_8c0._4_4_ * (float)local_7a0._4_4_ +
           (float)local_720._4_4_ * (float)local_580._4_4_;
      auVar151._8_4_ =
           auVar213._8_4_ * fStack_778 + fStack_8b8 * fStack_798 + fStack_718 * fStack_578;
      auVar151._12_4_ =
           auVar213._12_4_ * fStack_774 + fStack_8b4 * fStack_794 + fStack_714 * fStack_574;
      auVar151._16_4_ =
           auVar213._16_4_ * fStack_770 + fStack_8b0 * fStack_790 + fStack_710 * fStack_570;
      auVar151._20_4_ =
           auVar213._20_4_ * fStack_76c + fStack_8ac * fStack_78c + fStack_70c * fStack_56c;
      auVar151._24_4_ =
           auVar213._24_4_ * fStack_768 + fStack_8a8 * fStack_788 + fStack_708 * fStack_568;
      auVar151._28_4_ = fStack_8a4 + fStack_8a4 + auVar153._28_4_;
      auVar169._8_4_ = 0x7fffffff;
      auVar169._0_8_ = 0x7fffffff7fffffff;
      auVar169._12_4_ = 0x7fffffff;
      auVar169._16_4_ = 0x7fffffff;
      auVar169._20_4_ = 0x7fffffff;
      auVar169._24_4_ = 0x7fffffff;
      auVar169._28_4_ = 0x7fffffff;
      auVar98 = vandps_avx(auVar151,auVar169);
      auVar170._8_4_ = 0x3e99999a;
      auVar170._0_8_ = 0x3e99999a3e99999a;
      auVar170._12_4_ = 0x3e99999a;
      auVar170._16_4_ = 0x3e99999a;
      auVar170._20_4_ = 0x3e99999a;
      auVar170._24_4_ = 0x3e99999a;
      auVar170._28_4_ = 0x3e99999a;
      auVar98 = vcmpps_avx(auVar98,auVar170,1);
      auVar152 = vorps_avx(auVar98,local_540);
      auVar171._0_4_ = fVar197 + (float)local_880;
      auVar171._4_4_ = fVar198 + local_880._4_4_;
      auVar171._8_4_ = fVar199 + (float)uStack_878;
      auVar171._12_4_ = fVar200 + uStack_878._4_4_;
      auVar171._16_4_ = fVar201 + (float)uStack_870;
      auVar171._20_4_ = fVar202 + uStack_870._4_4_;
      auVar171._24_4_ = fVar203 + (float)uStack_868;
      auVar171._28_4_ = fVar219 + uStack_868._4_4_;
      auVar98 = vcmpps_avx(auVar171,auVar108,2);
      _local_7a0 = vandps_avx(auVar98,local_520);
      auVar172._8_4_ = 3;
      auVar172._0_8_ = 0x300000003;
      auVar172._12_4_ = 3;
      auVar172._16_4_ = 3;
      auVar172._20_4_ = 3;
      auVar172._24_4_ = 3;
      auVar172._28_4_ = 3;
      auVar196._8_4_ = 2;
      auVar196._0_8_ = 0x200000002;
      auVar196._12_4_ = 2;
      auVar196._16_4_ = 2;
      auVar196._20_4_ = 2;
      auVar196._24_4_ = 2;
      auVar196._28_4_ = 2;
      auVar98 = vblendvps_avx(auVar196,auVar172,auVar152);
      auVar74._4_4_ = fStack_55c;
      auVar74._0_4_ = local_560;
      auVar74._8_4_ = fStack_558;
      auVar74._12_4_ = fStack_554;
      auVar232 = vpcmpgtd_avx(auVar98._16_16_,auVar74);
      auVar127 = vpshufd_avx(local_7c0._0_16_,0);
      auVar127 = vpcmpgtd_avx(auVar98._0_16_,auVar127);
      auVar173._16_16_ = auVar232;
      auVar173._0_16_ = auVar108._0_16_;
      _local_780 = vblendps_avx(ZEXT1632(auVar127),auVar173,0xf0);
      auVar98 = vandnps_avx(_local_780,_local_7a0);
      auVar152 = _local_7a0 & ~_local_780;
      local_820 = auVar98;
      if ((((((((auVar152 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar152 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar152 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar152 >> 0x7f,0) != '\0') ||
            (auVar152 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar152 >> 0xbf,0) != '\0') ||
          (auVar152 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar152[0x1f] < '\0') {
        local_740._4_4_ = local_880._4_4_ + local_3c0._4_4_;
        local_740._0_4_ = (float)local_880 + local_3c0._0_4_;
        fStack_738 = (float)uStack_878 + local_3c0._8_4_;
        fStack_734 = uStack_878._4_4_ + local_3c0._12_4_;
        fStack_730 = (float)uStack_870 + local_3c0._16_4_;
        fStack_72c = uStack_870._4_4_ + local_3c0._20_4_;
        fStack_728 = (float)uStack_868 + local_3c0._24_4_;
        fStack_724 = uStack_868._4_4_ + local_3c0._28_4_;
        _local_9e0 = local_3c0;
        do {
          auVar110._8_4_ = 0x7f800000;
          auVar110._0_8_ = 0x7f8000007f800000;
          auVar110._12_4_ = 0x7f800000;
          auVar110._16_4_ = 0x7f800000;
          auVar110._20_4_ = 0x7f800000;
          auVar110._24_4_ = 0x7f800000;
          auVar110._28_4_ = 0x7f800000;
          auVar152 = vblendvps_avx(auVar110,_local_9e0,auVar98);
          auVar351 = vshufps_avx(auVar152,auVar152,0xb1);
          auVar351 = vminps_avx(auVar152,auVar351);
          auVar11 = vshufpd_avx(auVar351,auVar351,5);
          auVar351 = vminps_avx(auVar351,auVar11);
          auVar11 = vperm2f128_avx(auVar351,auVar351,1);
          auVar351 = vminps_avx(auVar351,auVar11);
          auVar351 = vcmpps_avx(auVar152,auVar351,0);
          auVar11 = auVar98 & auVar351;
          auVar152 = auVar98;
          if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar11 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar11 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar11 >> 0x7f,0) != '\0') ||
                (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar11 >> 0xbf,0) != '\0') ||
              (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar11[0x1f] < '\0') {
            auVar152 = vandps_avx(auVar351,auVar98);
          }
          uVar76 = vmovmskps_avx(auVar152);
          uVar80 = 0;
          if (uVar76 != 0) {
            for (; (uVar76 >> uVar80 & 1) == 0; uVar80 = uVar80 + 1) {
            }
          }
          uVar78 = (ulong)uVar80;
          local_820 = auVar98;
          *(undefined4 *)(local_820 + uVar78 * 4) = 0;
          fVar197 = local_1c0[uVar78];
          uVar80 = *(uint *)(local_3a0 + uVar78 * 4);
          fVar198 = auVar24._0_4_;
          if ((float)local_920._0_4_ < 0.0) {
            fVar198 = sqrtf((float)local_920._0_4_);
          }
          auVar127 = vminps_avx(auVar4,auVar6);
          auVar232 = vmaxps_avx(auVar4,auVar6);
          auVar181 = vminps_avx(auVar5,auVar3);
          auVar94 = vminps_avx(auVar127,auVar181);
          auVar127 = vmaxps_avx(auVar5,auVar3);
          auVar181 = vmaxps_avx(auVar232,auVar127);
          auVar182._8_4_ = 0x7fffffff;
          auVar182._0_8_ = 0x7fffffff7fffffff;
          auVar182._12_4_ = 0x7fffffff;
          auVar232 = vandps_avx(auVar94,auVar182);
          auVar127 = vandps_avx(auVar181,auVar182);
          auVar232 = vmaxps_avx(auVar232,auVar127);
          auVar127 = vmovshdup_avx(auVar232);
          auVar127 = vmaxss_avx(auVar127,auVar232);
          auVar232 = vshufpd_avx(auVar232,auVar232,1);
          auVar232 = vmaxss_avx(auVar232,auVar127);
          local_a40._0_4_ = auVar232._0_4_ * 1.9073486e-06;
          local_860._0_4_ = fVar198 * 1.9073486e-06;
          local_700._0_16_ = vshufps_avx(auVar181,auVar181,0xff);
          auVar232 = vinsertps_avx(ZEXT416(uVar80),ZEXT416((uint)fVar197),0x10);
          lVar84 = 5;
          do {
            auVar127 = vmovshdup_avx(auVar232);
            fVar228 = auVar127._0_4_;
            fVar201 = 1.0 - fVar228;
            auVar127 = vshufps_avx(auVar232,auVar232,0x55);
            fVar197 = auVar127._0_4_;
            fVar198 = auVar127._4_4_;
            fVar199 = auVar127._8_4_;
            fVar200 = auVar127._12_4_;
            auVar127 = vshufps_avx(ZEXT416((uint)fVar201),ZEXT416((uint)fVar201),0);
            fVar202 = auVar127._0_4_;
            fVar203 = auVar127._4_4_;
            fVar219 = auVar127._8_4_;
            fVar220 = auVar127._12_4_;
            fVar221 = local_a90 * fVar197 + local_aa0 * fVar202;
            fVar222 = fStack_a8c * fVar198 + fStack_a9c * fVar203;
            fVar224 = fStack_a88 * fVar199 + fStack_a98 * fVar219;
            fVar226 = fStack_a84 * fVar200 + fStack_a94 * fVar220;
            auVar235._0_4_ =
                 fVar202 * (local_aa0 * fVar197 + fVar202 * local_a80) + fVar197 * fVar221;
            auVar235._4_4_ =
                 fVar203 * (fStack_a9c * fVar198 + fVar203 * fStack_a7c) + fVar198 * fVar222;
            auVar235._8_4_ =
                 fVar219 * (fStack_a98 * fVar199 + fVar219 * fStack_a78) + fVar199 * fVar224;
            auVar235._12_4_ =
                 fVar220 * (fStack_a94 * fVar200 + fVar220 * fStack_a74) + fVar200 * fVar226;
            auVar183._0_4_ =
                 fVar202 * fVar221 + fVar197 * (fVar197 * local_ab0 + local_a90 * fVar202);
            auVar183._4_4_ =
                 fVar203 * fVar222 + fVar198 * (fVar198 * fStack_aac + fStack_a8c * fVar203);
            auVar183._8_4_ =
                 fVar219 * fVar224 + fVar199 * (fVar199 * fStack_aa8 + fStack_a88 * fVar219);
            auVar183._12_4_ =
                 fVar220 * fVar226 + fVar200 * (fVar200 * fStack_aa4 + fStack_a84 * fVar220);
            auVar127 = vshufps_avx(auVar232,auVar232,0);
            auVar134._0_4_ = auVar127._0_4_ * (float)local_910._0_4_ + 0.0;
            auVar134._4_4_ = auVar127._4_4_ * (float)local_910._4_4_ + 0.0;
            auVar134._8_4_ = auVar127._8_4_ * fStack_908 + 0.0;
            auVar134._12_4_ = auVar127._12_4_ * fStack_904 + 0.0;
            auVar93._0_4_ = fVar202 * auVar235._0_4_ + fVar197 * auVar183._0_4_;
            auVar93._4_4_ = fVar203 * auVar235._4_4_ + fVar198 * auVar183._4_4_;
            auVar93._8_4_ = fVar219 * auVar235._8_4_ + fVar199 * auVar183._8_4_;
            auVar93._12_4_ = fVar220 * auVar235._12_4_ + fVar200 * auVar183._12_4_;
            local_840._0_16_ = auVar93;
            auVar127 = vsubps_avx(auVar134,auVar93);
            _local_940 = auVar127;
            auVar127 = vdpps_avx(auVar127,auVar127,0x7f);
            fVar197 = auVar127._0_4_;
            if (fVar197 < 0.0) {
              fVar198 = sqrtf(fVar197);
            }
            else {
              auVar181 = vsqrtss_avx(auVar127,auVar127);
              fVar198 = auVar181._0_4_;
            }
            auVar181 = vsubps_avx(auVar183,auVar235);
            auVar264._0_4_ = auVar181._0_4_ * 3.0;
            auVar264._4_4_ = auVar181._4_4_ * 3.0;
            auVar264._8_4_ = auVar181._8_4_ * 3.0;
            auVar264._12_4_ = auVar181._12_4_ * 3.0;
            auVar181 = vshufps_avx(ZEXT416((uint)(fVar228 * 6.0)),ZEXT416((uint)(fVar228 * 6.0)),0);
            auVar94 = ZEXT416((uint)((fVar201 - (fVar228 + fVar228)) * 6.0));
            auVar160 = vshufps_avx(auVar94,auVar94,0);
            auVar94 = ZEXT416((uint)((fVar228 - (fVar201 + fVar201)) * 6.0));
            auVar87 = vshufps_avx(auVar94,auVar94,0);
            auVar124 = vshufps_avx(ZEXT416((uint)(fVar201 * 6.0)),ZEXT416((uint)(fVar201 * 6.0)),0);
            auVar94 = vdpps_avx(auVar264,auVar264,0x7f);
            auVar135._0_4_ =
                 auVar124._0_4_ * local_a80 +
                 auVar87._0_4_ * local_aa0 + auVar181._0_4_ * local_ab0 + auVar160._0_4_ * local_a90
            ;
            auVar135._4_4_ =
                 auVar124._4_4_ * fStack_a7c +
                 auVar87._4_4_ * fStack_a9c +
                 auVar181._4_4_ * fStack_aac + auVar160._4_4_ * fStack_a8c;
            auVar135._8_4_ =
                 auVar124._8_4_ * fStack_a78 +
                 auVar87._8_4_ * fStack_a98 +
                 auVar181._8_4_ * fStack_aa8 + auVar160._8_4_ * fStack_a88;
            auVar135._12_4_ =
                 auVar124._12_4_ * fStack_a74 +
                 auVar87._12_4_ * fStack_a94 +
                 auVar181._12_4_ * fStack_aa4 + auVar160._12_4_ * fStack_a84;
            auVar181 = vblendps_avx(auVar94,_DAT_01f7aa10,0xe);
            auVar160 = vrsqrtss_avx(auVar181,auVar181);
            fVar200 = auVar160._0_4_;
            fVar199 = auVar94._0_4_;
            auVar160 = vdpps_avx(auVar264,auVar135,0x7f);
            auVar87 = vshufps_avx(auVar94,auVar94,0);
            auVar136._0_4_ = auVar135._0_4_ * auVar87._0_4_;
            auVar136._4_4_ = auVar135._4_4_ * auVar87._4_4_;
            auVar136._8_4_ = auVar135._8_4_ * auVar87._8_4_;
            auVar136._12_4_ = auVar135._12_4_ * auVar87._12_4_;
            auVar160 = vshufps_avx(auVar160,auVar160,0);
            auVar209._0_4_ = auVar264._0_4_ * auVar160._0_4_;
            auVar209._4_4_ = auVar264._4_4_ * auVar160._4_4_;
            auVar209._8_4_ = auVar264._8_4_ * auVar160._8_4_;
            auVar209._12_4_ = auVar264._12_4_ * auVar160._12_4_;
            auVar124 = vsubps_avx(auVar136,auVar209);
            auVar160 = vrcpss_avx(auVar181,auVar181);
            auVar181 = vmaxss_avx(ZEXT416((uint)local_a40._0_4_),
                                  ZEXT416((uint)(auVar232._0_4_ * (float)local_860._0_4_)));
            auVar160 = ZEXT416((uint)(auVar160._0_4_ * (2.0 - fVar199 * auVar160._0_4_)));
            auVar160 = vshufps_avx(auVar160,auVar160,0);
            uVar78 = CONCAT44(auVar264._4_4_,auVar264._0_4_);
            auVar325._0_8_ = uVar78 ^ 0x8000000080000000;
            auVar325._8_4_ = -auVar264._8_4_;
            auVar325._12_4_ = -auVar264._12_4_;
            auVar87 = ZEXT416((uint)(fVar200 * 1.5 + fVar199 * -0.5 * fVar200 * fVar200 * fVar200));
            auVar87 = vshufps_avx(auVar87,auVar87,0);
            auVar184._0_4_ = auVar87._0_4_ * auVar124._0_4_ * auVar160._0_4_;
            auVar184._4_4_ = auVar87._4_4_ * auVar124._4_4_ * auVar160._4_4_;
            auVar184._8_4_ = auVar87._8_4_ * auVar124._8_4_ * auVar160._8_4_;
            auVar184._12_4_ = auVar87._12_4_ * auVar124._12_4_ * auVar160._12_4_;
            auVar331._0_4_ = auVar264._0_4_ * auVar87._0_4_;
            auVar331._4_4_ = auVar264._4_4_ * auVar87._4_4_;
            auVar331._8_4_ = auVar264._8_4_ * auVar87._8_4_;
            auVar331._12_4_ = auVar264._12_4_ * auVar87._12_4_;
            if (fVar199 < 0.0) {
              local_8a0._0_16_ = auVar331;
              fVar199 = sqrtf(fVar199);
              auVar331 = local_8a0._0_16_;
            }
            else {
              auVar94 = vsqrtss_avx(auVar94,auVar94);
              fVar199 = auVar94._0_4_;
            }
            auVar94 = vdpps_avx(_local_940,auVar331,0x7f);
            fVar198 = ((float)local_a40._0_4_ / fVar199) * (fVar198 + 1.0) +
                      fVar198 * (float)local_a40._0_4_ + auVar181._0_4_;
            auVar160 = vdpps_avx(auVar325,auVar331,0x7f);
            auVar87 = vdpps_avx(_local_940,auVar184,0x7f);
            auVar124 = vdpps_avx(_local_910,auVar331,0x7f);
            auVar125 = vdpps_avx(_local_940,auVar325,0x7f);
            fVar199 = auVar160._0_4_ + auVar87._0_4_;
            fVar200 = auVar94._0_4_;
            auVar95._0_4_ = fVar200 * fVar200;
            auVar95._4_4_ = auVar94._4_4_ * auVar94._4_4_;
            auVar95._8_4_ = auVar94._8_4_ * auVar94._8_4_;
            auVar95._12_4_ = auVar94._12_4_ * auVar94._12_4_;
            auVar87 = vsubps_avx(auVar127,auVar95);
            auVar160 = vdpps_avx(_local_940,_local_910,0x7f);
            fVar201 = auVar125._0_4_ - fVar199 * fVar200;
            fVar202 = auVar160._0_4_ - fVar200 * auVar124._0_4_;
            auVar160 = vrsqrtss_avx(auVar87,auVar87);
            fVar203 = auVar87._0_4_;
            fVar200 = auVar160._0_4_;
            fVar200 = fVar200 * 1.5 + fVar203 * -0.5 * fVar200 * fVar200 * fVar200;
            if (fVar203 < 0.0) {
              local_8a0._0_16_ = auVar124;
              local_900._0_4_ = fVar201;
              local_6c0._0_4_ = fVar202;
              local_6e0._0_4_ = fVar200;
              fVar203 = sqrtf(fVar203);
              fVar200 = (float)local_6e0._0_4_;
              fVar201 = (float)local_900._0_4_;
              fVar202 = (float)local_6c0._0_4_;
              auVar124 = local_8a0._0_16_;
            }
            else {
              auVar160 = vsqrtss_avx(auVar87,auVar87);
              fVar203 = auVar160._0_4_;
            }
            auVar353 = ZEXT3264(local_980);
            auVar363 = ZEXT3264(local_9a0);
            auVar397 = ZEXT3264(local_9c0);
            auVar329 = ZEXT3264(local_a20);
            auVar125 = vpermilps_avx(local_840._0_16_,0xff);
            auVar157 = vshufps_avx(auVar264,auVar264,0xff);
            fVar201 = fVar201 * fVar200 - auVar157._0_4_;
            auVar210._0_8_ = auVar124._0_8_ ^ 0x8000000080000000;
            auVar210._8_4_ = auVar124._8_4_ ^ 0x80000000;
            auVar210._12_4_ = auVar124._12_4_ ^ 0x80000000;
            auVar236._0_4_ = -fVar201;
            auVar236._4_4_ = 0x80000000;
            auVar236._8_4_ = 0x80000000;
            auVar236._12_4_ = 0x80000000;
            auVar160 = vinsertps_avx(auVar236,ZEXT416((uint)(fVar202 * fVar200)),0x1c);
            auVar124 = vmovsldup_avx(ZEXT416((uint)(fVar199 * fVar202 * fVar200 -
                                                   auVar124._0_4_ * fVar201)));
            auVar160 = vdivps_avx(auVar160,auVar124);
            auVar87 = vinsertps_avx(ZEXT416((uint)fVar199),auVar210,0x10);
            auVar87 = vdivps_avx(auVar87,auVar124);
            auVar124 = vmovsldup_avx(auVar94);
            auVar96 = ZEXT416((uint)(fVar203 - auVar125._0_4_));
            auVar125 = vmovsldup_avx(auVar96);
            auVar161._0_4_ = auVar124._0_4_ * auVar160._0_4_ + auVar125._0_4_ * auVar87._0_4_;
            auVar161._4_4_ = auVar124._4_4_ * auVar160._4_4_ + auVar125._4_4_ * auVar87._4_4_;
            auVar161._8_4_ = auVar124._8_4_ * auVar160._8_4_ + auVar125._8_4_ * auVar87._8_4_;
            auVar161._12_4_ = auVar124._12_4_ * auVar160._12_4_ + auVar125._12_4_ * auVar87._12_4_;
            auVar232 = vsubps_avx(auVar232,auVar161);
            auVar162._8_4_ = 0x7fffffff;
            auVar162._0_8_ = 0x7fffffff7fffffff;
            auVar162._12_4_ = 0x7fffffff;
            auVar94 = vandps_avx(auVar94,auVar162);
            if (auVar94._0_4_ < fVar198) {
              auVar185._8_4_ = 0x7fffffff;
              auVar185._0_8_ = 0x7fffffff7fffffff;
              auVar185._12_4_ = 0x7fffffff;
              auVar94 = vandps_avx(auVar96,auVar185);
              if (auVar94._0_4_ < (float)local_700._0_4_ * 1.9073486e-06 + fVar198 + auVar181._0_4_)
              {
                fVar198 = auVar232._0_4_ + (float)local_7f0._0_4_;
                auVar275 = ZEXT3264(local_a00);
                if ((fVar174 <= fVar198) &&
                   (fVar199 = *(float *)(ray + k * 4 + 0x80), fVar198 <= fVar199)) {
                  auVar181 = vmovshdup_avx(auVar232);
                  fVar200 = auVar181._0_4_;
                  if ((0.0 <= fVar200) && (fVar200 <= 1.0)) {
                    auVar127 = vrsqrtss_avx(auVar127,auVar127);
                    fVar201 = auVar127._0_4_;
                    pGVar8 = (context->scene->geometries).items[uVar79].ptr;
                    if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      auVar127 = ZEXT416((uint)(fVar201 * 1.5 +
                                               fVar197 * -0.5 * fVar201 * fVar201 * fVar201));
                      auVar127 = vshufps_avx(auVar127,auVar127,0);
                      auVar186._0_4_ = auVar127._0_4_ * (float)local_940._0_4_;
                      auVar186._4_4_ = auVar127._4_4_ * (float)local_940._4_4_;
                      auVar186._8_4_ = auVar127._8_4_ * fStack_938;
                      auVar186._12_4_ = auVar127._12_4_ * fStack_934;
                      auVar137._0_4_ = auVar264._0_4_ + auVar157._0_4_ * auVar186._0_4_;
                      auVar137._4_4_ = auVar264._4_4_ + auVar157._4_4_ * auVar186._4_4_;
                      auVar137._8_4_ = auVar264._8_4_ + auVar157._8_4_ * auVar186._8_4_;
                      auVar137._12_4_ = auVar264._12_4_ + auVar157._12_4_ * auVar186._12_4_;
                      auVar127 = vshufps_avx(auVar186,auVar186,0xc9);
                      auVar181 = vshufps_avx(auVar264,auVar264,0xc9);
                      auVar187._0_4_ = auVar181._0_4_ * auVar186._0_4_;
                      auVar187._4_4_ = auVar181._4_4_ * auVar186._4_4_;
                      auVar187._8_4_ = auVar181._8_4_ * auVar186._8_4_;
                      auVar187._12_4_ = auVar181._12_4_ * auVar186._12_4_;
                      auVar211._0_4_ = auVar264._0_4_ * auVar127._0_4_;
                      auVar211._4_4_ = auVar264._4_4_ * auVar127._4_4_;
                      auVar211._8_4_ = auVar264._8_4_ * auVar127._8_4_;
                      auVar211._12_4_ = auVar264._12_4_ * auVar127._12_4_;
                      auVar94 = vsubps_avx(auVar211,auVar187);
                      auVar127 = vshufps_avx(auVar94,auVar94,0xc9);
                      auVar181 = vshufps_avx(auVar137,auVar137,0xc9);
                      auVar212._0_4_ = auVar181._0_4_ * auVar127._0_4_;
                      auVar212._4_4_ = auVar181._4_4_ * auVar127._4_4_;
                      auVar212._8_4_ = auVar181._8_4_ * auVar127._8_4_;
                      auVar212._12_4_ = auVar181._12_4_ * auVar127._12_4_;
                      auVar127 = vshufps_avx(auVar94,auVar94,0xd2);
                      auVar138._0_4_ = auVar137._0_4_ * auVar127._0_4_;
                      auVar138._4_4_ = auVar137._4_4_ * auVar127._4_4_;
                      auVar138._8_4_ = auVar137._8_4_ * auVar127._8_4_;
                      auVar138._12_4_ = auVar137._12_4_ * auVar127._12_4_;
                      auVar127 = vsubps_avx(auVar212,auVar138);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = fVar198;
                        uVar1 = vextractps_avx(auVar127,1);
                        *(undefined4 *)(ray + k * 4 + 0xc0) = uVar1;
                        uVar1 = vextractps_avx(auVar127,2);
                        *(undefined4 *)(ray + k * 4 + 0xd0) = uVar1;
                        *(int *)(ray + k * 4 + 0xe0) = auVar127._0_4_;
                        *(float *)(ray + k * 4 + 0xf0) = fVar200;
                        *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                        *(uint *)(ray + k * 4 + 0x110) = local_8e0;
                        *(uint *)(ray + k * 4 + 0x120) = uVar79;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      }
                      else {
                        local_650 = vshufps_avx(auVar232,auVar232,0x55);
                        auVar232 = vshufps_avx(auVar127,auVar127,0x55);
                        auStack_670 = vshufps_avx(auVar127,auVar127,0xaa);
                        local_660 = vshufps_avx(auVar127,auVar127,0);
                        local_680 = (RTCHitN  [16])auVar232;
                        local_640 = ZEXT816(0) << 0x20;
                        local_630 = local_6a0._0_8_;
                        uStack_628 = local_6a0._8_8_;
                        local_620 = local_690._0_8_;
                        uStack_618 = local_690._8_8_;
                        uVar80 = context->user->instID[0];
                        _local_610 = CONCAT44(uVar80,uVar80);
                        _uStack_608 = CONCAT44(uVar80,uVar80);
                        uVar80 = context->user->instPrimID[0];
                        auVar139._4_4_ = uVar80;
                        auVar139._0_4_ = uVar80;
                        auVar139._8_4_ = uVar80;
                        auVar139._12_4_ = uVar80;
                        auStack_600 = auVar139;
                        *(float *)(ray + k * 4 + 0x80) = fVar198;
                        local_7e0 = *local_950;
                        local_a70.valid = (int *)local_7e0;
                        local_a70.geometryUserPtr = pGVar8->userPtr;
                        local_a70.context = context->user;
                        local_a70.hit = local_680;
                        local_a70.N = 4;
                        local_a70.ray = (RTCRayN *)ray;
                        if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar8->intersectionFilterN)(&local_a70);
                          auVar353._8_56_ = extraout_var_00;
                          auVar353._0_8_ = extraout_XMM1_Qa_00;
                          auVar139 = auVar353._0_16_;
                          auVar329 = ZEXT3264(local_a20);
                          auVar275 = ZEXT3264(local_a00);
                          auVar397 = ZEXT3264(local_9c0);
                          auVar363 = ZEXT3264(local_9a0);
                          auVar353 = ZEXT3264(local_980);
                        }
                        if (local_7e0 == (undefined1  [16])0x0) {
                          auVar232 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                          auVar127 = vpcmpeqd_avx(auVar139,auVar139);
                          auVar232 = auVar232 ^ auVar127;
                        }
                        else {
                          p_Var9 = context->args->filter;
                          auVar127 = vpcmpeqd_avx(auVar232,auVar232);
                          if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var9)(&local_a70);
                            auVar329 = ZEXT3264(local_a20);
                            auVar275 = ZEXT3264(local_a00);
                            auVar397 = ZEXT3264(local_9c0);
                            auVar363 = ZEXT3264(local_9a0);
                            auVar353 = ZEXT3264(local_980);
                            auVar127 = vpcmpeqd_avx(auVar127,auVar127);
                          }
                          auVar181 = vpcmpeqd_avx(local_7e0,_DAT_01f7aa10);
                          auVar232 = auVar181 ^ auVar127;
                          if (local_7e0 != (undefined1  [16])0x0) {
                            auVar181 = auVar181 ^ auVar127;
                            auVar127 = vmaskmovps_avx(auVar181,*(undefined1 (*) [16])local_a70.hit);
                            *(undefined1 (*) [16])(local_a70.ray + 0xc0) = auVar127;
                            auVar127 = vmaskmovps_avx(auVar181,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x10));
                            *(undefined1 (*) [16])(local_a70.ray + 0xd0) = auVar127;
                            auVar127 = vmaskmovps_avx(auVar181,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x20));
                            *(undefined1 (*) [16])(local_a70.ray + 0xe0) = auVar127;
                            auVar127 = vmaskmovps_avx(auVar181,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x30));
                            *(undefined1 (*) [16])(local_a70.ray + 0xf0) = auVar127;
                            auVar127 = vmaskmovps_avx(auVar181,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x40));
                            *(undefined1 (*) [16])(local_a70.ray + 0x100) = auVar127;
                            auVar127 = vmaskmovps_avx(auVar181,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x50));
                            *(undefined1 (*) [16])(local_a70.ray + 0x110) = auVar127;
                            auVar127 = vmaskmovps_avx(auVar181,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x60));
                            *(undefined1 (*) [16])(local_a70.ray + 0x120) = auVar127;
                            auVar127 = vmaskmovps_avx(auVar181,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x70));
                            *(undefined1 (*) [16])(local_a70.ray + 0x130) = auVar127;
                            auVar127 = vmaskmovps_avx(auVar181,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x80));
                            *(undefined1 (*) [16])(local_a70.ray + 0x140) = auVar127;
                          }
                        }
                        auVar97._8_8_ = 0x100000001;
                        auVar97._0_8_ = 0x100000001;
                        if ((auVar97 & auVar232) == (undefined1  [16])0x0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar199;
                        }
                      }
                    }
                  }
                }
                break;
              }
            }
            lVar84 = lVar84 + -1;
            auVar275 = ZEXT3264(local_a00);
          } while (lVar84 != 0);
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar108._4_4_ = uVar1;
          auVar108._0_4_ = uVar1;
          auVar108._8_4_ = uVar1;
          auVar108._12_4_ = uVar1;
          auVar108._16_4_ = uVar1;
          auVar108._20_4_ = uVar1;
          auVar108._24_4_ = uVar1;
          auVar108._28_4_ = uVar1;
          auVar152 = vcmpps_avx(_local_740,auVar108,2);
          auVar98 = vandps_avx(auVar152,local_820);
          auVar152 = local_820 & auVar152;
          local_820 = auVar98;
        } while ((((((((auVar152 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                      (auVar152 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar152 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    SUB321(auVar152 >> 0x7f,0) != '\0') ||
                   (auVar152 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  SUB321(auVar152 >> 0xbf,0) != '\0') ||
                 (auVar152 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 auVar152[0x1f] < '\0');
      }
      auVar98 = vandps_avx(local_500,local_4e0);
      auVar152 = vandps_avx(_local_7a0,_local_780);
      auVar217._0_4_ = (float)local_880 + local_400._0_4_;
      auVar217._4_4_ = local_880._4_4_ + local_400._4_4_;
      auVar217._8_4_ = (float)uStack_878 + local_400._8_4_;
      auVar217._12_4_ = uStack_878._4_4_ + local_400._12_4_;
      auVar217._16_4_ = (float)uStack_870 + local_400._16_4_;
      auVar217._20_4_ = uStack_870._4_4_ + local_400._20_4_;
      auVar217._24_4_ = (float)uStack_868 + local_400._24_4_;
      auVar217._28_4_ = uStack_868._4_4_ + local_400._28_4_;
      auVar351 = vcmpps_avx(auVar217,auVar108,2);
      auVar98 = vandps_avx(auVar351,auVar98);
      auVar218._0_4_ = (float)local_880 + local_3c0._0_4_;
      auVar218._4_4_ = local_880._4_4_ + local_3c0._4_4_;
      auVar218._8_4_ = (float)uStack_878 + local_3c0._8_4_;
      auVar218._12_4_ = uStack_878._4_4_ + local_3c0._12_4_;
      auVar218._16_4_ = (float)uStack_870 + local_3c0._16_4_;
      auVar218._20_4_ = uStack_870._4_4_ + local_3c0._20_4_;
      auVar218._24_4_ = (float)uStack_868 + local_3c0._24_4_;
      auVar218._28_4_ = uStack_868._4_4_ + local_3c0._28_4_;
      auVar351 = vcmpps_avx(auVar218,auVar108,2);
      auVar152 = vandps_avx(auVar351,auVar152);
      auVar152 = vorps_avx(auVar98,auVar152);
      if ((((((((auVar152 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar152 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar152 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar152 >> 0x7f,0) != '\0') ||
            (auVar152 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar152 >> 0xbf,0) != '\0') ||
          (auVar152 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar152[0x1f] < '\0') {
        *(undefined1 (*) [32])(auStack_180 + uVar82 * 0x60) = auVar152;
        auVar98 = vblendvps_avx(local_3c0,_local_400,auVar98);
        *(undefined1 (*) [32])(auStack_160 + uVar82 * 0x60) = auVar98;
        uVar2 = vmovlps_avx(local_490);
        (&uStack_140)[uVar82 * 0xc] = uVar2;
        aiStack_138[uVar82 * 0x18] = local_c08 + 1;
        iVar83 = iVar83 + 1;
      }
    }
    auVar239 = local_440;
    if (iVar83 == 0) break;
    uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar105._4_4_ = uVar1;
    auVar105._0_4_ = uVar1;
    auVar105._8_4_ = uVar1;
    auVar105._12_4_ = uVar1;
    auVar105._16_4_ = uVar1;
    auVar105._20_4_ = uVar1;
    auVar105._24_4_ = uVar1;
    auVar105._28_4_ = uVar1;
    uVar80 = -iVar83;
    pauVar77 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar83 - 1) * 0x60);
    while( true ) {
      auVar98 = pauVar77[1];
      auVar146._0_4_ = (float)local_880 + auVar98._0_4_;
      auVar146._4_4_ = local_880._4_4_ + auVar98._4_4_;
      auVar146._8_4_ = (float)uStack_878 + auVar98._8_4_;
      auVar146._12_4_ = uStack_878._4_4_ + auVar98._12_4_;
      auVar146._16_4_ = (float)uStack_870 + auVar98._16_4_;
      auVar146._20_4_ = uStack_870._4_4_ + auVar98._20_4_;
      auVar146._24_4_ = (float)uStack_868 + auVar98._24_4_;
      auVar146._28_4_ = uStack_868._4_4_ + auVar98._28_4_;
      auVar351 = vcmpps_avx(auVar146,auVar105,2);
      auVar152 = vandps_avx(auVar351,*pauVar77);
      _local_680 = auVar152;
      auVar351 = *pauVar77 & auVar351;
      if ((((((((auVar351 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar351 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar351 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar351 >> 0x7f,0) != '\0') ||
            (auVar351 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar351 >> 0xbf,0) != '\0') ||
          (auVar351 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar351[0x1f] < '\0') break;
      pauVar77 = pauVar77 + -3;
      uVar80 = uVar80 + 1;
      if (uVar80 == 0) goto LAB_00fe9623;
    }
    auVar106._8_4_ = 0x7f800000;
    auVar106._0_8_ = 0x7f8000007f800000;
    auVar106._12_4_ = 0x7f800000;
    auVar106._16_4_ = 0x7f800000;
    auVar106._20_4_ = 0x7f800000;
    auVar106._24_4_ = 0x7f800000;
    auVar106._28_4_ = 0x7f800000;
    auVar98 = vblendvps_avx(auVar106,auVar98,auVar152);
    auVar351 = vshufps_avx(auVar98,auVar98,0xb1);
    auVar351 = vminps_avx(auVar98,auVar351);
    auVar11 = vshufpd_avx(auVar351,auVar351,5);
    auVar351 = vminps_avx(auVar351,auVar11);
    auVar11 = vperm2f128_avx(auVar351,auVar351,1);
    auVar351 = vminps_avx(auVar351,auVar11);
    auVar98 = vcmpps_avx(auVar98,auVar351,0);
    auVar351 = auVar152 & auVar98;
    if ((((((((auVar351 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar351 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar351 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar351 >> 0x7f,0) != '\0') ||
          (auVar351 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar351 >> 0xbf,0) != '\0') ||
        (auVar351 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar351[0x1f] < '\0') {
      auVar152 = vandps_avx(auVar98,auVar152);
    }
    auVar89._8_8_ = 0;
    auVar89._0_8_ = *(ulong *)pauVar77[2];
    local_c08 = *(uint *)(pauVar77[2] + 8);
    uVar81 = vmovmskps_avx(auVar152);
    uVar76 = 0;
    if (uVar81 != 0) {
      for (; (uVar81 >> uVar76 & 1) == 0; uVar76 = uVar76 + 1) {
      }
    }
    *(undefined4 *)(local_680 + (ulong)uVar76 * 4) = 0;
    *pauVar77 = _local_680;
    uVar81 = ~uVar80;
    if ((((((((_local_680 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_680 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_680 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_680 >> 0x7f,0) != '\0') ||
          (_local_680 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_680 >> 0xbf,0) != '\0') ||
        (_local_680 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_680[0x1f] < '\0') {
      uVar81 = -uVar80;
    }
    uVar82 = (ulong)uVar81;
    auVar232 = vshufps_avx(auVar89,auVar89,0);
    auVar127 = vshufps_avx(auVar89,auVar89,0x55);
    auVar127 = vsubps_avx(auVar127,auVar232);
    local_400._4_4_ = auVar232._4_4_ + auVar127._4_4_ * 0.14285715;
    local_400._0_4_ = auVar232._0_4_ + auVar127._0_4_ * 0.0;
    fStack_3f8 = auVar232._8_4_ + auVar127._8_4_ * 0.2857143;
    fStack_3f4 = auVar232._12_4_ + auVar127._12_4_ * 0.42857146;
    fStack_3f0 = auVar232._0_4_ + auVar127._0_4_ * 0.5714286;
    fStack_3ec = auVar232._4_4_ + auVar127._4_4_ * 0.71428573;
    fStack_3e8 = auVar232._8_4_ + auVar127._8_4_ * 0.8571429;
    fStack_3e4 = auVar232._12_4_ + auVar127._12_4_;
    local_490._8_8_ = 0;
    local_490._0_8_ = *(ulong *)(local_400 + (ulong)uVar76 * 4);
  } while( true );
LAB_00fe9623:
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar113._4_4_ = uVar1;
  auVar113._0_4_ = uVar1;
  auVar113._8_4_ = uVar1;
  auVar113._12_4_ = uVar1;
  auVar113._16_4_ = uVar1;
  auVar113._20_4_ = uVar1;
  auVar113._24_4_ = uVar1;
  auVar113._28_4_ = uVar1;
  auVar98 = vcmpps_avx(local_340,auVar113,2);
  uVar79 = vmovmskps_avx(auVar98);
  uVar79 = (uint)uVar85 & uVar79;
  if (uVar79 == 0) {
    return;
  }
  goto LAB_00fe69c1;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }